

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx::CurveNiMBIntersector1<8>::
     intersect_t<embree::avx::RibbonCurve1Intersector1<embree::BSplineCurveT,8>,embree::avx::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined1 (*pauVar9) [28];
  undefined1 (*pauVar10) [28];
  undefined1 (*pauVar11) [28];
  undefined4 uVar12;
  undefined8 uVar13;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  Primitive PVar34;
  uint uVar35;
  Geometry *pGVar36;
  __int_type_conflict _Var37;
  RTCFilterFunctionN p_Var38;
  uint uVar39;
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  bool bVar132;
  bool bVar133;
  bool bVar134;
  bool bVar135;
  bool bVar136;
  bool bVar137;
  bool bVar138;
  bool bVar139;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [28];
  undefined1 auVar150 [28];
  undefined1 auVar151 [28];
  undefined1 auVar152 [28];
  undefined1 auVar153 [28];
  undefined1 auVar154 [24];
  uint uVar155;
  uint uVar156;
  uint uVar157;
  ulong uVar158;
  uint uVar159;
  long lVar160;
  long lVar161;
  long lVar162;
  long lVar163;
  undefined1 auVar164 [8];
  ulong uVar165;
  undefined1 auVar169 [16];
  float fVar166;
  undefined1 auVar170 [16];
  float fVar167;
  float fVar168;
  float fVar185;
  float fVar187;
  float fVar190;
  float fVar191;
  float fVar192;
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  float fVar186;
  float fVar188;
  float fVar189;
  float fVar193;
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [64];
  float fVar194;
  float fVar211;
  float fVar212;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  float fVar214;
  float fVar215;
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  float fVar216;
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  float fVar213;
  undefined1 auVar210 [64];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  float fVar217;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  float fVar231;
  float fVar232;
  undefined1 auVar226 [32];
  float fVar233;
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  float fVar234;
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  float fVar235;
  float fVar255;
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  float fVar252;
  float fVar254;
  float fVar257;
  float fVar259;
  float fVar261;
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  float fVar253;
  float fVar256;
  float fVar258;
  float fVar260;
  float fVar262;
  float fVar263;
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [64];
  float fVar264;
  float fVar275;
  float fVar277;
  float fVar278;
  undefined1 auVar266 [16];
  float fVar265;
  undefined1 auVar269 [16];
  undefined1 auVar286 [16];
  float fVar276;
  undefined1 auVar268 [16];
  float fVar279;
  float fVar280;
  float fVar281;
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  float fVar282;
  float fVar283;
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  float fVar284;
  float fVar294;
  float fVar295;
  undefined1 auVar285 [16];
  float fVar298;
  float fVar299;
  float fVar300;
  undefined1 auVar287 [32];
  float fVar296;
  float fVar301;
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  float fVar297;
  float fVar302;
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar303 [16];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  float fVar309;
  undefined1 auVar308 [32];
  undefined1 auVar310 [16];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [16];
  float fVar327;
  float fVar328;
  float fVar329;
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  float fVar338;
  float fVar339;
  float fVar340;
  float fVar341;
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  float fVar343;
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  float fVar342;
  undefined1 auVar337 [32];
  float fVar353;
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [64];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  float fVar360;
  float fVar361;
  float fVar371;
  float fVar373;
  float fVar374;
  float in_register_0000151c;
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  float fVar372;
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  float fVar375;
  float fVar376;
  float fVar382;
  float fVar384;
  float fVar386;
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  float fVar383;
  float fVar385;
  float fVar387;
  float fVar388;
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  undefined1 auVar381 [64];
  float fVar389;
  float fVar390;
  float fVar396;
  float fVar398;
  float fVar399;
  float in_register_0000159c;
  undefined1 auVar392 [32];
  float fVar397;
  undefined1 auVar393 [32];
  undefined1 auVar394 [64];
  undefined1 auVar395 [64];
  float fVar400;
  float fVar401;
  float fVar405;
  float fVar406;
  float fVar407;
  float fVar408;
  float in_register_000015dc;
  undefined1 auVar403 [32];
  undefined1 auVar404 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  int local_804;
  ulong local_800;
  ulong local_7f8;
  undefined1 local_7f0 [8];
  undefined8 uStack_7e8;
  Precalculations *local_7d8;
  RTCFilterFunctionNArguments local_7d0;
  undefined1 local_7a0 [32];
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float local_760;
  float fStack_75c;
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [8];
  undefined8 uStack_738;
  undefined1 auStack_730 [8];
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  undefined1 auStack_710 [16];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  undefined8 local_6d0;
  undefined4 local_6c8;
  float local_6c4;
  undefined4 local_6c0;
  undefined4 local_6bc;
  undefined4 local_6b8;
  uint local_6b4;
  uint local_6b0;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  undefined1 auStack_670 [16];
  undefined1 local_660 [32];
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  undefined1 local_620 [8];
  undefined8 uStack_618;
  undefined1 auStack_610 [8];
  float fStack_608;
  undefined1 local_600 [8];
  undefined8 uStack_5f8;
  undefined1 auStack_5f0 [16];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5b0 [8];
  undefined8 uStack_5a8;
  undefined1 local_5a0 [8];
  undefined8 uStack_598;
  undefined1 local_590 [8];
  undefined8 uStack_588;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  Primitive *local_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined1 local_440 [32];
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [32];
  uint local_340;
  uint local_33c;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined1 local_300 [16];
  undefined1 local_2e0 [32];
  float local_2c0 [4];
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [32];
  undefined1 local_260 [8];
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [32];
  undefined1 auVar267 [16];
  undefined1 auVar362 [16];
  undefined1 auVar391 [16];
  undefined1 auVar402 [16];
  
  local_7d8 = pre;
  PVar34 = prim[1];
  uVar158 = (ulong)(byte)PVar34;
  lVar161 = uVar158 * 0x25;
  fVar235 = *(float *)(prim + lVar161 + 0x12);
  auVar222 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + lVar161 + 6));
  auVar285._0_4_ = fVar235 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar285._4_4_ = fVar235 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar285._8_4_ = fVar235 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar285._12_4_ = fVar235 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar286 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar158 * 4 + 6)));
  auVar195._0_4_ = fVar235 * auVar222._0_4_;
  auVar195._4_4_ = fVar235 * auVar222._4_4_;
  auVar195._8_4_ = fVar235 * auVar222._8_4_;
  auVar195._12_4_ = fVar235 * auVar222._12_4_;
  auVar222 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar158 * 4 + 10)));
  auVar171._16_16_ = auVar222;
  auVar171._0_16_ = auVar286;
  auVar171 = vcvtdq2ps_avx(auVar171);
  lVar160 = uVar158 * 5;
  auVar286 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar160 + 6)));
  auVar222 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar160 + 10)));
  auVar226._16_16_ = auVar222;
  auVar226._0_16_ = auVar286;
  auVar286 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar158 * 6 + 6)));
  auVar222 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar158 * 6 + 10)));
  auVar337 = vcvtdq2ps_avx(auVar226);
  auVar242._16_16_ = auVar222;
  auVar242._0_16_ = auVar286;
  auVar292 = vcvtdq2ps_avx(auVar242);
  auVar286 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar158 * 0xf + 6)));
  auVar222 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar158 * 0xf + 10)));
  auVar243._16_16_ = auVar222;
  auVar243._0_16_ = auVar286;
  auVar41 = vcvtdq2ps_avx(auVar243);
  lVar162 = (ulong)(byte)PVar34 * 0x10;
  auVar286 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar162 + 6)));
  auVar222 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar162 + 10)));
  auVar304._16_16_ = auVar222;
  auVar304._0_16_ = auVar286;
  auVar286 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar162 + uVar158 + 6)));
  auVar42 = vcvtdq2ps_avx(auVar304);
  auVar222 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar162 + uVar158 + 10)));
  auVar311._16_16_ = auVar222;
  auVar311._0_16_ = auVar286;
  auVar286 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar158 * 0x1a + 6)));
  auVar43 = vcvtdq2ps_avx(auVar311);
  auVar222 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar158 * 0x1a + 10)));
  auVar312._16_16_ = auVar222;
  auVar312._0_16_ = auVar286;
  auVar44 = vcvtdq2ps_avx(auVar312);
  auVar286 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar158 * 0x1b + 6)));
  auVar222 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar158 * 0x1b + 10)));
  auVar330._16_16_ = auVar222;
  auVar330._0_16_ = auVar286;
  auVar286 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar158 * 0x1c + 6)));
  auVar222 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar158 * 0x1c + 10)));
  auVar45 = vcvtdq2ps_avx(auVar330);
  auVar344._16_16_ = auVar222;
  auVar344._0_16_ = auVar286;
  auVar46 = vcvtdq2ps_avx(auVar344);
  auVar286 = vshufps_avx(auVar285,auVar285,0);
  auVar222 = vshufps_avx(auVar285,auVar285,0x55);
  auVar269 = vshufps_avx(auVar285,auVar285,0xaa);
  fVar235 = auVar269._0_4_;
  fVar214 = auVar269._4_4_;
  fVar252 = auVar269._8_4_;
  fVar297 = auVar269._12_4_;
  fVar233 = auVar222._0_4_;
  fVar388 = auVar222._4_4_;
  fVar255 = auVar222._8_4_;
  fVar167 = auVar222._12_4_;
  fVar257 = auVar286._0_4_;
  fVar259 = auVar286._4_4_;
  fVar261 = auVar286._8_4_;
  fVar264 = auVar286._12_4_;
  auVar363._0_4_ = fVar257 * auVar171._0_4_ + fVar233 * auVar337._0_4_ + fVar235 * auVar292._0_4_;
  auVar363._4_4_ = fVar259 * auVar171._4_4_ + fVar388 * auVar337._4_4_ + fVar214 * auVar292._4_4_;
  auVar363._8_4_ = fVar261 * auVar171._8_4_ + fVar255 * auVar337._8_4_ + fVar252 * auVar292._8_4_;
  auVar363._12_4_ =
       fVar264 * auVar171._12_4_ + fVar167 * auVar337._12_4_ + fVar297 * auVar292._12_4_;
  auVar363._16_4_ =
       fVar257 * auVar171._16_4_ + fVar233 * auVar337._16_4_ + fVar235 * auVar292._16_4_;
  auVar363._20_4_ =
       fVar259 * auVar171._20_4_ + fVar388 * auVar337._20_4_ + fVar214 * auVar292._20_4_;
  auVar363._24_4_ =
       fVar261 * auVar171._24_4_ + fVar255 * auVar337._24_4_ + fVar252 * auVar292._24_4_;
  auVar363._28_4_ = fVar167 + in_register_000015dc + in_register_0000151c;
  auVar354._0_4_ = fVar257 * auVar41._0_4_ + fVar233 * auVar42._0_4_ + auVar43._0_4_ * fVar235;
  auVar354._4_4_ = fVar259 * auVar41._4_4_ + fVar388 * auVar42._4_4_ + auVar43._4_4_ * fVar214;
  auVar354._8_4_ = fVar261 * auVar41._8_4_ + fVar255 * auVar42._8_4_ + auVar43._8_4_ * fVar252;
  auVar354._12_4_ = fVar264 * auVar41._12_4_ + fVar167 * auVar42._12_4_ + auVar43._12_4_ * fVar297;
  auVar354._16_4_ = fVar257 * auVar41._16_4_ + fVar233 * auVar42._16_4_ + auVar43._16_4_ * fVar235;
  auVar354._20_4_ = fVar259 * auVar41._20_4_ + fVar388 * auVar42._20_4_ + auVar43._20_4_ * fVar214;
  auVar354._24_4_ = fVar261 * auVar41._24_4_ + fVar255 * auVar42._24_4_ + auVar43._24_4_ * fVar252;
  auVar354._28_4_ = fVar167 + in_register_000015dc + in_register_0000159c;
  auVar287._0_4_ = fVar257 * auVar44._0_4_ + fVar233 * auVar45._0_4_ + auVar46._0_4_ * fVar235;
  auVar287._4_4_ = fVar259 * auVar44._4_4_ + fVar388 * auVar45._4_4_ + auVar46._4_4_ * fVar214;
  auVar287._8_4_ = fVar261 * auVar44._8_4_ + fVar255 * auVar45._8_4_ + auVar46._8_4_ * fVar252;
  auVar287._12_4_ = fVar264 * auVar44._12_4_ + fVar167 * auVar45._12_4_ + auVar46._12_4_ * fVar297;
  auVar287._16_4_ = fVar257 * auVar44._16_4_ + fVar233 * auVar45._16_4_ + auVar46._16_4_ * fVar235;
  auVar287._20_4_ = fVar259 * auVar44._20_4_ + fVar388 * auVar45._20_4_ + auVar46._20_4_ * fVar214;
  auVar287._24_4_ = fVar261 * auVar44._24_4_ + fVar255 * auVar45._24_4_ + auVar46._24_4_ * fVar252;
  auVar287._28_4_ = fVar264 + fVar167 + fVar297;
  auVar286 = vshufps_avx(auVar195,auVar195,0);
  auVar222 = vshufps_avx(auVar195,auVar195,0x55);
  auVar269 = vshufps_avx(auVar195,auVar195,0xaa);
  fVar235 = auVar269._0_4_;
  fVar214 = auVar269._4_4_;
  fVar252 = auVar269._8_4_;
  fVar297 = auVar269._12_4_;
  fVar259 = auVar222._0_4_;
  fVar261 = auVar222._4_4_;
  fVar264 = auVar222._8_4_;
  fVar275 = auVar222._12_4_;
  fVar233 = auVar337._28_4_ + auVar292._28_4_;
  fVar388 = auVar286._0_4_;
  fVar255 = auVar286._4_4_;
  fVar167 = auVar286._8_4_;
  fVar257 = auVar286._12_4_;
  auVar198._0_4_ = fVar388 * auVar171._0_4_ + fVar259 * auVar337._0_4_ + fVar235 * auVar292._0_4_;
  auVar198._4_4_ = fVar255 * auVar171._4_4_ + fVar261 * auVar337._4_4_ + fVar214 * auVar292._4_4_;
  auVar198._8_4_ = fVar167 * auVar171._8_4_ + fVar264 * auVar337._8_4_ + fVar252 * auVar292._8_4_;
  auVar198._12_4_ =
       fVar257 * auVar171._12_4_ + fVar275 * auVar337._12_4_ + fVar297 * auVar292._12_4_;
  auVar198._16_4_ =
       fVar388 * auVar171._16_4_ + fVar259 * auVar337._16_4_ + fVar235 * auVar292._16_4_;
  auVar198._20_4_ =
       fVar255 * auVar171._20_4_ + fVar261 * auVar337._20_4_ + fVar214 * auVar292._20_4_;
  auVar198._24_4_ =
       fVar167 * auVar171._24_4_ + fVar264 * auVar337._24_4_ + fVar252 * auVar292._24_4_;
  auVar198._28_4_ = auVar171._28_4_ + fVar233;
  auVar172._0_4_ = fVar388 * auVar41._0_4_ + auVar43._0_4_ * fVar235 + fVar259 * auVar42._0_4_;
  auVar172._4_4_ = fVar255 * auVar41._4_4_ + auVar43._4_4_ * fVar214 + fVar261 * auVar42._4_4_;
  auVar172._8_4_ = fVar167 * auVar41._8_4_ + auVar43._8_4_ * fVar252 + fVar264 * auVar42._8_4_;
  auVar172._12_4_ = fVar257 * auVar41._12_4_ + auVar43._12_4_ * fVar297 + fVar275 * auVar42._12_4_;
  auVar172._16_4_ = fVar388 * auVar41._16_4_ + auVar43._16_4_ * fVar235 + fVar259 * auVar42._16_4_;
  auVar172._20_4_ = fVar255 * auVar41._20_4_ + auVar43._20_4_ * fVar214 + fVar261 * auVar42._20_4_;
  auVar172._24_4_ = fVar167 * auVar41._24_4_ + auVar43._24_4_ * fVar252 + fVar264 * auVar42._24_4_;
  auVar172._28_4_ = auVar171._28_4_ + auVar43._28_4_ + auVar292._28_4_;
  auVar319._8_4_ = 0x7fffffff;
  auVar319._0_8_ = 0x7fffffff7fffffff;
  auVar319._12_4_ = 0x7fffffff;
  auVar319._16_4_ = 0x7fffffff;
  auVar319._20_4_ = 0x7fffffff;
  auVar319._24_4_ = 0x7fffffff;
  auVar319._28_4_ = 0x7fffffff;
  auVar244._8_4_ = 0x219392ef;
  auVar244._0_8_ = 0x219392ef219392ef;
  auVar244._12_4_ = 0x219392ef;
  auVar244._16_4_ = 0x219392ef;
  auVar244._20_4_ = 0x219392ef;
  auVar244._24_4_ = 0x219392ef;
  auVar244._28_4_ = 0x219392ef;
  auVar171 = vandps_avx(auVar363,auVar319);
  auVar171 = vcmpps_avx(auVar171,auVar244,1);
  auVar337 = vblendvps_avx(auVar363,auVar244,auVar171);
  auVar171 = vandps_avx(auVar354,auVar319);
  auVar171 = vcmpps_avx(auVar171,auVar244,1);
  auVar292 = vblendvps_avx(auVar354,auVar244,auVar171);
  auVar171 = vandps_avx(auVar319,auVar287);
  auVar171 = vcmpps_avx(auVar171,auVar244,1);
  auVar171 = vblendvps_avx(auVar287,auVar244,auVar171);
  auVar227._0_4_ = fVar388 * auVar44._0_4_ + fVar259 * auVar45._0_4_ + auVar46._0_4_ * fVar235;
  auVar227._4_4_ = fVar255 * auVar44._4_4_ + fVar261 * auVar45._4_4_ + auVar46._4_4_ * fVar214;
  auVar227._8_4_ = fVar167 * auVar44._8_4_ + fVar264 * auVar45._8_4_ + auVar46._8_4_ * fVar252;
  auVar227._12_4_ = fVar257 * auVar44._12_4_ + fVar275 * auVar45._12_4_ + auVar46._12_4_ * fVar297;
  auVar227._16_4_ = fVar388 * auVar44._16_4_ + fVar259 * auVar45._16_4_ + auVar46._16_4_ * fVar235;
  auVar227._20_4_ = fVar255 * auVar44._20_4_ + fVar261 * auVar45._20_4_ + auVar46._20_4_ * fVar214;
  auVar227._24_4_ = fVar167 * auVar44._24_4_ + fVar264 * auVar45._24_4_ + auVar46._24_4_ * fVar252;
  auVar227._28_4_ = fVar233 + auVar42._28_4_ + fVar297;
  auVar41 = vrcpps_avx(auVar337);
  fVar235 = auVar41._0_4_;
  fVar252 = auVar41._4_4_;
  auVar42._4_4_ = auVar337._4_4_ * fVar252;
  auVar42._0_4_ = auVar337._0_4_ * fVar235;
  fVar233 = auVar41._8_4_;
  auVar42._8_4_ = auVar337._8_4_ * fVar233;
  fVar255 = auVar41._12_4_;
  auVar42._12_4_ = auVar337._12_4_ * fVar255;
  fVar257 = auVar41._16_4_;
  auVar42._16_4_ = auVar337._16_4_ * fVar257;
  fVar259 = auVar41._20_4_;
  auVar42._20_4_ = auVar337._20_4_ * fVar259;
  fVar261 = auVar41._24_4_;
  auVar42._24_4_ = auVar337._24_4_ * fVar261;
  auVar42._28_4_ = auVar337._28_4_;
  auVar320._8_4_ = 0x3f800000;
  auVar320._0_8_ = &DAT_3f8000003f800000;
  auVar320._12_4_ = 0x3f800000;
  auVar320._16_4_ = 0x3f800000;
  auVar320._20_4_ = 0x3f800000;
  auVar320._24_4_ = 0x3f800000;
  auVar320._28_4_ = 0x3f800000;
  auVar43 = vsubps_avx(auVar320,auVar42);
  auVar42 = vrcpps_avx(auVar292);
  fVar235 = fVar235 + fVar235 * auVar43._0_4_;
  fVar252 = fVar252 + fVar252 * auVar43._4_4_;
  fVar233 = fVar233 + fVar233 * auVar43._8_4_;
  fVar255 = fVar255 + fVar255 * auVar43._12_4_;
  fVar257 = fVar257 + fVar257 * auVar43._16_4_;
  fVar259 = fVar259 + fVar259 * auVar43._20_4_;
  fVar261 = fVar261 + fVar261 * auVar43._24_4_;
  fVar264 = auVar42._0_4_;
  fVar275 = auVar42._4_4_;
  auVar337._4_4_ = fVar275 * auVar292._4_4_;
  auVar337._0_4_ = fVar264 * auVar292._0_4_;
  fVar277 = auVar42._8_4_;
  auVar337._8_4_ = fVar277 * auVar292._8_4_;
  fVar278 = auVar42._12_4_;
  auVar337._12_4_ = fVar278 * auVar292._12_4_;
  fVar279 = auVar42._16_4_;
  auVar337._16_4_ = fVar279 * auVar292._16_4_;
  fVar280 = auVar42._20_4_;
  auVar337._20_4_ = fVar280 * auVar292._20_4_;
  fVar281 = auVar42._24_4_;
  auVar337._24_4_ = fVar281 * auVar292._24_4_;
  auVar337._28_4_ = auVar43._28_4_;
  auVar292 = vsubps_avx(auVar320,auVar337);
  fVar264 = fVar264 + fVar264 * auVar292._0_4_;
  fVar275 = fVar275 + fVar275 * auVar292._4_4_;
  fVar277 = fVar277 + fVar277 * auVar292._8_4_;
  fVar278 = fVar278 + fVar278 * auVar292._12_4_;
  fVar279 = fVar279 + fVar279 * auVar292._16_4_;
  fVar280 = fVar280 + fVar280 * auVar292._20_4_;
  fVar281 = fVar281 + fVar281 * auVar292._24_4_;
  auVar337 = vrcpps_avx(auVar171);
  fVar284 = auVar337._0_4_;
  fVar294 = auVar337._4_4_;
  auVar44._4_4_ = fVar294 * auVar171._4_4_;
  auVar44._0_4_ = fVar284 * auVar171._0_4_;
  fVar295 = auVar337._8_4_;
  auVar44._8_4_ = fVar295 * auVar171._8_4_;
  fVar296 = auVar337._12_4_;
  auVar44._12_4_ = fVar296 * auVar171._12_4_;
  fVar298 = auVar337._16_4_;
  auVar44._16_4_ = fVar298 * auVar171._16_4_;
  fVar299 = auVar337._20_4_;
  auVar44._20_4_ = fVar299 * auVar171._20_4_;
  fVar300 = auVar337._24_4_;
  auVar44._24_4_ = fVar300 * auVar171._24_4_;
  auVar44._28_4_ = auVar171._28_4_;
  auVar171 = vsubps_avx(auVar320,auVar44);
  fVar284 = fVar284 + fVar284 * auVar171._0_4_;
  fVar294 = fVar294 + fVar294 * auVar171._4_4_;
  fVar295 = fVar295 + fVar295 * auVar171._8_4_;
  fVar296 = fVar296 + fVar296 * auVar171._12_4_;
  fVar298 = fVar298 + fVar298 * auVar171._16_4_;
  fVar299 = fVar299 + fVar299 * auVar171._20_4_;
  fVar300 = fVar300 + fVar300 * auVar171._24_4_;
  auVar286 = ZEXT416((uint)(((ray->super_RayK<1>).dir.field_0.m128[3] -
                            *(float *)(prim + lVar161 + 0x16)) * *(float *)(prim + lVar161 + 0x1a)))
  ;
  auVar47 = vshufps_avx(auVar286,auVar286,0);
  auVar286._8_8_ = 0;
  auVar286._0_8_ = *(ulong *)(prim + uVar158 * 7 + 6);
  auVar286 = vpmovsxwd_avx(auVar286);
  auVar222._8_8_ = 0;
  auVar222._0_8_ = *(ulong *)(prim + uVar158 * 7 + 0xe);
  auVar222 = vpmovsxwd_avx(auVar222);
  auVar313._16_16_ = auVar222;
  auVar313._0_16_ = auVar286;
  auVar171 = vcvtdq2ps_avx(auVar313);
  auVar269._8_8_ = 0;
  auVar269._0_8_ = *(ulong *)(prim + uVar158 * 0xb + 6);
  auVar286 = vpmovsxwd_avx(auVar269);
  auVar239._8_8_ = 0;
  auVar239._0_8_ = *(ulong *)(prim + uVar158 * 0xb + 0xe);
  auVar222 = vpmovsxwd_avx(auVar239);
  auVar321._16_16_ = auVar222;
  auVar321._0_16_ = auVar286;
  auVar337 = vcvtdq2ps_avx(auVar321);
  auVar337 = vsubps_avx(auVar337,auVar171);
  fVar214 = auVar47._0_4_;
  fVar297 = auVar47._4_4_;
  fVar388 = auVar47._8_4_;
  fVar167 = auVar47._12_4_;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + uVar158 * 9 + 6);
  auVar286 = vpmovsxwd_avx(auVar47);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar158 * 9 + 0xe);
  auVar222 = vpmovsxwd_avx(auVar15);
  auVar314._0_4_ = auVar337._0_4_ * fVar214 + auVar171._0_4_;
  auVar314._4_4_ = auVar337._4_4_ * fVar297 + auVar171._4_4_;
  auVar314._8_4_ = auVar337._8_4_ * fVar388 + auVar171._8_4_;
  auVar314._12_4_ = auVar337._12_4_ * fVar167 + auVar171._12_4_;
  auVar314._16_4_ = auVar337._16_4_ * fVar214 + auVar171._16_4_;
  auVar314._20_4_ = auVar337._20_4_ * fVar297 + auVar171._20_4_;
  auVar314._24_4_ = auVar337._24_4_ * fVar388 + auVar171._24_4_;
  auVar314._28_4_ = auVar337._28_4_ + auVar171._28_4_;
  auVar322._16_16_ = auVar222;
  auVar322._0_16_ = auVar286;
  auVar171 = vcvtdq2ps_avx(auVar322);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar158 * 0xd + 6);
  auVar286 = vpmovsxwd_avx(auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar158 * 0xd + 0xe);
  auVar222 = vpmovsxwd_avx(auVar17);
  auVar331._16_16_ = auVar222;
  auVar331._0_16_ = auVar286;
  auVar337 = vcvtdq2ps_avx(auVar331);
  auVar337 = vsubps_avx(auVar337,auVar171);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar158 * 0x12 + 6);
  auVar286 = vpmovsxwd_avx(auVar18);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar158 * 0x12 + 0xe);
  auVar222 = vpmovsxwd_avx(auVar19);
  auVar323._0_4_ = auVar171._0_4_ + auVar337._0_4_ * fVar214;
  auVar323._4_4_ = auVar171._4_4_ + auVar337._4_4_ * fVar297;
  auVar323._8_4_ = auVar171._8_4_ + auVar337._8_4_ * fVar388;
  auVar323._12_4_ = auVar171._12_4_ + auVar337._12_4_ * fVar167;
  auVar323._16_4_ = auVar171._16_4_ + auVar337._16_4_ * fVar214;
  auVar323._20_4_ = auVar171._20_4_ + auVar337._20_4_ * fVar297;
  auVar323._24_4_ = auVar171._24_4_ + auVar337._24_4_ * fVar388;
  auVar323._28_4_ = auVar171._28_4_ + auVar337._28_4_;
  auVar332._16_16_ = auVar222;
  auVar332._0_16_ = auVar286;
  auVar171 = vcvtdq2ps_avx(auVar332);
  uVar165 = (ulong)(uint)((int)lVar160 << 2);
  lVar161 = uVar158 * 2 + uVar165;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + lVar161 + 6);
  auVar286 = vpmovsxwd_avx(auVar20);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + lVar161 + 0xe);
  auVar222 = vpmovsxwd_avx(auVar21);
  auVar345._16_16_ = auVar222;
  auVar345._0_16_ = auVar286;
  auVar337 = vcvtdq2ps_avx(auVar345);
  auVar337 = vsubps_avx(auVar337,auVar171);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar165 + 6);
  auVar286 = vpmovsxwd_avx(auVar22);
  auVar333._0_4_ = auVar171._0_4_ + auVar337._0_4_ * fVar214;
  auVar333._4_4_ = auVar171._4_4_ + auVar337._4_4_ * fVar297;
  auVar333._8_4_ = auVar171._8_4_ + auVar337._8_4_ * fVar388;
  auVar333._12_4_ = auVar171._12_4_ + auVar337._12_4_ * fVar167;
  auVar333._16_4_ = auVar171._16_4_ + auVar337._16_4_ * fVar214;
  auVar333._20_4_ = auVar171._20_4_ + auVar337._20_4_ * fVar297;
  auVar333._24_4_ = auVar171._24_4_ + auVar337._24_4_ * fVar388;
  auVar333._28_4_ = auVar171._28_4_ + auVar337._28_4_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar165 + 0xe);
  auVar222 = vpmovsxwd_avx(auVar23);
  auVar346._16_16_ = auVar222;
  auVar346._0_16_ = auVar286;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar158 * 0x18 + 6);
  auVar286 = vpmovsxwd_avx(auVar24);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar158 * 0x18 + 0xe);
  auVar222 = vpmovsxwd_avx(auVar25);
  auVar171 = vcvtdq2ps_avx(auVar346);
  auVar355._16_16_ = auVar222;
  auVar355._0_16_ = auVar286;
  auVar337 = vcvtdq2ps_avx(auVar355);
  auVar337 = vsubps_avx(auVar337,auVar171);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar158 * 0x1d + 6);
  auVar286 = vpmovsxwd_avx(auVar26);
  auVar347._0_4_ = auVar171._0_4_ + auVar337._0_4_ * fVar214;
  auVar347._4_4_ = auVar171._4_4_ + auVar337._4_4_ * fVar297;
  auVar347._8_4_ = auVar171._8_4_ + auVar337._8_4_ * fVar388;
  auVar347._12_4_ = auVar171._12_4_ + auVar337._12_4_ * fVar167;
  auVar347._16_4_ = auVar171._16_4_ + auVar337._16_4_ * fVar214;
  auVar347._20_4_ = auVar171._20_4_ + auVar337._20_4_ * fVar297;
  auVar347._24_4_ = auVar171._24_4_ + auVar337._24_4_ * fVar388;
  auVar347._28_4_ = auVar171._28_4_ + auVar337._28_4_;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar158 * 0x1d + 0xe);
  auVar222 = vpmovsxwd_avx(auVar27);
  auVar356._16_16_ = auVar222;
  auVar356._0_16_ = auVar286;
  auVar171 = vcvtdq2ps_avx(auVar356);
  lVar161 = uVar158 + (ulong)(byte)PVar34 * 0x20;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + lVar161 + 6);
  auVar286 = vpmovsxwd_avx(auVar28);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + lVar161 + 0xe);
  auVar222 = vpmovsxwd_avx(auVar29);
  auVar364._16_16_ = auVar222;
  auVar364._0_16_ = auVar286;
  auVar337 = vcvtdq2ps_avx(auVar364);
  auVar337 = vsubps_avx(auVar337,auVar171);
  auVar357._0_4_ = auVar171._0_4_ + auVar337._0_4_ * fVar214;
  auVar357._4_4_ = auVar171._4_4_ + auVar337._4_4_ * fVar297;
  auVar357._8_4_ = auVar171._8_4_ + auVar337._8_4_ * fVar388;
  auVar357._12_4_ = auVar171._12_4_ + auVar337._12_4_ * fVar167;
  auVar357._16_4_ = auVar171._16_4_ + auVar337._16_4_ * fVar214;
  auVar357._20_4_ = auVar171._20_4_ + auVar337._20_4_ * fVar297;
  auVar357._24_4_ = auVar171._24_4_ + auVar337._24_4_ * fVar388;
  auVar357._28_4_ = auVar171._28_4_ + auVar337._28_4_;
  lVar161 = (ulong)(byte)PVar34 * 0x20 - uVar158;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + lVar161 + 6);
  auVar286 = vpmovsxwd_avx(auVar30);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(prim + lVar161 + 0xe);
  auVar222 = vpmovsxwd_avx(auVar31);
  auVar365._16_16_ = auVar222;
  auVar365._0_16_ = auVar286;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *(ulong *)(prim + uVar158 * 0x23 + 6);
  auVar286 = vpmovsxwd_avx(auVar32);
  local_468 = prim;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *(ulong *)(prim + uVar158 * 0x23 + 0xe);
  auVar222 = vpmovsxwd_avx(auVar33);
  auVar377._16_16_ = auVar222;
  auVar377._0_16_ = auVar286;
  auVar171 = vcvtdq2ps_avx(auVar365);
  auVar337 = vcvtdq2ps_avx(auVar377);
  auVar337 = vsubps_avx(auVar337,auVar171);
  auVar366._0_4_ = auVar171._0_4_ + auVar337._0_4_ * fVar214;
  auVar366._4_4_ = auVar171._4_4_ + auVar337._4_4_ * fVar297;
  auVar366._8_4_ = auVar171._8_4_ + auVar337._8_4_ * fVar388;
  auVar366._12_4_ = auVar171._12_4_ + auVar337._12_4_ * fVar167;
  auVar366._16_4_ = auVar171._16_4_ + auVar337._16_4_ * fVar214;
  auVar366._20_4_ = auVar171._20_4_ + auVar337._20_4_ * fVar297;
  auVar366._24_4_ = auVar171._24_4_ + auVar337._24_4_ * fVar388;
  auVar366._28_4_ = auVar171._28_4_ + fVar167;
  auVar171 = vsubps_avx(auVar314,auVar198);
  auVar303._0_4_ = fVar235 * auVar171._0_4_;
  auVar303._4_4_ = fVar252 * auVar171._4_4_;
  auVar303._8_4_ = fVar233 * auVar171._8_4_;
  auVar303._12_4_ = fVar255 * auVar171._12_4_;
  auVar45._16_4_ = fVar257 * auVar171._16_4_;
  auVar45._0_16_ = auVar303;
  auVar45._20_4_ = fVar259 * auVar171._20_4_;
  auVar45._24_4_ = fVar261 * auVar171._24_4_;
  auVar45._28_4_ = auVar171._28_4_;
  auVar171 = vsubps_avx(auVar323,auVar198);
  auVar236._0_4_ = fVar235 * auVar171._0_4_;
  auVar236._4_4_ = fVar252 * auVar171._4_4_;
  auVar236._8_4_ = fVar233 * auVar171._8_4_;
  auVar236._12_4_ = fVar255 * auVar171._12_4_;
  auVar46._16_4_ = fVar257 * auVar171._16_4_;
  auVar46._0_16_ = auVar236;
  auVar46._20_4_ = fVar259 * auVar171._20_4_;
  auVar46._24_4_ = fVar261 * auVar171._24_4_;
  auVar46._28_4_ = auVar41._28_4_ + auVar43._28_4_;
  auVar171 = vsubps_avx(auVar333,auVar172);
  auVar196._0_4_ = fVar264 * auVar171._0_4_;
  auVar196._4_4_ = fVar275 * auVar171._4_4_;
  auVar196._8_4_ = fVar277 * auVar171._8_4_;
  auVar196._12_4_ = fVar278 * auVar171._12_4_;
  auVar41._16_4_ = fVar279 * auVar171._16_4_;
  auVar41._0_16_ = auVar196;
  auVar41._20_4_ = fVar280 * auVar171._20_4_;
  auVar41._24_4_ = fVar281 * auVar171._24_4_;
  auVar41._28_4_ = auVar171._28_4_;
  auVar171 = vsubps_avx(auVar347,auVar172);
  auVar266._0_4_ = fVar264 * auVar171._0_4_;
  auVar266._4_4_ = fVar275 * auVar171._4_4_;
  auVar266._8_4_ = fVar277 * auVar171._8_4_;
  auVar266._12_4_ = fVar278 * auVar171._12_4_;
  auVar43._16_4_ = fVar279 * auVar171._16_4_;
  auVar43._0_16_ = auVar266;
  auVar43._20_4_ = fVar280 * auVar171._20_4_;
  auVar43._24_4_ = fVar281 * auVar171._24_4_;
  auVar43._28_4_ = auVar42._28_4_ + auVar292._28_4_;
  auVar171 = vsubps_avx(auVar357,auVar227);
  auVar169._0_4_ = fVar284 * auVar171._0_4_;
  auVar169._4_4_ = fVar294 * auVar171._4_4_;
  auVar169._8_4_ = fVar295 * auVar171._8_4_;
  auVar169._12_4_ = fVar296 * auVar171._12_4_;
  auVar292._16_4_ = fVar298 * auVar171._16_4_;
  auVar292._0_16_ = auVar169;
  auVar292._20_4_ = fVar299 * auVar171._20_4_;
  auVar292._24_4_ = fVar300 * auVar171._24_4_;
  auVar292._28_4_ = auVar171._28_4_;
  auVar171 = vsubps_avx(auVar366,auVar227);
  auVar218._0_4_ = fVar284 * auVar171._0_4_;
  auVar218._4_4_ = fVar294 * auVar171._4_4_;
  auVar218._8_4_ = fVar295 * auVar171._8_4_;
  auVar218._12_4_ = fVar296 * auVar171._12_4_;
  auVar48._16_4_ = fVar298 * auVar171._16_4_;
  auVar48._0_16_ = auVar218;
  auVar48._20_4_ = fVar299 * auVar171._20_4_;
  auVar48._24_4_ = fVar300 * auVar171._24_4_;
  auVar48._28_4_ = auVar171._28_4_;
  auVar286 = vpminsd_avx(auVar45._16_16_,auVar46._16_16_);
  auVar222 = vpminsd_avx(auVar303,auVar236);
  auVar324._16_16_ = auVar286;
  auVar324._0_16_ = auVar222;
  auVar286 = vpminsd_avx(auVar41._16_16_,auVar43._16_16_);
  auVar222 = vpminsd_avx(auVar196,auVar266);
  auVar358._16_16_ = auVar286;
  auVar358._0_16_ = auVar222;
  auVar171 = vmaxps_avx(auVar324,auVar358);
  auVar286 = vpminsd_avx(auVar292._16_16_,auVar48._16_16_);
  auVar222 = vpminsd_avx(auVar169,auVar218);
  auVar378._16_16_ = auVar286;
  auVar378._0_16_ = auVar222;
  uVar12 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar392._4_4_ = uVar12;
  auVar392._0_4_ = uVar12;
  auVar392._8_4_ = uVar12;
  auVar392._12_4_ = uVar12;
  auVar392._16_4_ = uVar12;
  auVar392._20_4_ = uVar12;
  auVar392._24_4_ = uVar12;
  auVar392._28_4_ = uVar12;
  auVar337 = vmaxps_avx(auVar378,auVar392);
  auVar171 = vmaxps_avx(auVar171,auVar337);
  local_80._4_4_ = auVar171._4_4_ * 0.99999964;
  local_80._0_4_ = auVar171._0_4_ * 0.99999964;
  local_80._8_4_ = auVar171._8_4_ * 0.99999964;
  local_80._12_4_ = auVar171._12_4_ * 0.99999964;
  local_80._16_4_ = auVar171._16_4_ * 0.99999964;
  local_80._20_4_ = auVar171._20_4_ * 0.99999964;
  local_80._24_4_ = auVar171._24_4_ * 0.99999964;
  local_80._28_4_ = auVar171._28_4_;
  auVar286 = vpmaxsd_avx(auVar45._16_16_,auVar46._16_16_);
  auVar222 = vpmaxsd_avx(auVar303,auVar236);
  auVar245._16_16_ = auVar286;
  auVar245._0_16_ = auVar222;
  auVar286 = vpmaxsd_avx(auVar41._16_16_,auVar43._16_16_);
  auVar222 = vpmaxsd_avx(auVar196,auVar266);
  auVar199._16_16_ = auVar286;
  auVar199._0_16_ = auVar222;
  auVar171 = vminps_avx(auVar245,auVar199);
  auVar286 = vpmaxsd_avx(auVar292._16_16_,auVar48._16_16_);
  auVar222 = vpmaxsd_avx(auVar169,auVar218);
  fVar235 = (ray->super_RayK<1>).tfar;
  auVar228._4_4_ = fVar235;
  auVar228._0_4_ = fVar235;
  auVar228._8_4_ = fVar235;
  auVar228._12_4_ = fVar235;
  auVar228._16_4_ = fVar235;
  auVar228._20_4_ = fVar235;
  auVar228._24_4_ = fVar235;
  auVar228._28_4_ = fVar235;
  auVar173._16_16_ = auVar286;
  auVar173._0_16_ = auVar222;
  auVar337 = vminps_avx(auVar173,auVar228);
  auVar171 = vminps_avx(auVar171,auVar337);
  auVar40._4_4_ = auVar171._4_4_ * 1.0000004;
  auVar40._0_4_ = auVar171._0_4_ * 1.0000004;
  auVar40._8_4_ = auVar171._8_4_ * 1.0000004;
  auVar40._12_4_ = auVar171._12_4_ * 1.0000004;
  auVar40._16_4_ = auVar171._16_4_ * 1.0000004;
  auVar40._20_4_ = auVar171._20_4_ * 1.0000004;
  auVar40._24_4_ = auVar171._24_4_ * 1.0000004;
  auVar40._28_4_ = auVar171._28_4_;
  auVar171 = vcmpps_avx(local_80,auVar40,2);
  auVar286 = vpshufd_avx(ZEXT116((byte)PVar34),0);
  auVar200._16_16_ = auVar286;
  auVar200._0_16_ = auVar286;
  auVar337 = vcvtdq2ps_avx(auVar200);
  auVar337 = vcmpps_avx(_DAT_02020f40,auVar337,1);
  auVar171 = vandps_avx(auVar171,auVar337);
  uVar155 = vmovmskps_avx(auVar171);
  if (uVar155 != 0) {
    uVar155 = uVar155 & 0xff;
    local_460 = mm_lookupmask_ps._16_8_;
    uStack_458 = mm_lookupmask_ps._24_8_;
    uStack_450 = mm_lookupmask_ps._16_8_;
    uStack_448 = mm_lookupmask_ps._24_8_;
    do {
      lVar161 = 0;
      if (uVar155 != 0) {
        for (; (uVar155 >> lVar161 & 1) == 0; lVar161 = lVar161 + 1) {
        }
      }
      uVar159 = *(uint *)(local_468 + 2);
      uVar157 = *(uint *)(local_468 + lVar161 * 4 + 6);
      local_800 = (ulong)uVar159;
      pGVar36 = (context->scene->geometries).items[uVar159].ptr;
      local_7f8 = (ulong)uVar157;
      uVar158 = (ulong)*(uint *)(*(long *)&pGVar36->field_0x58 +
                                (ulong)uVar157 *
                                pGVar36[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i);
      fVar235 = (pGVar36->time_range).lower;
      fVar235 = pGVar36->fnumTimeSegments *
                (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar235) /
                ((pGVar36->time_range).upper - fVar235));
      auVar286 = vroundss_avx(ZEXT416((uint)fVar235),ZEXT416((uint)fVar235),9);
      auVar286 = vminss_avx(auVar286,ZEXT416((uint)(pGVar36->fnumTimeSegments + -1.0)));
      auVar286 = vmaxss_avx(ZEXT816(0) << 0x20,auVar286);
      fVar235 = fVar235 - auVar286._0_4_;
      _Var37 = pGVar36[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar163 = (long)(int)auVar286._0_4_ * 0x38;
      lVar161 = *(long *)(_Var37 + 0x10 + lVar163);
      lVar160 = *(long *)(_Var37 + 0x38 + lVar163);
      lVar162 = *(long *)(_Var37 + 0x48 + lVar163);
      auVar286 = vshufps_avx(ZEXT416((uint)fVar235),ZEXT416((uint)fVar235),0);
      pfVar1 = (float *)(lVar160 + uVar158 * lVar162);
      fVar214 = auVar286._0_4_;
      fVar252 = auVar286._4_4_;
      fVar297 = auVar286._8_4_;
      fVar233 = auVar286._12_4_;
      pfVar2 = (float *)(lVar160 + (uVar158 + 1) * lVar162);
      pfVar3 = (float *)(lVar160 + (uVar158 + 2) * lVar162);
      pfVar4 = (float *)(lVar160 + lVar162 * (uVar158 + 3));
      lVar160 = *(long *)(_Var37 + lVar163);
      auVar286 = vshufps_avx(ZEXT416((uint)(1.0 - fVar235)),ZEXT416((uint)(1.0 - fVar235)),0);
      pfVar5 = (float *)(lVar160 + lVar161 * uVar158);
      fVar235 = auVar286._0_4_;
      fVar388 = auVar286._4_4_;
      fVar255 = auVar286._8_4_;
      fVar167 = auVar286._12_4_;
      pfVar6 = (float *)(lVar160 + lVar161 * (uVar158 + 1));
      pfVar7 = (float *)(lVar160 + lVar161 * (uVar158 + 2));
      pfVar8 = (float *)(lVar160 + lVar161 * (uVar158 + 3));
      uVar35 = (uint)pGVar36[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar161 = (long)(int)uVar35 * 0x44;
      fVar265 = fVar214 * *pfVar1 + fVar235 * *pfVar5;
      fVar276 = fVar252 * pfVar1[1] + fVar388 * pfVar5[1];
      auVar267._0_8_ = CONCAT44(fVar276,fVar265);
      auVar267._8_4_ = fVar297 * pfVar1[2] + fVar255 * pfVar5[2];
      auVar267._12_4_ = fVar233 * pfVar1[3] + fVar167 * pfVar5[3];
      fVar360 = fVar235 * *pfVar6 + fVar214 * *pfVar2;
      fVar371 = fVar388 * pfVar6[1] + fVar252 * pfVar2[1];
      auVar362._0_8_ = CONCAT44(fVar371,fVar360);
      auVar362._8_4_ = fVar255 * pfVar6[2] + fVar297 * pfVar2[2];
      auVar362._12_4_ = fVar167 * pfVar6[3] + fVar233 * pfVar2[3];
      fVar400 = fVar235 * *pfVar7 + fVar214 * *pfVar3;
      fVar405 = fVar388 * pfVar7[1] + fVar252 * pfVar3[1];
      auVar402._0_8_ = CONCAT44(fVar405,fVar400);
      auVar402._8_4_ = fVar255 * pfVar7[2] + fVar297 * pfVar3[2];
      auVar402._12_4_ = fVar167 * pfVar7[3] + fVar233 * pfVar3[3];
      fVar389 = fVar235 * *pfVar8 + fVar214 * *pfVar4;
      fVar396 = fVar388 * pfVar8[1] + fVar252 * pfVar4[1];
      auVar391._0_8_ = CONCAT44(fVar396,fVar389);
      auVar391._8_4_ = fVar255 * pfVar8[2] + fVar297 * pfVar4[2];
      auVar391._12_4_ = fVar167 * pfVar8[3] + fVar233 * pfVar4[3];
      aVar14 = (ray->super_RayK<1>).org.field_0;
      auVar269 = vsubps_avx(auVar267,(undefined1  [16])aVar14);
      _local_7f0 = auVar267;
      auVar286 = vshufps_avx(auVar269,auVar269,0);
      auVar222 = vshufps_avx(auVar269,auVar269,0x55);
      auVar269 = vshufps_avx(auVar269,auVar269,0xaa);
      fVar235 = (local_7d8->ray_space).vx.field_0.m128[0];
      fVar214 = (local_7d8->ray_space).vx.field_0.m128[1];
      fVar252 = (local_7d8->ray_space).vx.field_0.m128[2];
      fVar297 = (local_7d8->ray_space).vx.field_0.m128[3];
      fVar233 = (local_7d8->ray_space).vy.field_0.m128[0];
      fVar388 = (local_7d8->ray_space).vy.field_0.m128[1];
      fVar255 = (local_7d8->ray_space).vy.field_0.m128[2];
      fVar167 = (local_7d8->ray_space).vy.field_0.m128[3];
      fVar257 = (local_7d8->ray_space).vz.field_0.m128[0];
      fVar259 = (local_7d8->ray_space).vz.field_0.m128[1];
      fVar261 = (local_7d8->ray_space).vz.field_0.m128[2];
      fVar264 = (local_7d8->ray_space).vz.field_0.m128[3];
      auVar237._0_8_ =
           CONCAT44(auVar286._4_4_ * fVar214 + auVar269._4_4_ * fVar259 + auVar222._4_4_ * fVar388,
                    auVar286._0_4_ * fVar235 + auVar269._0_4_ * fVar257 + auVar222._0_4_ * fVar233);
      auVar237._8_4_ =
           auVar286._8_4_ * fVar252 + auVar269._8_4_ * fVar261 + auVar222._8_4_ * fVar255;
      auVar237._12_4_ =
           auVar286._12_4_ * fVar297 + auVar269._12_4_ * fVar264 + auVar222._12_4_ * fVar167;
      auVar286 = vblendps_avx(auVar237,auVar267,8);
      auVar239 = vsubps_avx(auVar362,(undefined1  [16])aVar14);
      auVar222 = vshufps_avx(auVar239,auVar239,0);
      auVar269 = vshufps_avx(auVar239,auVar239,0x55);
      auVar239 = vshufps_avx(auVar239,auVar239,0xaa);
      auVar310._0_4_ =
           auVar222._0_4_ * fVar235 + auVar269._0_4_ * fVar233 + auVar239._0_4_ * fVar257;
      auVar310._4_4_ =
           auVar222._4_4_ * fVar214 + auVar269._4_4_ * fVar388 + auVar239._4_4_ * fVar259;
      auVar310._8_4_ =
           auVar222._8_4_ * fVar252 + auVar269._8_4_ * fVar255 + auVar239._8_4_ * fVar261;
      auVar310._12_4_ =
           auVar222._12_4_ * fVar297 + auVar269._12_4_ * fVar167 + auVar239._12_4_ * fVar264;
      auVar222 = vblendps_avx(auVar310,auVar362,8);
      auVar47 = vsubps_avx(auVar402,(undefined1  [16])aVar14);
      auVar269 = vshufps_avx(auVar47,auVar47,0);
      auVar239 = vshufps_avx(auVar47,auVar47,0x55);
      auVar47 = vshufps_avx(auVar47,auVar47,0xaa);
      auVar318._0_4_ = auVar269._0_4_ * fVar235 + auVar47._0_4_ * fVar257 + auVar239._0_4_ * fVar233
      ;
      auVar318._4_4_ = auVar269._4_4_ * fVar214 + auVar47._4_4_ * fVar259 + auVar239._4_4_ * fVar388
      ;
      auVar318._8_4_ = auVar269._8_4_ * fVar252 + auVar47._8_4_ * fVar261 + auVar239._8_4_ * fVar255
      ;
      auVar318._12_4_ =
           auVar269._12_4_ * fVar297 + auVar47._12_4_ * fVar264 + auVar239._12_4_ * fVar167;
      auVar269 = vblendps_avx(auVar318,auVar402,8);
      auVar15 = vsubps_avx(auVar391,(undefined1  [16])aVar14);
      auVar239 = vshufps_avx(auVar15,auVar15,0);
      auVar47 = vshufps_avx(auVar15,auVar15,0x55);
      auVar15 = vshufps_avx(auVar15,auVar15,0xaa);
      auVar197._0_4_ = auVar239._0_4_ * fVar235 + auVar15._0_4_ * fVar257 + auVar47._0_4_ * fVar233;
      auVar197._4_4_ = auVar239._4_4_ * fVar214 + auVar15._4_4_ * fVar259 + auVar47._4_4_ * fVar388;
      auVar197._8_4_ = auVar239._8_4_ * fVar252 + auVar15._8_4_ * fVar261 + auVar47._8_4_ * fVar255;
      auVar197._12_4_ =
           auVar239._12_4_ * fVar297 + auVar15._12_4_ * fVar264 + auVar47._12_4_ * fVar167;
      auVar239 = vblendps_avx(auVar197,auVar391,8);
      auVar268._8_4_ = 0x7fffffff;
      auVar268._0_8_ = 0x7fffffff7fffffff;
      auVar268._12_4_ = 0x7fffffff;
      auVar286 = vandps_avx(auVar286,auVar268);
      auVar222 = vandps_avx(auVar222,auVar268);
      auVar47 = vmaxps_avx(auVar286,auVar222);
      auVar286 = vandps_avx(auVar269,auVar268);
      auVar222 = vandps_avx(auVar239,auVar268);
      auVar286 = vmaxps_avx(auVar286,auVar222);
      auVar286 = vmaxps_avx(auVar47,auVar286);
      auVar222 = vmovshdup_avx(auVar286);
      auVar222 = vmaxss_avx(auVar222,auVar286);
      auVar286 = vshufpd_avx(auVar286,auVar286,1);
      auVar286 = vmaxss_avx(auVar286,auVar222);
      fVar264 = *(float *)(bspline_basis0 + lVar161 + 0x908);
      fVar275 = *(float *)(bspline_basis0 + lVar161 + 0x90c);
      fVar277 = *(float *)(bspline_basis0 + lVar161 + 0x910);
      fVar278 = *(float *)(bspline_basis0 + lVar161 + 0x914);
      fVar279 = *(float *)(bspline_basis0 + lVar161 + 0x918);
      fVar280 = *(float *)(bspline_basis0 + lVar161 + 0x91c);
      fVar281 = *(float *)(bspline_basis0 + lVar161 + 0x920);
      auVar222 = vshufps_avx(auVar318,auVar318,0);
      register0x00001250 = auVar222;
      _local_5e0 = auVar222;
      auVar269 = vshufps_avx(auVar318,auVar318,0x55);
      register0x00001290 = auVar269;
      _local_640 = auVar269;
      fVar257 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar161 + 0xd8c);
      fVar259 = *(float *)(bspline_basis0 + lVar161 + 0xd90);
      fVar261 = *(float *)(bspline_basis0 + lVar161 + 0xd94);
      fVar284 = *(float *)(bspline_basis0 + lVar161 + 0xd98);
      fVar294 = *(float *)(bspline_basis0 + lVar161 + 0xd9c);
      fVar295 = *(float *)(bspline_basis0 + lVar161 + 0xda0);
      fVar296 = *(float *)(bspline_basis0 + lVar161 + 0xda4);
      auVar149 = *(undefined1 (*) [28])(bspline_basis0 + lVar161 + 0xd8c);
      _local_720 = auVar197;
      auVar239 = vshufps_avx(auVar197,auVar197,0);
      register0x00001550 = auVar239;
      _local_3c0 = auVar239;
      fVar375 = auVar239._0_4_;
      fVar382 = auVar239._4_4_;
      fVar384 = auVar239._8_4_;
      fVar386 = auVar239._12_4_;
      fVar194 = auVar222._0_4_;
      fVar211 = auVar222._4_4_;
      fVar212 = auVar222._8_4_;
      fVar213 = auVar222._12_4_;
      auVar222 = vshufps_avx(auVar197,auVar197,0x55);
      register0x00001250 = auVar222;
      _local_780 = auVar222;
      fVar235 = auVar222._0_4_;
      fVar252 = auVar222._4_4_;
      fVar233 = auVar222._8_4_;
      fVar255 = auVar222._12_4_;
      fVar217 = auVar269._0_4_;
      fVar231 = auVar269._4_4_;
      fVar232 = auVar269._8_4_;
      fVar338 = auVar269._12_4_;
      _local_5a0 = auVar402;
      auVar16 = _local_5a0;
      auVar222 = vshufps_avx(auVar402,auVar402,0xff);
      register0x00001450 = auVar222;
      _local_a0 = auVar222;
      _local_5b0 = auVar391;
      auVar15 = _local_5b0;
      auVar269 = vshufps_avx(auVar391,auVar391,0xff);
      register0x00001390 = auVar269;
      _local_180 = auVar269;
      fVar214 = auVar269._0_4_;
      fVar297 = auVar269._4_4_;
      fVar388 = auVar269._8_4_;
      fVar167 = auVar269._12_4_;
      fVar189 = auVar222._0_4_;
      fVar190 = auVar222._4_4_;
      fVar191 = auVar222._8_4_;
      auVar269 = vshufps_avx(auVar310,auVar310,0);
      register0x000014d0 = auVar269;
      _local_580 = auVar269;
      fVar298 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar161 + 0x484);
      fVar299 = *(float *)(bspline_basis0 + lVar161 + 0x488);
      fVar300 = *(float *)(bspline_basis0 + lVar161 + 0x48c);
      fVar327 = *(float *)(bspline_basis0 + lVar161 + 0x490);
      fVar328 = *(float *)(bspline_basis0 + lVar161 + 0x494);
      fVar263 = *(float *)(bspline_basis0 + lVar161 + 0x498);
      fVar329 = *(float *)(bspline_basis0 + lVar161 + 0x49c);
      auVar150 = *(undefined1 (*) [28])(bspline_basis0 + lVar161 + 0x484);
      fVar166 = *(float *)(bspline_basis0 + lVar161 + 0x4a0);
      fVar309 = auVar269._0_4_;
      fVar339 = auVar269._4_4_;
      fVar340 = auVar269._8_4_;
      fVar342 = auVar269._12_4_;
      auVar269 = vshufps_avx(auVar310,auVar310,0x55);
      local_660._16_16_ = auVar269;
      local_660._0_16_ = auVar269;
      fVar401 = auVar269._0_4_;
      fVar406 = auVar269._4_4_;
      fVar407 = auVar269._8_4_;
      fVar408 = auVar269._12_4_;
      _local_590 = auVar362;
      auVar17 = _local_590;
      auVar269 = vshufps_avx(auVar362,auVar362,0xff);
      register0x00001590 = auVar269;
      _local_c0 = auVar269;
      fVar353 = auVar269._0_4_;
      fVar376 = auVar269._4_4_;
      fVar383 = auVar269._8_4_;
      fVar385 = auVar269._12_4_;
      auVar140._8_4_ = auVar237._8_4_;
      auVar140._0_8_ = auVar237._0_8_;
      auVar140._12_4_ = auVar237._12_4_;
      auVar269 = vshufps_avx(auVar140,auVar140,0);
      register0x00001510 = auVar269;
      _local_200 = auVar269;
      local_400 = *(float *)(bspline_basis0 + lVar161);
      fStack_3fc = *(float *)(bspline_basis0 + lVar161 + 4);
      fStack_3f8 = *(float *)(bspline_basis0 + lVar161 + 8);
      fStack_3f4 = *(float *)(bspline_basis0 + lVar161 + 0xc);
      fStack_3f0 = *(float *)(bspline_basis0 + lVar161 + 0x10);
      fStack_3ec = *(float *)(bspline_basis0 + lVar161 + 0x14);
      fStack_3e8 = *(float *)(bspline_basis0 + lVar161 + 0x18);
      fVar361 = auVar269._0_4_;
      fVar372 = auVar269._4_4_;
      fVar373 = auVar269._8_4_;
      fVar374 = auVar269._12_4_;
      auVar315._0_4_ =
           fVar361 * local_400 + fVar309 * fVar298 + fVar194 * fVar264 + fVar375 * fVar257;
      auVar315._4_4_ =
           fVar372 * fStack_3fc + fVar339 * fVar299 + fVar211 * fVar275 + fVar382 * fVar259;
      auVar315._8_4_ =
           fVar373 * fStack_3f8 + fVar340 * fVar300 + fVar212 * fVar277 + fVar384 * fVar261;
      auVar315._12_4_ =
           fVar374 * fStack_3f4 + fVar342 * fVar327 + fVar213 * fVar278 + fVar386 * fVar284;
      auVar315._16_4_ =
           fVar361 * fStack_3f0 + fVar309 * fVar328 + fVar194 * fVar279 + fVar375 * fVar294;
      auVar315._20_4_ =
           fVar372 * fStack_3ec + fVar339 * fVar263 + fVar211 * fVar280 + fVar382 * fVar295;
      auVar315._24_4_ =
           fVar373 * fStack_3e8 + fVar340 * fVar329 + fVar212 * fVar281 + fVar384 * fVar296;
      auVar315._28_4_ = fVar166 + fVar213 + 0.0 + 0.0;
      auVar239 = vshufps_avx(auVar140,auVar140,0x55);
      register0x00001310 = auVar239;
      _local_e0 = auVar239;
      fVar341 = auVar239._0_4_;
      fVar168 = auVar239._4_4_;
      fVar186 = auVar239._8_4_;
      fVar188 = auVar239._12_4_;
      auVar325._0_4_ =
           fVar341 * local_400 + fVar401 * fVar298 + fVar217 * fVar264 + fVar257 * fVar235;
      auVar325._4_4_ =
           fVar168 * fStack_3fc + fVar406 * fVar299 + fVar231 * fVar275 + fVar259 * fVar252;
      auVar325._8_4_ =
           fVar186 * fStack_3f8 + fVar407 * fVar300 + fVar232 * fVar277 + fVar261 * fVar233;
      auVar325._12_4_ =
           fVar188 * fStack_3f4 + fVar408 * fVar327 + fVar338 * fVar278 + fVar284 * fVar255;
      auVar325._16_4_ =
           fVar341 * fStack_3f0 + fVar401 * fVar328 + fVar217 * fVar279 + fVar294 * fVar235;
      auVar325._20_4_ =
           fVar168 * fStack_3ec + fVar406 * fVar263 + fVar231 * fVar280 + fVar295 * fVar252;
      auVar325._24_4_ =
           fVar186 * fStack_3e8 + fVar407 * fVar329 + fVar232 * fVar281 + fVar296 * fVar233;
      auVar325._28_4_ = fVar338 + fVar255 + 0.0 + 0.0;
      auVar239 = vpermilps_avx(auVar267,0xff);
      register0x00001490 = auVar239;
      _local_1a0 = auVar239;
      fStack_3e4 = (float)*(undefined4 *)(bspline_basis0 + lVar161 + 0x1c);
      fVar192 = auVar239._0_4_;
      fVar193 = auVar239._4_4_;
      fVar216 = auVar239._8_4_;
      local_7a0._0_4_ =
           fVar192 * local_400 + fVar353 * fVar298 + fVar189 * fVar264 + fVar257 * fVar214;
      local_7a0._4_4_ =
           fVar193 * fStack_3fc + fVar376 * fVar299 + fVar190 * fVar275 + fVar259 * fVar297;
      local_7a0._8_4_ =
           fVar216 * fStack_3f8 + fVar383 * fVar300 + fVar191 * fVar277 + fVar261 * fVar388;
      local_7a0._12_4_ =
           auVar239._12_4_ * fStack_3f4 +
           fVar385 * fVar327 + auVar222._12_4_ * fVar278 + fVar284 * fVar167;
      local_7a0._16_4_ =
           fVar192 * fStack_3f0 + fVar353 * fVar328 + fVar189 * fVar279 + fVar294 * fVar214;
      local_7a0._20_4_ =
           fVar193 * fStack_3ec + fVar376 * fVar263 + fVar190 * fVar280 + fVar295 * fVar297;
      local_7a0._24_4_ =
           fVar216 * fStack_3e8 + fVar383 * fVar329 + fVar191 * fVar281 + fVar296 * fVar388;
      local_7a0._28_4_ = 0;
      fVar284 = *(float *)(bspline_basis1 + lVar161 + 0x908);
      fVar294 = *(float *)(bspline_basis1 + lVar161 + 0x90c);
      fVar295 = *(float *)(bspline_basis1 + lVar161 + 0x910);
      fVar296 = *(float *)(bspline_basis1 + lVar161 + 0x914);
      fVar298 = *(float *)(bspline_basis1 + lVar161 + 0x918);
      fVar299 = *(float *)(bspline_basis1 + lVar161 + 0x91c);
      fVar300 = *(float *)(bspline_basis1 + lVar161 + 0x920);
      fVar327 = *(float *)(bspline_basis1 + lVar161 + 0xd8c);
      fVar328 = *(float *)(bspline_basis1 + lVar161 + 0xd90);
      fVar263 = *(float *)(bspline_basis1 + lVar161 + 0xd94);
      fVar329 = *(float *)(bspline_basis1 + lVar161 + 0xd98);
      fStack_410 = *(float *)(bspline_basis1 + lVar161 + 0xd9c);
      fStack_40c = *(float *)(bspline_basis1 + lVar161 + 0xda0);
      fStack_408 = *(float *)(bspline_basis1 + lVar161 + 0xda4);
      fStack_404 = *(float *)(bspline_basis1 + lVar161 + 0xda8);
      fVar185 = *(float *)(bspline_basis1 + lVar161 + 0x484);
      fVar187 = *(float *)(bspline_basis1 + lVar161 + 0x488);
      fVar215 = *(float *)(bspline_basis1 + lVar161 + 0x48c);
      fVar301 = *(float *)(bspline_basis1 + lVar161 + 0x490);
      fVar343 = *(float *)(bspline_basis1 + lVar161 + 0x494);
      fVar283 = *(float *)(bspline_basis1 + lVar161 + 0x498);
      fVar282 = *(float *)(bspline_basis1 + lVar161 + 0x49c);
      fVar234 = fVar386 + fVar166 + 0.0;
      fVar253 = *(float *)(bspline_basis1 + lVar161);
      fVar254 = *(float *)(bspline_basis1 + lVar161 + 4);
      fVar256 = *(float *)(bspline_basis1 + lVar161 + 8);
      fVar258 = *(float *)(bspline_basis1 + lVar161 + 0xc);
      fVar260 = *(float *)(bspline_basis1 + lVar161 + 0x10);
      fVar262 = *(float *)(bspline_basis1 + lVar161 + 0x14);
      fVar302 = *(float *)(bspline_basis1 + lVar161 + 0x18);
      auVar270._0_4_ = fVar361 * fVar253 + fVar309 * fVar185 + fVar284 * fVar194 + fVar375 * fVar327
      ;
      auVar270._4_4_ = fVar372 * fVar254 + fVar339 * fVar187 + fVar294 * fVar211 + fVar382 * fVar328
      ;
      auVar270._8_4_ = fVar373 * fVar256 + fVar340 * fVar215 + fVar295 * fVar212 + fVar384 * fVar263
      ;
      auVar270._12_4_ =
           fVar374 * fVar258 + fVar342 * fVar301 + fVar296 * fVar213 + fVar386 * fVar329;
      auVar270._16_4_ =
           fVar361 * fVar260 + fVar309 * fVar343 + fVar298 * fVar194 + fVar375 * fStack_410;
      auVar270._20_4_ =
           fVar372 * fVar262 + fVar339 * fVar283 + fVar299 * fVar211 + fVar382 * fStack_40c;
      auVar270._24_4_ =
           fVar373 * fVar302 + fVar340 * fVar282 + fVar300 * fVar212 + fVar384 * fStack_408;
      auVar270._28_4_ = fVar385 + fVar234;
      local_500._0_4_ =
           fVar341 * fVar253 + fVar401 * fVar185 + fVar284 * fVar217 + fVar327 * fVar235;
      local_500._4_4_ =
           fVar168 * fVar254 + fVar406 * fVar187 + fVar294 * fVar231 + fVar328 * fVar252;
      fStack_4f8 = fVar186 * fVar256 + fVar407 * fVar215 + fVar295 * fVar232 + fVar263 * fVar233;
      fStack_4f4 = fVar188 * fVar258 + fVar408 * fVar301 + fVar296 * fVar338 + fVar329 * fVar255;
      fStack_4f0 = fVar341 * fVar260 + fVar401 * fVar343 + fVar298 * fVar217 + fStack_410 * fVar235;
      fStack_4ec = fVar168 * fVar262 + fVar406 * fVar283 + fVar299 * fVar231 + fStack_40c * fVar252;
      fStack_4e8 = fVar186 * fVar302 + fVar407 * fVar282 + fVar300 * fVar232 + fStack_408 * fVar233;
      fStack_4e4 = fVar234 + fVar386 + fVar166 + 0.0;
      local_680._0_4_ =
           fVar353 * fVar185 + fVar189 * fVar284 + fVar214 * fVar327 + fVar192 * fVar253;
      local_680._4_4_ =
           fVar376 * fVar187 + fVar190 * fVar294 + fVar297 * fVar328 + fVar193 * fVar254;
      fStack_678 = fVar383 * fVar215 + fVar191 * fVar295 + fVar388 * fVar263 + fVar216 * fVar256;
      fStack_674 = fVar385 * fVar301 + auVar222._12_4_ * fVar296 + fVar167 * fVar329 +
                   auVar239._12_4_ * fVar258;
      register0x00001450 =
           fVar353 * fVar343 + fVar189 * fVar298 + fVar214 * fStack_410 + fVar192 * fVar260;
      register0x00001454 =
           fVar376 * fVar283 + fVar190 * fVar299 + fVar297 * fStack_40c + fVar193 * fVar262;
      register0x00001458 =
           fVar383 * fVar282 + fVar191 * fVar300 + fVar388 * fStack_408 + fVar216 * fVar302;
      register0x0000145c = fVar386 + fVar167 + fVar166 + fVar234;
      local_240 = vsubps_avx(auVar270,auVar315);
      auVar292 = vsubps_avx(_local_500,auVar325);
      fVar214 = local_240._0_4_;
      fVar297 = local_240._4_4_;
      auVar49._4_4_ = auVar325._4_4_ * fVar297;
      auVar49._0_4_ = auVar325._0_4_ * fVar214;
      fVar388 = local_240._8_4_;
      auVar49._8_4_ = auVar325._8_4_ * fVar388;
      fVar167 = local_240._12_4_;
      auVar49._12_4_ = auVar325._12_4_ * fVar167;
      fVar257 = local_240._16_4_;
      auVar49._16_4_ = auVar325._16_4_ * fVar257;
      fVar259 = local_240._20_4_;
      auVar49._20_4_ = auVar325._20_4_ * fVar259;
      fVar261 = local_240._24_4_;
      auVar49._24_4_ = auVar325._24_4_ * fVar261;
      auVar49._28_4_ = fVar234;
      fVar166 = auVar292._0_4_;
      fVar234 = auVar292._4_4_;
      auVar50._4_4_ = fVar234 * auVar315._4_4_;
      auVar50._0_4_ = fVar166 * auVar315._0_4_;
      fVar189 = auVar292._8_4_;
      auVar50._8_4_ = fVar189 * auVar315._8_4_;
      fVar190 = auVar292._12_4_;
      auVar50._12_4_ = fVar190 * auVar315._12_4_;
      fVar191 = auVar292._16_4_;
      auVar50._16_4_ = fVar191 * auVar315._16_4_;
      fVar192 = auVar292._20_4_;
      auVar50._20_4_ = fVar192 * auVar315._20_4_;
      fVar193 = auVar292._24_4_;
      auVar50._24_4_ = fVar193 * auVar315._24_4_;
      auVar50._28_4_ = fStack_4e4;
      auVar337 = vsubps_avx(auVar49,auVar50);
      auVar171 = vmaxps_avx(local_7a0,_local_680);
      auVar51._4_4_ = auVar171._4_4_ * auVar171._4_4_ * (fVar297 * fVar297 + fVar234 * fVar234);
      auVar51._0_4_ = auVar171._0_4_ * auVar171._0_4_ * (fVar214 * fVar214 + fVar166 * fVar166);
      auVar51._8_4_ = auVar171._8_4_ * auVar171._8_4_ * (fVar388 * fVar388 + fVar189 * fVar189);
      auVar51._12_4_ = auVar171._12_4_ * auVar171._12_4_ * (fVar167 * fVar167 + fVar190 * fVar190);
      auVar51._16_4_ = auVar171._16_4_ * auVar171._16_4_ * (fVar257 * fVar257 + fVar191 * fVar191);
      auVar51._20_4_ = auVar171._20_4_ * auVar171._20_4_ * (fVar259 * fVar259 + fVar192 * fVar192);
      auVar51._24_4_ = auVar171._24_4_ * auVar171._24_4_ * (fVar261 * fVar261 + fVar193 * fVar193);
      auVar51._28_4_ = auVar270._28_4_ + fStack_4e4;
      auVar52._4_4_ = auVar337._4_4_ * auVar337._4_4_;
      auVar52._0_4_ = auVar337._0_4_ * auVar337._0_4_;
      auVar52._8_4_ = auVar337._8_4_ * auVar337._8_4_;
      auVar52._12_4_ = auVar337._12_4_ * auVar337._12_4_;
      auVar52._16_4_ = auVar337._16_4_ * auVar337._16_4_;
      auVar52._20_4_ = auVar337._20_4_ * auVar337._20_4_;
      auVar52._24_4_ = auVar337._24_4_ * auVar337._24_4_;
      auVar52._28_4_ = auVar337._28_4_;
      auVar171 = vcmpps_avx(auVar52,auVar51,2);
      auVar238._0_4_ = (float)(int)uVar35;
      auVar238._4_12_ = auVar269._4_12_;
      local_3e0._0_16_ = auVar238;
      auVar222 = vshufps_avx(auVar238,auVar238,0);
      auVar246._16_16_ = auVar222;
      auVar246._0_16_ = auVar222;
      auVar337 = vcmpps_avx(_DAT_02020f40,auVar246,1);
      auVar251 = ZEXT3264(auVar337);
      auVar141._8_4_ = auVar237._8_4_;
      auVar141._0_8_ = auVar237._0_8_;
      auVar141._12_4_ = auVar237._12_4_;
      auVar222 = vpermilps_avx(auVar141,0xaa);
      auVar348._16_16_ = auVar222;
      auVar348._0_16_ = auVar222;
      auVar269 = vpermilps_avx(auVar310,0xaa);
      register0x00001550 = auVar269;
      _local_1e0 = auVar269;
      auVar239 = vpermilps_avx(auVar318,0xaa);
      register0x00001590 = auVar239;
      _local_100 = auVar239;
      auVar47 = vpermilps_avx(auVar197,0xaa);
      register0x00001310 = auVar47;
      _local_560 = auVar47;
      auVar41 = auVar337 & auVar171;
      local_760 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      fStack_75c = 0.0;
      fStack_758 = 0.0;
      fStack_754 = 0.0;
      auVar286 = ZEXT416((uint)(auVar286._0_4_ * 4.7683716e-07));
      if ((((((((auVar41 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar41 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar41 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar41 >> 0x7f,0) == '\0') &&
            (auVar41 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar41 >> 0xbf,0) == '\0') &&
          (auVar41 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar41[0x1f])
      {
        auVar394 = ZEXT3264(_local_780);
        auVar381 = ZEXT3264(local_660);
      }
      else {
        local_220 = vandps_avx(auVar171,auVar337);
        fVar192 = auVar222._0_4_;
        fVar193 = auVar222._4_4_;
        fVar216 = auVar222._8_4_;
        fVar353 = auVar222._12_4_;
        fVar376 = auVar269._0_4_;
        fVar383 = auVar269._4_4_;
        fVar385 = auVar269._8_4_;
        fVar387 = auVar269._12_4_;
        fVar390 = auVar239._0_4_;
        fVar397 = auVar239._4_4_;
        fVar398 = auVar239._8_4_;
        fVar399 = auVar239._12_4_;
        fVar234 = auVar47._0_4_;
        fVar189 = auVar47._4_4_;
        fVar190 = auVar47._8_4_;
        fVar191 = auVar47._12_4_;
        fVar214 = auVar337._28_4_ +
                  *(float *)(bspline_basis1 + lVar161 + 0x924) +
                  *(float *)(bspline_basis1 + lVar161 + 0x4a0);
        local_420 = fVar192 * fVar253 + fVar376 * fVar185 + fVar390 * fVar284 + fVar234 * fVar327;
        fStack_41c = fVar193 * fVar254 + fVar383 * fVar187 + fVar397 * fVar294 + fVar189 * fVar328;
        fStack_418 = fVar216 * fVar256 + fVar385 * fVar215 + fVar398 * fVar295 + fVar190 * fVar263;
        fStack_414 = fVar353 * fVar258 + fVar387 * fVar301 + fVar399 * fVar296 + fVar191 * fVar329;
        fStack_410 = fVar192 * fVar260 +
                     fVar376 * fVar343 + fVar390 * fVar298 + fVar234 * fStack_410;
        fStack_40c = fVar193 * fVar262 +
                     fVar383 * fVar283 + fVar397 * fVar299 + fVar189 * fStack_40c;
        fStack_408 = fVar216 * fVar302 +
                     fVar385 * fVar282 + fVar398 * fVar300 + fVar190 * fStack_408;
        fStack_404 = local_220._28_4_ + fVar214;
        local_540._0_4_ = auVar150._0_4_;
        local_540._4_4_ = auVar150._4_4_;
        fStack_538 = auVar150._8_4_;
        fStack_534 = auVar150._12_4_;
        fStack_530 = auVar150._16_4_;
        fStack_52c = auVar150._20_4_;
        fStack_528 = auVar150._24_4_;
        local_6a0._0_4_ = auVar149._0_4_;
        local_6a0._4_4_ = auVar149._4_4_;
        fStack_698 = auVar149._8_4_;
        fStack_694 = auVar149._12_4_;
        fStack_690 = auVar149._16_4_;
        fStack_68c = auVar149._20_4_;
        fStack_688 = auVar149._24_4_;
        local_520 = fVar192 * local_400 +
                    fVar376 * (float)local_540._0_4_ +
                    fVar390 * fVar264 + fVar234 * (float)local_6a0._0_4_;
        fStack_51c = fVar193 * fStack_3fc +
                     fVar383 * (float)local_540._4_4_ +
                     fVar397 * fVar275 + fVar189 * (float)local_6a0._4_4_;
        fStack_518 = fVar216 * fStack_3f8 +
                     fVar385 * fStack_538 + fVar398 * fVar277 + fVar190 * fStack_698;
        fStack_514 = fVar353 * fStack_3f4 +
                     fVar387 * fStack_534 + fVar399 * fVar278 + fVar191 * fStack_694;
        fStack_510 = fVar192 * fStack_3f0 +
                     fVar376 * fStack_530 + fVar390 * fVar279 + fVar234 * fStack_690;
        fStack_50c = fVar193 * fStack_3ec +
                     fVar383 * fStack_52c + fVar397 * fVar280 + fVar189 * fStack_68c;
        fStack_508 = fVar216 * fStack_3e8 +
                     fVar385 * fStack_528 + fVar398 * fVar281 + fVar190 * fStack_688;
        fStack_504 = fStack_404 + fVar214 + local_220._28_4_ + auVar337._28_4_;
        fVar214 = *(float *)(bspline_basis0 + lVar161 + 0x1210);
        fVar297 = *(float *)(bspline_basis0 + lVar161 + 0x1214);
        fVar388 = *(float *)(bspline_basis0 + lVar161 + 0x1218);
        fVar167 = *(float *)(bspline_basis0 + lVar161 + 0x121c);
        fVar257 = *(float *)(bspline_basis0 + lVar161 + 0x1220);
        fVar259 = *(float *)(bspline_basis0 + lVar161 + 0x1224);
        fVar261 = *(float *)(bspline_basis0 + lVar161 + 0x1228);
        fVar264 = *(float *)(bspline_basis0 + lVar161 + 0x1694);
        fVar275 = *(float *)(bspline_basis0 + lVar161 + 0x1698);
        fVar277 = *(float *)(bspline_basis0 + lVar161 + 0x169c);
        fVar278 = *(float *)(bspline_basis0 + lVar161 + 0x16a0);
        fVar279 = *(float *)(bspline_basis0 + lVar161 + 0x16a4);
        fVar280 = *(float *)(bspline_basis0 + lVar161 + 0x16a8);
        fVar281 = *(float *)(bspline_basis0 + lVar161 + 0x16ac);
        fVar284 = *(float *)(bspline_basis0 + lVar161 + 0x1b18);
        fVar294 = *(float *)(bspline_basis0 + lVar161 + 0x1b1c);
        fVar295 = *(float *)(bspline_basis0 + lVar161 + 0x1b20);
        fVar296 = *(float *)(bspline_basis0 + lVar161 + 0x1b24);
        fVar298 = *(float *)(bspline_basis0 + lVar161 + 0x1b28);
        fVar299 = *(float *)(bspline_basis0 + lVar161 + 0x1b2c);
        fVar300 = *(float *)(bspline_basis0 + lVar161 + 0x1b30);
        fVar327 = *(float *)(bspline_basis0 + lVar161 + 0x1f9c);
        fVar328 = *(float *)(bspline_basis0 + lVar161 + 0x1fa0);
        fVar263 = *(float *)(bspline_basis0 + lVar161 + 0x1fa4);
        fVar329 = *(float *)(bspline_basis0 + lVar161 + 0x1fa8);
        fVar166 = *(float *)(bspline_basis0 + lVar161 + 0x1fac);
        fVar185 = *(float *)(bspline_basis0 + lVar161 + 0x1fb0);
        fVar187 = *(float *)(bspline_basis0 + lVar161 + 0x1fb4);
        _local_700 = auVar348;
        _local_720 = auVar286;
        fVar301 = *(float *)(bspline_basis1 + lVar161 + 0x4a0) + 0.0;
        fVar215 = *(float *)(bspline_basis0 + lVar161 + 0x1b34) +
                  *(float *)(bspline_basis0 + lVar161 + 0x1fb8);
        fVar343 = *(float *)(bspline_basis0 + lVar161 + 0x16b0) + fVar215;
        auVar174._0_4_ =
             fVar361 * fVar214 + fVar309 * fVar264 + fVar194 * fVar284 + fVar375 * fVar327;
        auVar174._4_4_ =
             fVar372 * fVar297 + fVar339 * fVar275 + fVar211 * fVar294 + fVar382 * fVar328;
        auVar174._8_4_ =
             fVar373 * fVar388 + fVar340 * fVar277 + fVar212 * fVar295 + fVar384 * fVar263;
        auVar174._12_4_ =
             fVar374 * fVar167 + fVar342 * fVar278 + fVar213 * fVar296 + fVar386 * fVar329;
        auVar174._16_4_ =
             fVar361 * fVar257 + fVar309 * fVar279 + fVar194 * fVar298 + fVar375 * fVar166;
        auVar174._20_4_ =
             fVar372 * fVar259 + fVar339 * fVar280 + fVar211 * fVar299 + fVar382 * fVar185;
        auVar174._24_4_ =
             fVar373 * fVar261 + fVar340 * fVar281 + fVar212 * fVar300 + fVar384 * fVar187;
        auVar174._28_4_ =
             *(float *)(bspline_basis0 + lVar161 + 0x16b0) +
             *(float *)(bspline_basis0 + lVar161 + 0x1fb8) + fVar301;
        auVar201._0_4_ =
             fVar341 * fVar214 + fVar217 * fVar284 + fVar235 * fVar327 + fVar401 * fVar264;
        auVar201._4_4_ =
             fVar168 * fVar297 + fVar231 * fVar294 + fVar252 * fVar328 + fVar406 * fVar275;
        auVar201._8_4_ =
             fVar186 * fVar388 + fVar232 * fVar295 + fVar233 * fVar263 + fVar407 * fVar277;
        auVar201._12_4_ =
             fVar188 * fVar167 + fVar338 * fVar296 + fVar255 * fVar329 + fVar408 * fVar278;
        auVar201._16_4_ =
             fVar341 * fVar257 + fVar217 * fVar298 + fVar235 * fVar166 + fVar401 * fVar279;
        auVar201._20_4_ =
             fVar168 * fVar259 + fVar231 * fVar299 + fVar252 * fVar185 + fVar406 * fVar280;
        auVar201._24_4_ =
             fVar186 * fVar261 + fVar232 * fVar300 + fVar233 * fVar187 + fVar407 * fVar281;
        auVar201._28_4_ = fVar215 + fVar301 + 0.0;
        auVar288._0_4_ =
             fVar376 * fVar264 + fVar390 * fVar284 + fVar234 * fVar327 + fVar192 * fVar214;
        auVar288._4_4_ =
             fVar383 * fVar275 + fVar397 * fVar294 + fVar189 * fVar328 + fVar193 * fVar297;
        auVar288._8_4_ =
             fVar385 * fVar277 + fVar398 * fVar295 + fVar190 * fVar263 + fVar216 * fVar388;
        auVar288._12_4_ =
             fVar387 * fVar278 + fVar399 * fVar296 + fVar191 * fVar329 + fVar353 * fVar167;
        auVar288._16_4_ =
             fVar376 * fVar279 + fVar390 * fVar298 + fVar234 * fVar166 + fVar192 * fVar257;
        auVar288._20_4_ =
             fVar383 * fVar280 + fVar397 * fVar299 + fVar189 * fVar185 + fVar193 * fVar259;
        auVar288._24_4_ =
             fVar385 * fVar281 + fVar398 * fVar300 + fVar190 * fVar187 + fVar216 * fVar261;
        auVar288._28_4_ = fVar343 + *(float *)(bspline_basis0 + lVar161 + 0x122c);
        fVar214 = *(float *)(bspline_basis1 + lVar161 + 0x1b18);
        fVar297 = *(float *)(bspline_basis1 + lVar161 + 0x1b1c);
        fVar388 = *(float *)(bspline_basis1 + lVar161 + 0x1b20);
        fVar167 = *(float *)(bspline_basis1 + lVar161 + 0x1b24);
        fVar257 = *(float *)(bspline_basis1 + lVar161 + 0x1b28);
        fVar259 = *(float *)(bspline_basis1 + lVar161 + 0x1b2c);
        fVar261 = *(float *)(bspline_basis1 + lVar161 + 0x1b30);
        fVar264 = *(float *)(bspline_basis1 + lVar161 + 0x1f9c);
        fVar275 = *(float *)(bspline_basis1 + lVar161 + 0x1fa0);
        fVar277 = *(float *)(bspline_basis1 + lVar161 + 0x1fa4);
        fVar278 = *(float *)(bspline_basis1 + lVar161 + 0x1fa8);
        fVar279 = *(float *)(bspline_basis1 + lVar161 + 0x1fac);
        fVar280 = *(float *)(bspline_basis1 + lVar161 + 0x1fb0);
        fVar281 = *(float *)(bspline_basis1 + lVar161 + 0x1fb4);
        fVar284 = *(float *)(bspline_basis1 + lVar161 + 0x1694);
        fVar294 = *(float *)(bspline_basis1 + lVar161 + 0x1698);
        fVar295 = *(float *)(bspline_basis1 + lVar161 + 0x169c);
        fVar296 = *(float *)(bspline_basis1 + lVar161 + 0x16a0);
        fVar298 = *(float *)(bspline_basis1 + lVar161 + 0x16a4);
        fVar299 = *(float *)(bspline_basis1 + lVar161 + 0x16a8);
        fVar300 = *(float *)(bspline_basis1 + lVar161 + 0x16ac);
        fVar327 = *(float *)(bspline_basis1 + lVar161 + 0x1210);
        fVar328 = *(float *)(bspline_basis1 + lVar161 + 0x1214);
        fVar263 = *(float *)(bspline_basis1 + lVar161 + 0x1218);
        fVar329 = *(float *)(bspline_basis1 + lVar161 + 0x121c);
        fVar166 = *(float *)(bspline_basis1 + lVar161 + 0x1220);
        fVar185 = *(float *)(bspline_basis1 + lVar161 + 0x1224);
        fVar187 = *(float *)(bspline_basis1 + lVar161 + 0x1228);
        auVar305._0_4_ =
             fVar327 * fVar361 + fVar309 * fVar284 + fVar194 * fVar214 + fVar375 * fVar264;
        auVar305._4_4_ =
             fVar328 * fVar372 + fVar339 * fVar294 + fVar211 * fVar297 + fVar382 * fVar275;
        auVar305._8_4_ =
             fVar263 * fVar373 + fVar340 * fVar295 + fVar212 * fVar388 + fVar384 * fVar277;
        auVar305._12_4_ =
             fVar329 * fVar374 + fVar342 * fVar296 + fVar213 * fVar167 + fVar386 * fVar278;
        auVar305._16_4_ =
             fVar166 * fVar361 + fVar309 * fVar298 + fVar194 * fVar257 + fVar375 * fVar279;
        auVar305._20_4_ =
             fVar185 * fVar372 + fVar339 * fVar299 + fVar211 * fVar259 + fVar382 * fVar280;
        auVar305._24_4_ =
             fVar187 * fVar373 + fVar340 * fVar300 + fVar212 * fVar261 + fVar384 * fVar281;
        auVar305._28_4_ = fVar255 + fVar255 + fVar343 + fVar386;
        auVar334._0_4_ =
             fVar341 * fVar327 + fVar401 * fVar284 + fVar217 * fVar214 + fVar235 * fVar264;
        auVar334._4_4_ =
             fVar168 * fVar328 + fVar406 * fVar294 + fVar231 * fVar297 + fVar252 * fVar275;
        auVar334._8_4_ =
             fVar186 * fVar263 + fVar407 * fVar295 + fVar232 * fVar388 + fVar233 * fVar277;
        auVar334._12_4_ =
             fVar188 * fVar329 + fVar408 * fVar296 + fVar338 * fVar167 + fVar255 * fVar278;
        auVar334._16_4_ =
             fVar341 * fVar166 + fVar401 * fVar298 + fVar217 * fVar257 + fVar235 * fVar279;
        auVar334._20_4_ =
             fVar168 * fVar185 + fVar406 * fVar299 + fVar231 * fVar259 + fVar252 * fVar280;
        auVar334._24_4_ =
             fVar186 * fVar187 + fVar407 * fVar300 + fVar232 * fVar261 + fVar233 * fVar281;
        auVar334._28_4_ = fVar255 + fVar255 + fVar255 + fVar343;
        auVar229._0_4_ =
             fVar192 * fVar327 + fVar376 * fVar284 + fVar390 * fVar214 + fVar264 * fVar234;
        auVar229._4_4_ =
             fVar193 * fVar328 + fVar383 * fVar294 + fVar397 * fVar297 + fVar275 * fVar189;
        auVar229._8_4_ =
             fVar216 * fVar263 + fVar385 * fVar295 + fVar398 * fVar388 + fVar277 * fVar190;
        auVar229._12_4_ =
             fVar353 * fVar329 + fVar387 * fVar296 + fVar399 * fVar167 + fVar278 * fVar191;
        auVar229._16_4_ =
             fVar192 * fVar166 + fVar376 * fVar298 + fVar390 * fVar257 + fVar279 * fVar234;
        auVar229._20_4_ =
             fVar193 * fVar185 + fVar383 * fVar299 + fVar397 * fVar259 + fVar280 * fVar189;
        auVar229._24_4_ =
             fVar216 * fVar187 + fVar385 * fVar300 + fVar398 * fVar261 + fVar281 * fVar190;
        auVar229._28_4_ =
             *(float *)(bspline_basis1 + lVar161 + 0x122c) +
             *(float *)(bspline_basis1 + lVar161 + 0x16b0) +
             *(float *)(bspline_basis1 + lVar161 + 0x1b34) +
             *(float *)(bspline_basis1 + lVar161 + 0x1fb8);
        auVar271._8_4_ = 0x7fffffff;
        auVar271._0_8_ = 0x7fffffff7fffffff;
        auVar271._12_4_ = 0x7fffffff;
        auVar271._16_4_ = 0x7fffffff;
        auVar271._20_4_ = 0x7fffffff;
        auVar271._24_4_ = 0x7fffffff;
        auVar271._28_4_ = 0x7fffffff;
        auVar171 = vandps_avx(auVar174,auVar271);
        auVar337 = vandps_avx(auVar201,auVar271);
        auVar337 = vmaxps_avx(auVar171,auVar337);
        auVar171 = vandps_avx(auVar288,auVar271);
        auVar171 = vmaxps_avx(auVar337,auVar171);
        auVar286 = vpermilps_avx(auVar286,0);
        auVar289._16_16_ = auVar286;
        auVar289._0_16_ = auVar286;
        auVar171 = vcmpps_avx(auVar171,auVar289,1);
        auVar41 = vblendvps_avx(auVar174,local_240,auVar171);
        auVar42 = vblendvps_avx(auVar201,auVar292,auVar171);
        auVar171 = vandps_avx(auVar305,auVar271);
        auVar337 = vandps_avx(auVar334,auVar271);
        auVar43 = vmaxps_avx(auVar171,auVar337);
        auVar171 = vandps_avx(auVar229,auVar271);
        auVar171 = vmaxps_avx(auVar43,auVar171);
        auVar43 = vcmpps_avx(auVar171,auVar289,1);
        auVar171 = vblendvps_avx(auVar305,local_240,auVar43);
        auVar292 = vblendvps_avx(auVar334,auVar292,auVar43);
        fVar166 = auVar41._0_4_;
        fVar185 = auVar41._4_4_;
        fVar187 = auVar41._8_4_;
        fVar215 = auVar41._12_4_;
        fVar301 = auVar41._16_4_;
        fVar343 = auVar41._20_4_;
        fVar283 = auVar41._24_4_;
        fVar302 = -auVar41._28_4_;
        fVar282 = auVar171._0_4_;
        fVar253 = auVar171._4_4_;
        fVar254 = auVar171._8_4_;
        fVar256 = auVar171._12_4_;
        fVar258 = auVar171._16_4_;
        fVar260 = auVar171._20_4_;
        fVar262 = auVar171._24_4_;
        fVar235 = auVar42._0_4_;
        fVar233 = auVar42._4_4_;
        fVar257 = auVar42._8_4_;
        fVar275 = auVar42._12_4_;
        fVar280 = auVar42._16_4_;
        fVar295 = auVar42._20_4_;
        fVar300 = auVar42._24_4_;
        auVar175._0_4_ = fVar235 * fVar235 + fVar166 * fVar166;
        auVar175._4_4_ = fVar233 * fVar233 + fVar185 * fVar185;
        auVar175._8_4_ = fVar257 * fVar257 + fVar187 * fVar187;
        auVar175._12_4_ = fVar275 * fVar275 + fVar215 * fVar215;
        auVar175._16_4_ = fVar280 * fVar280 + fVar301 * fVar301;
        auVar175._20_4_ = fVar295 * fVar295 + fVar343 * fVar343;
        auVar175._24_4_ = fVar300 * fVar300 + fVar283 * fVar283;
        auVar175._28_4_ = auVar334._28_4_ + auVar41._28_4_;
        auVar41 = vrsqrtps_avx(auVar175);
        fVar214 = auVar41._0_4_;
        fVar252 = auVar41._4_4_;
        auVar53._4_4_ = fVar252 * 1.5;
        auVar53._0_4_ = fVar214 * 1.5;
        fVar297 = auVar41._8_4_;
        auVar53._8_4_ = fVar297 * 1.5;
        fVar388 = auVar41._12_4_;
        auVar53._12_4_ = fVar388 * 1.5;
        fVar255 = auVar41._16_4_;
        auVar53._16_4_ = fVar255 * 1.5;
        fVar167 = auVar41._20_4_;
        auVar53._20_4_ = fVar167 * 1.5;
        fVar259 = auVar41._24_4_;
        fVar329 = auVar337._28_4_;
        auVar53._24_4_ = fVar259 * 1.5;
        auVar53._28_4_ = fVar329;
        auVar54._4_4_ = fVar252 * fVar252 * fVar252 * auVar175._4_4_ * 0.5;
        auVar54._0_4_ = fVar214 * fVar214 * fVar214 * auVar175._0_4_ * 0.5;
        auVar54._8_4_ = fVar297 * fVar297 * fVar297 * auVar175._8_4_ * 0.5;
        auVar54._12_4_ = fVar388 * fVar388 * fVar388 * auVar175._12_4_ * 0.5;
        auVar54._16_4_ = fVar255 * fVar255 * fVar255 * auVar175._16_4_ * 0.5;
        auVar54._20_4_ = fVar167 * fVar167 * fVar167 * auVar175._20_4_ * 0.5;
        auVar54._24_4_ = fVar259 * fVar259 * fVar259 * auVar175._24_4_ * 0.5;
        auVar54._28_4_ = auVar175._28_4_;
        auVar337 = vsubps_avx(auVar53,auVar54);
        fVar214 = auVar337._0_4_;
        fVar388 = auVar337._4_4_;
        fVar259 = auVar337._8_4_;
        fVar277 = auVar337._12_4_;
        fVar281 = auVar337._16_4_;
        fVar296 = auVar337._20_4_;
        fVar327 = auVar337._24_4_;
        fVar252 = auVar292._0_4_;
        fVar255 = auVar292._4_4_;
        fVar261 = auVar292._8_4_;
        fVar278 = auVar292._12_4_;
        fVar284 = auVar292._16_4_;
        fVar298 = auVar292._20_4_;
        fVar328 = auVar292._24_4_;
        auVar176._0_4_ = fVar252 * fVar252 + fVar282 * fVar282;
        auVar176._4_4_ = fVar255 * fVar255 + fVar253 * fVar253;
        auVar176._8_4_ = fVar261 * fVar261 + fVar254 * fVar254;
        auVar176._12_4_ = fVar278 * fVar278 + fVar256 * fVar256;
        auVar176._16_4_ = fVar284 * fVar284 + fVar258 * fVar258;
        auVar176._20_4_ = fVar298 * fVar298 + fVar260 * fVar260;
        auVar176._24_4_ = fVar328 * fVar328 + fVar262 * fVar262;
        auVar176._28_4_ = auVar171._28_4_ + auVar337._28_4_;
        auVar171 = vrsqrtps_avx(auVar176);
        fVar297 = auVar171._0_4_;
        fVar167 = auVar171._4_4_;
        auVar55._4_4_ = fVar167 * 1.5;
        auVar55._0_4_ = fVar297 * 1.5;
        fVar264 = auVar171._8_4_;
        auVar55._8_4_ = fVar264 * 1.5;
        fVar279 = auVar171._12_4_;
        auVar55._12_4_ = fVar279 * 1.5;
        fVar294 = auVar171._16_4_;
        auVar55._16_4_ = fVar294 * 1.5;
        fVar299 = auVar171._20_4_;
        auVar55._20_4_ = fVar299 * 1.5;
        fVar263 = auVar171._24_4_;
        auVar55._24_4_ = fVar263 * 1.5;
        auVar55._28_4_ = fVar329;
        auVar56._4_4_ = fVar167 * fVar167 * fVar167 * auVar176._4_4_ * 0.5;
        auVar56._0_4_ = fVar297 * fVar297 * fVar297 * auVar176._0_4_ * 0.5;
        auVar56._8_4_ = fVar264 * fVar264 * fVar264 * auVar176._8_4_ * 0.5;
        auVar56._12_4_ = fVar279 * fVar279 * fVar279 * auVar176._12_4_ * 0.5;
        auVar56._16_4_ = fVar294 * fVar294 * fVar294 * auVar176._16_4_ * 0.5;
        auVar56._20_4_ = fVar299 * fVar299 * fVar299 * auVar176._20_4_ * 0.5;
        auVar56._24_4_ = fVar263 * fVar263 * fVar263 * auVar176._24_4_ * 0.5;
        auVar56._28_4_ = auVar176._28_4_;
        auVar171 = vsubps_avx(auVar55,auVar56);
        fVar297 = auVar171._0_4_;
        fVar167 = auVar171._4_4_;
        fVar264 = auVar171._8_4_;
        fVar279 = auVar171._12_4_;
        fVar294 = auVar171._16_4_;
        fVar299 = auVar171._20_4_;
        fVar263 = auVar171._24_4_;
        fVar235 = (float)local_7a0._0_4_ * fVar235 * fVar214;
        fVar233 = local_7a0._4_4_ * fVar233 * fVar388;
        auVar57._4_4_ = fVar233;
        auVar57._0_4_ = fVar235;
        fVar257 = local_7a0._8_4_ * fVar257 * fVar259;
        auVar57._8_4_ = fVar257;
        fVar275 = local_7a0._12_4_ * fVar275 * fVar277;
        auVar57._12_4_ = fVar275;
        fVar280 = local_7a0._16_4_ * fVar280 * fVar281;
        auVar57._16_4_ = fVar280;
        fVar295 = local_7a0._20_4_ * fVar295 * fVar296;
        auVar57._20_4_ = fVar295;
        fVar300 = local_7a0._24_4_ * fVar300 * fVar327;
        auVar57._24_4_ = fVar300;
        auVar57._28_4_ = fVar329;
        local_6a0._4_4_ = fVar233 + auVar315._4_4_;
        local_6a0._0_4_ = fVar235 + auVar315._0_4_;
        fStack_698 = fVar257 + auVar315._8_4_;
        fStack_694 = fVar275 + auVar315._12_4_;
        fStack_690 = fVar280 + auVar315._16_4_;
        fStack_68c = fVar295 + auVar315._20_4_;
        fStack_688 = fVar300 + auVar315._24_4_;
        fStack_684 = fVar329 + auVar315._28_4_;
        fVar235 = (float)local_7a0._0_4_ * fVar214 * -fVar166;
        fVar233 = local_7a0._4_4_ * fVar388 * -fVar185;
        auVar58._4_4_ = fVar233;
        auVar58._0_4_ = fVar235;
        fVar257 = local_7a0._8_4_ * fVar259 * -fVar187;
        auVar58._8_4_ = fVar257;
        fVar275 = local_7a0._12_4_ * fVar277 * -fVar215;
        auVar58._12_4_ = fVar275;
        fVar280 = local_7a0._16_4_ * fVar281 * -fVar301;
        auVar58._16_4_ = fVar280;
        fVar295 = local_7a0._20_4_ * fVar296 * -fVar343;
        auVar58._20_4_ = fVar295;
        fVar300 = local_7a0._24_4_ * fVar327 * -fVar283;
        auVar58._24_4_ = fVar300;
        auVar58._28_4_ = fVar302;
        local_540._4_4_ = auVar325._4_4_ + fVar233;
        local_540._0_4_ = auVar325._0_4_ + fVar235;
        fStack_538 = auVar325._8_4_ + fVar257;
        fStack_534 = auVar325._12_4_ + fVar275;
        fStack_530 = auVar325._16_4_ + fVar280;
        fStack_52c = auVar325._20_4_ + fVar295;
        fStack_528 = auVar325._24_4_ + fVar300;
        fStack_524 = auVar325._28_4_ + fVar302;
        fVar235 = fVar214 * 0.0 * (float)local_7a0._0_4_;
        fVar214 = fVar388 * 0.0 * local_7a0._4_4_;
        auVar59._4_4_ = fVar214;
        auVar59._0_4_ = fVar235;
        fVar233 = fVar259 * 0.0 * local_7a0._8_4_;
        auVar59._8_4_ = fVar233;
        fVar388 = fVar277 * 0.0 * local_7a0._12_4_;
        auVar59._12_4_ = fVar388;
        fVar257 = fVar281 * 0.0 * local_7a0._16_4_;
        auVar59._16_4_ = fVar257;
        fVar259 = fVar296 * 0.0 * local_7a0._20_4_;
        auVar59._20_4_ = fVar259;
        fVar275 = fVar327 * 0.0 * local_7a0._24_4_;
        auVar59._24_4_ = fVar275;
        auVar59._28_4_ = fVar387;
        auVar144._4_4_ = fStack_51c;
        auVar144._0_4_ = local_520;
        auVar144._8_4_ = fStack_518;
        auVar144._12_4_ = fStack_514;
        auVar144._16_4_ = fStack_510;
        auVar144._20_4_ = fStack_50c;
        auVar144._24_4_ = fStack_508;
        auVar144._28_4_ = fStack_504;
        auVar306._0_4_ = local_520 + fVar235;
        auVar306._4_4_ = fStack_51c + fVar214;
        auVar306._8_4_ = fStack_518 + fVar233;
        auVar306._12_4_ = fStack_514 + fVar388;
        auVar306._16_4_ = fStack_510 + fVar257;
        auVar306._20_4_ = fStack_50c + fVar259;
        auVar306._24_4_ = fStack_508 + fVar275;
        auVar306._28_4_ = fStack_504 + fVar387;
        fVar235 = (float)local_680._0_4_ * fVar252 * fVar297;
        fVar214 = (float)local_680._4_4_ * fVar255 * fVar167;
        auVar60._4_4_ = fVar214;
        auVar60._0_4_ = fVar235;
        fVar252 = fStack_678 * fVar261 * fVar264;
        auVar60._8_4_ = fVar252;
        fVar233 = fStack_674 * fVar278 * fVar279;
        auVar60._12_4_ = fVar233;
        fVar388 = register0x00001450 * fVar284 * fVar294;
        auVar60._16_4_ = fVar388;
        fVar255 = register0x00001454 * fVar298 * fVar299;
        auVar60._20_4_ = fVar255;
        fVar257 = register0x00001458 * fVar328 * fVar263;
        auVar60._24_4_ = fVar257;
        auVar60._28_4_ = auVar292._28_4_;
        auVar42 = vsubps_avx(auVar315,auVar57);
        auVar349._0_4_ = auVar270._0_4_ + fVar235;
        auVar349._4_4_ = auVar270._4_4_ + fVar214;
        auVar349._8_4_ = auVar270._8_4_ + fVar252;
        auVar349._12_4_ = auVar270._12_4_ + fVar233;
        auVar349._16_4_ = auVar270._16_4_ + fVar388;
        auVar349._20_4_ = auVar270._20_4_ + fVar255;
        auVar349._24_4_ = auVar270._24_4_ + fVar257;
        auVar349._28_4_ = auVar270._28_4_ + auVar292._28_4_;
        fVar235 = (float)local_680._0_4_ * fVar297 * -fVar282;
        fVar214 = (float)local_680._4_4_ * fVar167 * -fVar253;
        auVar61._4_4_ = fVar214;
        auVar61._0_4_ = fVar235;
        fVar252 = fStack_678 * fVar264 * -fVar254;
        auVar61._8_4_ = fVar252;
        fVar233 = fStack_674 * fVar279 * -fVar256;
        auVar61._12_4_ = fVar233;
        fVar388 = register0x00001450 * fVar294 * -fVar258;
        auVar61._16_4_ = fVar388;
        fVar255 = register0x00001454 * fVar299 * -fVar260;
        auVar61._20_4_ = fVar255;
        fVar257 = register0x00001458 * fVar263 * -fVar262;
        auVar61._24_4_ = fVar257;
        auVar61._28_4_ = fVar399;
        auVar43 = vsubps_avx(auVar325,auVar58);
        auVar359._0_4_ = fVar235 + (float)local_500._0_4_;
        auVar359._4_4_ = fVar214 + (float)local_500._4_4_;
        auVar359._8_4_ = fVar252 + fStack_4f8;
        auVar359._12_4_ = fVar233 + fStack_4f4;
        auVar359._16_4_ = fVar388 + fStack_4f0;
        auVar359._20_4_ = fVar255 + fStack_4ec;
        auVar359._24_4_ = fVar257 + fStack_4e8;
        auVar359._28_4_ = fVar399 + fStack_4e4;
        fVar235 = fVar297 * 0.0 * (float)local_680._0_4_;
        fVar214 = fVar167 * 0.0 * (float)local_680._4_4_;
        auVar62._4_4_ = fVar214;
        auVar62._0_4_ = fVar235;
        fVar252 = fVar264 * 0.0 * fStack_678;
        auVar62._8_4_ = fVar252;
        fVar297 = fVar279 * 0.0 * fStack_674;
        auVar62._12_4_ = fVar297;
        fVar233 = fVar294 * 0.0 * register0x00001450;
        auVar62._16_4_ = fVar233;
        fVar388 = fVar299 * 0.0 * register0x00001454;
        auVar62._20_4_ = fVar388;
        fVar255 = fVar263 * 0.0 * register0x00001458;
        auVar62._24_4_ = fVar255;
        auVar62._28_4_ = fVar302;
        auVar44 = vsubps_avx(auVar144,auVar59);
        auVar147._4_4_ = fStack_41c;
        auVar147._0_4_ = local_420;
        auVar147._8_4_ = fStack_418;
        auVar147._12_4_ = fStack_414;
        auVar147._16_4_ = fStack_410;
        auVar147._20_4_ = fStack_40c;
        auVar147._24_4_ = fStack_408;
        auVar147._28_4_ = fStack_404;
        auVar403._0_4_ = local_420 + fVar235;
        auVar403._4_4_ = fStack_41c + fVar214;
        auVar403._8_4_ = fStack_418 + fVar252;
        auVar403._12_4_ = fStack_414 + fVar297;
        auVar403._16_4_ = fStack_410 + fVar233;
        auVar403._20_4_ = fStack_40c + fVar388;
        auVar403._24_4_ = fStack_408 + fVar255;
        auVar403._28_4_ = fStack_404 + fVar302;
        auVar171 = vsubps_avx(auVar270,auVar60);
        auVar337 = vsubps_avx(_local_500,auVar61);
        auVar292 = vsubps_avx(auVar147,auVar62);
        auVar41 = vsubps_avx(auVar359,auVar43);
        auVar45 = vsubps_avx(auVar403,auVar44);
        auVar63._4_4_ = auVar44._4_4_ * auVar41._4_4_;
        auVar63._0_4_ = auVar44._0_4_ * auVar41._0_4_;
        auVar63._8_4_ = auVar44._8_4_ * auVar41._8_4_;
        auVar63._12_4_ = auVar44._12_4_ * auVar41._12_4_;
        auVar63._16_4_ = auVar44._16_4_ * auVar41._16_4_;
        auVar63._20_4_ = auVar44._20_4_ * auVar41._20_4_;
        auVar63._24_4_ = auVar44._24_4_ * auVar41._24_4_;
        auVar63._28_4_ = fVar399;
        auVar64._4_4_ = auVar43._4_4_ * auVar45._4_4_;
        auVar64._0_4_ = auVar43._0_4_ * auVar45._0_4_;
        auVar64._8_4_ = auVar43._8_4_ * auVar45._8_4_;
        auVar64._12_4_ = auVar43._12_4_ * auVar45._12_4_;
        auVar64._16_4_ = auVar43._16_4_ * auVar45._16_4_;
        auVar64._20_4_ = auVar43._20_4_ * auVar45._20_4_;
        auVar64._24_4_ = auVar43._24_4_ * auVar45._24_4_;
        auVar64._28_4_ = fStack_4e4;
        auVar46 = vsubps_avx(auVar64,auVar63);
        auVar65._4_4_ = auVar42._4_4_ * auVar45._4_4_;
        auVar65._0_4_ = auVar42._0_4_ * auVar45._0_4_;
        auVar65._8_4_ = auVar42._8_4_ * auVar45._8_4_;
        auVar65._12_4_ = auVar42._12_4_ * auVar45._12_4_;
        auVar65._16_4_ = auVar42._16_4_ * auVar45._16_4_;
        auVar65._20_4_ = auVar42._20_4_ * auVar45._20_4_;
        auVar65._24_4_ = auVar42._24_4_ * auVar45._24_4_;
        auVar65._28_4_ = auVar45._28_4_;
        auVar48 = vsubps_avx(auVar349,auVar42);
        auVar66._4_4_ = auVar44._4_4_ * auVar48._4_4_;
        auVar66._0_4_ = auVar44._0_4_ * auVar48._0_4_;
        auVar66._8_4_ = auVar44._8_4_ * auVar48._8_4_;
        auVar66._12_4_ = auVar44._12_4_ * auVar48._12_4_;
        auVar66._16_4_ = auVar44._16_4_ * auVar48._16_4_;
        auVar66._20_4_ = auVar44._20_4_ * auVar48._20_4_;
        auVar66._24_4_ = auVar44._24_4_ * auVar48._24_4_;
        auVar66._28_4_ = auVar270._28_4_;
        auVar40 = vsubps_avx(auVar66,auVar65);
        auVar67._4_4_ = auVar48._4_4_ * auVar43._4_4_;
        auVar67._0_4_ = auVar48._0_4_ * auVar43._0_4_;
        auVar67._8_4_ = auVar48._8_4_ * auVar43._8_4_;
        auVar67._12_4_ = auVar48._12_4_ * auVar43._12_4_;
        auVar67._16_4_ = auVar48._16_4_ * auVar43._16_4_;
        auVar67._20_4_ = auVar48._20_4_ * auVar43._20_4_;
        auVar67._24_4_ = auVar48._24_4_ * auVar43._24_4_;
        auVar67._28_4_ = auVar45._28_4_;
        auVar68._4_4_ = auVar42._4_4_ * auVar41._4_4_;
        auVar68._0_4_ = auVar42._0_4_ * auVar41._0_4_;
        auVar68._8_4_ = auVar42._8_4_ * auVar41._8_4_;
        auVar68._12_4_ = auVar42._12_4_ * auVar41._12_4_;
        auVar68._16_4_ = auVar42._16_4_ * auVar41._16_4_;
        auVar68._20_4_ = auVar42._20_4_ * auVar41._20_4_;
        auVar68._24_4_ = auVar42._24_4_ * auVar41._24_4_;
        auVar68._28_4_ = auVar41._28_4_;
        auVar41 = vsubps_avx(auVar68,auVar67);
        auVar177._0_4_ = auVar46._0_4_ * 0.0 + auVar41._0_4_ + auVar40._0_4_ * 0.0;
        auVar177._4_4_ = auVar46._4_4_ * 0.0 + auVar41._4_4_ + auVar40._4_4_ * 0.0;
        auVar177._8_4_ = auVar46._8_4_ * 0.0 + auVar41._8_4_ + auVar40._8_4_ * 0.0;
        auVar177._12_4_ = auVar46._12_4_ * 0.0 + auVar41._12_4_ + auVar40._12_4_ * 0.0;
        auVar177._16_4_ = auVar46._16_4_ * 0.0 + auVar41._16_4_ + auVar40._16_4_ * 0.0;
        auVar177._20_4_ = auVar46._20_4_ * 0.0 + auVar41._20_4_ + auVar40._20_4_ * 0.0;
        auVar177._24_4_ = auVar46._24_4_ * 0.0 + auVar41._24_4_ + auVar40._24_4_ * 0.0;
        auVar177._28_4_ = auVar41._28_4_ + auVar41._28_4_ + auVar40._28_4_;
        auVar45 = vcmpps_avx(auVar177,ZEXT432(0) << 0x20,2);
        _local_740 = vblendvps_avx(auVar171,_local_6a0,auVar45);
        _local_620 = vblendvps_avx(auVar337,_local_540,auVar45);
        auVar171 = vblendvps_avx(auVar292,auVar306,auVar45);
        auVar337 = vblendvps_avx(auVar42,auVar349,auVar45);
        auVar292 = vblendvps_avx(auVar43,auVar359,auVar45);
        auVar41 = vblendvps_avx(auVar44,auVar403,auVar45);
        auVar42 = vblendvps_avx(auVar349,auVar42,auVar45);
        auVar43 = vblendvps_avx(auVar359,auVar43,auVar45);
        _local_600 = vpackssdw_avx(local_220._0_16_,local_220._16_16_);
        auStack_5f0 = auVar315._16_16_;
        auVar44 = vblendvps_avx(auVar403,auVar44,auVar45);
        auVar42 = vsubps_avx(auVar42,_local_740);
        auVar46 = vsubps_avx(auVar43,_local_620);
        auVar44 = vsubps_avx(auVar44,auVar171);
        auVar48 = vsubps_avx(_local_620,auVar292);
        fVar235 = auVar46._0_4_;
        fVar283 = auVar171._0_4_;
        fVar388 = auVar46._4_4_;
        fVar282 = auVar171._4_4_;
        auVar69._4_4_ = fVar282 * fVar388;
        auVar69._0_4_ = fVar283 * fVar235;
        fVar261 = auVar46._8_4_;
        fVar253 = auVar171._8_4_;
        auVar69._8_4_ = fVar253 * fVar261;
        fVar279 = auVar46._12_4_;
        fVar254 = auVar171._12_4_;
        auVar69._12_4_ = fVar254 * fVar279;
        fVar295 = auVar46._16_4_;
        fVar256 = auVar171._16_4_;
        auVar69._16_4_ = fVar256 * fVar295;
        fVar327 = auVar46._20_4_;
        fVar258 = auVar171._20_4_;
        auVar69._20_4_ = fVar258 * fVar327;
        fVar185 = auVar46._24_4_;
        fVar260 = auVar171._24_4_;
        auVar69._24_4_ = fVar260 * fVar185;
        auVar69._28_4_ = auVar43._28_4_;
        fVar214 = local_620._0_4_;
        fVar231 = auVar44._0_4_;
        fVar255 = local_620._4_4_;
        fVar232 = auVar44._4_4_;
        auVar70._4_4_ = fVar232 * fVar255;
        auVar70._0_4_ = fVar231 * fVar214;
        fVar264 = local_620._8_4_;
        fVar338 = auVar44._8_4_;
        auVar70._8_4_ = fVar338 * fVar264;
        fVar280 = local_620._12_4_;
        fVar234 = auVar44._12_4_;
        auVar70._12_4_ = fVar234 * fVar280;
        fVar296 = local_620._16_4_;
        fVar341 = auVar44._16_4_;
        auVar70._16_4_ = fVar341 * fVar296;
        fVar328 = local_620._20_4_;
        fVar168 = auVar44._20_4_;
        auVar70._20_4_ = fVar168 * fVar328;
        fVar187 = local_620._24_4_;
        fVar186 = auVar44._24_4_;
        auVar70._24_4_ = fVar186 * fVar187;
        auVar70._28_4_ = auVar359._28_4_;
        auVar43 = vsubps_avx(auVar70,auVar69);
        fVar252 = local_740._0_4_;
        fVar167 = local_740._4_4_;
        auVar71._4_4_ = fVar232 * fVar167;
        auVar71._0_4_ = fVar231 * fVar252;
        fVar275 = local_740._8_4_;
        auVar71._8_4_ = fVar338 * fVar275;
        fVar281 = local_740._12_4_;
        auVar71._12_4_ = fVar234 * fVar281;
        fVar298 = local_740._16_4_;
        auVar71._16_4_ = fVar341 * fVar298;
        fVar263 = local_740._20_4_;
        auVar71._20_4_ = fVar168 * fVar263;
        fVar215 = local_740._24_4_;
        auVar71._24_4_ = fVar186 * fVar215;
        auVar71._28_4_ = auVar359._28_4_;
        fVar297 = auVar42._0_4_;
        auVar393._0_4_ = fVar283 * fVar297;
        fVar257 = auVar42._4_4_;
        auVar393._4_4_ = fVar282 * fVar257;
        fVar277 = auVar42._8_4_;
        auVar393._8_4_ = fVar253 * fVar277;
        fVar284 = auVar42._12_4_;
        auVar393._12_4_ = fVar254 * fVar284;
        fVar299 = auVar42._16_4_;
        auVar393._16_4_ = fVar256 * fVar299;
        fVar329 = auVar42._20_4_;
        auVar393._20_4_ = fVar258 * fVar329;
        fVar301 = auVar42._24_4_;
        auVar393._24_4_ = fVar260 * fVar301;
        auVar393._28_4_ = 0;
        auVar40 = vsubps_avx(auVar393,auVar71);
        auVar72._4_4_ = fVar255 * fVar257;
        auVar72._0_4_ = fVar214 * fVar297;
        auVar72._8_4_ = fVar264 * fVar277;
        auVar72._12_4_ = fVar280 * fVar284;
        auVar72._16_4_ = fVar296 * fVar299;
        auVar72._20_4_ = fVar328 * fVar329;
        auVar72._24_4_ = fVar187 * fVar301;
        auVar72._28_4_ = auVar359._28_4_;
        auVar73._4_4_ = fVar167 * fVar388;
        auVar73._0_4_ = fVar252 * fVar235;
        auVar73._8_4_ = fVar275 * fVar261;
        auVar73._12_4_ = fVar281 * fVar279;
        auVar73._16_4_ = fVar298 * fVar295;
        auVar73._20_4_ = fVar263 * fVar327;
        auVar73._24_4_ = fVar215 * fVar185;
        auVar73._28_4_ = auVar403._28_4_;
        auVar172 = vsubps_avx(auVar73,auVar72);
        auVar173 = vsubps_avx(auVar171,auVar41);
        fVar233 = auVar172._28_4_ + auVar40._28_4_;
        auVar202._0_4_ = auVar172._0_4_ + auVar40._0_4_ * 0.0 + auVar43._0_4_ * 0.0;
        auVar202._4_4_ = auVar172._4_4_ + auVar40._4_4_ * 0.0 + auVar43._4_4_ * 0.0;
        auVar202._8_4_ = auVar172._8_4_ + auVar40._8_4_ * 0.0 + auVar43._8_4_ * 0.0;
        auVar202._12_4_ = auVar172._12_4_ + auVar40._12_4_ * 0.0 + auVar43._12_4_ * 0.0;
        auVar202._16_4_ = auVar172._16_4_ + auVar40._16_4_ * 0.0 + auVar43._16_4_ * 0.0;
        auVar202._20_4_ = auVar172._20_4_ + auVar40._20_4_ * 0.0 + auVar43._20_4_ * 0.0;
        auVar202._24_4_ = auVar172._24_4_ + auVar40._24_4_ * 0.0 + auVar43._24_4_ * 0.0;
        auVar202._28_4_ = fVar233 + auVar43._28_4_;
        fVar262 = auVar48._0_4_;
        fVar302 = auVar48._4_4_;
        auVar74._4_4_ = fVar302 * auVar41._4_4_;
        auVar74._0_4_ = fVar262 * auVar41._0_4_;
        fVar194 = auVar48._8_4_;
        auVar74._8_4_ = fVar194 * auVar41._8_4_;
        fVar211 = auVar48._12_4_;
        auVar74._12_4_ = fVar211 * auVar41._12_4_;
        fVar212 = auVar48._16_4_;
        auVar74._16_4_ = fVar212 * auVar41._16_4_;
        fVar213 = auVar48._20_4_;
        auVar74._20_4_ = fVar213 * auVar41._20_4_;
        fVar217 = auVar48._24_4_;
        auVar74._24_4_ = fVar217 * auVar41._24_4_;
        auVar74._28_4_ = fVar233;
        fVar233 = auVar173._0_4_;
        fVar259 = auVar173._4_4_;
        auVar75._4_4_ = auVar292._4_4_ * fVar259;
        auVar75._0_4_ = auVar292._0_4_ * fVar233;
        fVar278 = auVar173._8_4_;
        auVar75._8_4_ = auVar292._8_4_ * fVar278;
        fVar294 = auVar173._12_4_;
        auVar75._12_4_ = auVar292._12_4_ * fVar294;
        fVar300 = auVar173._16_4_;
        auVar75._16_4_ = auVar292._16_4_ * fVar300;
        fVar166 = auVar173._20_4_;
        auVar75._20_4_ = auVar292._20_4_ * fVar166;
        fVar343 = auVar173._24_4_;
        auVar75._24_4_ = auVar292._24_4_ * fVar343;
        auVar75._28_4_ = auVar172._28_4_;
        auVar48 = vsubps_avx(auVar75,auVar74);
        auVar40 = vsubps_avx(_local_740,auVar337);
        fVar188 = auVar40._0_4_;
        fVar189 = auVar40._4_4_;
        auVar76._4_4_ = fVar189 * auVar41._4_4_;
        auVar76._0_4_ = fVar188 * auVar41._0_4_;
        fVar190 = auVar40._8_4_;
        auVar76._8_4_ = fVar190 * auVar41._8_4_;
        fVar191 = auVar40._12_4_;
        auVar76._12_4_ = fVar191 * auVar41._12_4_;
        fVar192 = auVar40._16_4_;
        auVar76._16_4_ = fVar192 * auVar41._16_4_;
        fVar193 = auVar40._20_4_;
        auVar76._20_4_ = fVar193 * auVar41._20_4_;
        fVar216 = auVar40._24_4_;
        auVar76._24_4_ = fVar216 * auVar41._24_4_;
        auVar76._28_4_ = auVar41._28_4_;
        auVar77._4_4_ = auVar337._4_4_ * fVar259;
        auVar77._0_4_ = auVar337._0_4_ * fVar233;
        auVar77._8_4_ = auVar337._8_4_ * fVar278;
        auVar77._12_4_ = auVar337._12_4_ * fVar294;
        auVar77._16_4_ = auVar337._16_4_ * fVar300;
        auVar77._20_4_ = auVar337._20_4_ * fVar166;
        auVar77._24_4_ = auVar337._24_4_ * fVar343;
        auVar77._28_4_ = auVar43._28_4_;
        auVar43 = vsubps_avx(auVar76,auVar77);
        auVar78._4_4_ = auVar292._4_4_ * fVar189;
        auVar78._0_4_ = auVar292._0_4_ * fVar188;
        auVar78._8_4_ = auVar292._8_4_ * fVar190;
        auVar78._12_4_ = auVar292._12_4_ * fVar191;
        auVar78._16_4_ = auVar292._16_4_ * fVar192;
        auVar78._20_4_ = auVar292._20_4_ * fVar193;
        auVar78._24_4_ = auVar292._24_4_ * fVar216;
        auVar78._28_4_ = auVar41._28_4_;
        auVar79._4_4_ = auVar337._4_4_ * fVar302;
        auVar79._0_4_ = auVar337._0_4_ * fVar262;
        auVar79._8_4_ = auVar337._8_4_ * fVar194;
        auVar79._12_4_ = auVar337._12_4_ * fVar211;
        auVar79._16_4_ = auVar337._16_4_ * fVar212;
        auVar79._20_4_ = auVar337._20_4_ * fVar213;
        auVar79._24_4_ = auVar337._24_4_ * fVar217;
        auVar79._28_4_ = auVar337._28_4_;
        auVar337 = vsubps_avx(auVar79,auVar78);
        auVar272._0_4_ = auVar48._0_4_ * 0.0 + auVar337._0_4_ + auVar43._0_4_ * 0.0;
        auVar272._4_4_ = auVar48._4_4_ * 0.0 + auVar337._4_4_ + auVar43._4_4_ * 0.0;
        auVar272._8_4_ = auVar48._8_4_ * 0.0 + auVar337._8_4_ + auVar43._8_4_ * 0.0;
        auVar272._12_4_ = auVar48._12_4_ * 0.0 + auVar337._12_4_ + auVar43._12_4_ * 0.0;
        auVar272._16_4_ = auVar48._16_4_ * 0.0 + auVar337._16_4_ + auVar43._16_4_ * 0.0;
        auVar272._20_4_ = auVar48._20_4_ * 0.0 + auVar337._20_4_ + auVar43._20_4_ * 0.0;
        auVar272._24_4_ = auVar48._24_4_ * 0.0 + auVar337._24_4_ + auVar43._24_4_ * 0.0;
        auVar272._28_4_ = auVar337._28_4_ + auVar337._28_4_ + auVar43._28_4_;
        auVar337 = vmaxps_avx(auVar202,auVar272);
        auVar337 = vcmpps_avx(auVar337,ZEXT832(0) << 0x20,2);
        auVar286 = vpackssdw_avx(auVar337._0_16_,auVar337._16_16_);
        auVar286 = vpand_avx(auVar286,_local_600);
        auVar222 = vpmovsxwd_avx(auVar286);
        auVar269 = vpunpckhwd_avx(auVar286,auVar286);
        auVar247._16_16_ = auVar269;
        auVar247._0_16_ = auVar222;
        if ((((((((auVar247 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar247 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar247 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar247 >> 0x7f,0) == '\0') &&
              (auVar247 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar269 >> 0x3f,0) == '\0') &&
            (auVar247 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar269[0xf]) {
LAB_0122752e:
          auVar251 = ZEXT3264(auVar247);
          auVar210 = ZEXT3264(CONCAT824(uStack_448,
                                        CONCAT816(uStack_450,CONCAT88(uStack_458,local_460))));
          auVar184 = ZEXT3264(local_4c0);
          auVar352 = ZEXT3264(local_4e0);
        }
        else {
          auVar80._4_4_ = fVar259 * fVar388;
          auVar80._0_4_ = fVar233 * fVar235;
          auVar80._8_4_ = fVar278 * fVar261;
          auVar80._12_4_ = fVar294 * fVar279;
          auVar80._16_4_ = fVar300 * fVar295;
          auVar80._20_4_ = fVar166 * fVar327;
          auVar80._24_4_ = fVar343 * fVar185;
          auVar80._28_4_ = auVar269._12_4_;
          auVar367._0_4_ = fVar262 * fVar231;
          auVar367._4_4_ = fVar302 * fVar232;
          auVar367._8_4_ = fVar194 * fVar338;
          auVar367._12_4_ = fVar211 * fVar234;
          auVar367._16_4_ = fVar212 * fVar341;
          auVar367._20_4_ = fVar213 * fVar168;
          auVar367._24_4_ = fVar217 * fVar186;
          auVar367._28_4_ = 0;
          auVar337 = vsubps_avx(auVar367,auVar80);
          auVar81._4_4_ = fVar189 * fVar232;
          auVar81._0_4_ = fVar188 * fVar231;
          auVar81._8_4_ = fVar190 * fVar338;
          auVar81._12_4_ = fVar191 * fVar234;
          auVar81._16_4_ = fVar192 * fVar341;
          auVar81._20_4_ = fVar193 * fVar168;
          auVar81._24_4_ = fVar216 * fVar186;
          auVar81._28_4_ = auVar44._28_4_;
          auVar82._4_4_ = fVar259 * fVar257;
          auVar82._0_4_ = fVar233 * fVar297;
          auVar82._8_4_ = fVar278 * fVar277;
          auVar82._12_4_ = fVar294 * fVar284;
          auVar82._16_4_ = fVar300 * fVar299;
          auVar82._20_4_ = fVar166 * fVar329;
          auVar82._24_4_ = fVar343 * fVar301;
          auVar82._28_4_ = auVar173._28_4_;
          auVar41 = vsubps_avx(auVar82,auVar81);
          auVar83._4_4_ = fVar302 * fVar257;
          auVar83._0_4_ = fVar262 * fVar297;
          auVar83._8_4_ = fVar194 * fVar277;
          auVar83._12_4_ = fVar211 * fVar284;
          auVar83._16_4_ = fVar212 * fVar299;
          auVar83._20_4_ = fVar213 * fVar329;
          auVar83._24_4_ = fVar217 * fVar301;
          auVar83._28_4_ = auVar202._28_4_;
          auVar84._4_4_ = fVar189 * fVar388;
          auVar84._0_4_ = fVar188 * fVar235;
          auVar84._8_4_ = fVar190 * fVar261;
          auVar84._12_4_ = fVar191 * fVar279;
          auVar84._16_4_ = fVar192 * fVar295;
          auVar84._20_4_ = fVar193 * fVar327;
          auVar84._24_4_ = fVar216 * fVar185;
          auVar84._28_4_ = auVar46._28_4_;
          auVar43 = vsubps_avx(auVar84,auVar83);
          auVar316._0_4_ = auVar337._0_4_ * 0.0 + auVar43._0_4_ + auVar41._0_4_ * 0.0;
          auVar316._4_4_ = auVar337._4_4_ * 0.0 + auVar43._4_4_ + auVar41._4_4_ * 0.0;
          auVar316._8_4_ = auVar337._8_4_ * 0.0 + auVar43._8_4_ + auVar41._8_4_ * 0.0;
          auVar316._12_4_ = auVar337._12_4_ * 0.0 + auVar43._12_4_ + auVar41._12_4_ * 0.0;
          auVar316._16_4_ = auVar337._16_4_ * 0.0 + auVar43._16_4_ + auVar41._16_4_ * 0.0;
          auVar316._20_4_ = auVar337._20_4_ * 0.0 + auVar43._20_4_ + auVar41._20_4_ * 0.0;
          auVar316._24_4_ = auVar337._24_4_ * 0.0 + auVar43._24_4_ + auVar41._24_4_ * 0.0;
          auVar316._28_4_ = auVar46._28_4_ + auVar43._28_4_ + auVar202._28_4_;
          auVar292 = vrcpps_avx(auVar316);
          fVar297 = auVar292._0_4_;
          fVar233 = auVar292._4_4_;
          auVar85._4_4_ = auVar316._4_4_ * fVar233;
          auVar85._0_4_ = auVar316._0_4_ * fVar297;
          fVar388 = auVar292._8_4_;
          auVar85._8_4_ = auVar316._8_4_ * fVar388;
          fVar257 = auVar292._12_4_;
          auVar85._12_4_ = auVar316._12_4_ * fVar257;
          fVar259 = auVar292._16_4_;
          auVar85._16_4_ = auVar316._16_4_ * fVar259;
          fVar261 = auVar292._20_4_;
          auVar85._20_4_ = auVar316._20_4_ * fVar261;
          fVar277 = auVar292._24_4_;
          auVar85._24_4_ = auVar316._24_4_ * fVar277;
          auVar85._28_4_ = auVar173._28_4_;
          auVar368._8_4_ = 0x3f800000;
          auVar368._0_8_ = &DAT_3f8000003f800000;
          auVar368._12_4_ = 0x3f800000;
          auVar368._16_4_ = 0x3f800000;
          auVar368._20_4_ = 0x3f800000;
          auVar368._24_4_ = 0x3f800000;
          auVar368._28_4_ = 0x3f800000;
          auVar44 = vsubps_avx(auVar368,auVar85);
          fVar297 = auVar44._0_4_ * fVar297 + fVar297;
          fVar233 = auVar44._4_4_ * fVar233 + fVar233;
          fVar388 = auVar44._8_4_ * fVar388 + fVar388;
          fVar257 = auVar44._12_4_ * fVar257 + fVar257;
          fVar259 = auVar44._16_4_ * fVar259 + fVar259;
          fVar261 = auVar44._20_4_ * fVar261 + fVar261;
          fVar277 = auVar44._24_4_ * fVar277 + fVar277;
          auVar86._4_4_ =
               (auVar337._4_4_ * fVar167 + auVar41._4_4_ * fVar255 + auVar43._4_4_ * fVar282) *
               fVar233;
          auVar86._0_4_ =
               (auVar337._0_4_ * fVar252 + auVar41._0_4_ * fVar214 + auVar43._0_4_ * fVar283) *
               fVar297;
          auVar86._8_4_ =
               (auVar337._8_4_ * fVar275 + auVar41._8_4_ * fVar264 + auVar43._8_4_ * fVar253) *
               fVar388;
          auVar86._12_4_ =
               (auVar337._12_4_ * fVar281 + auVar41._12_4_ * fVar280 + auVar43._12_4_ * fVar254) *
               fVar257;
          auVar86._16_4_ =
               (auVar337._16_4_ * fVar298 + auVar41._16_4_ * fVar296 + auVar43._16_4_ * fVar256) *
               fVar259;
          auVar86._20_4_ =
               (auVar337._20_4_ * fVar263 + auVar41._20_4_ * fVar328 + auVar43._20_4_ * fVar258) *
               fVar261;
          auVar86._24_4_ =
               (auVar337._24_4_ * fVar215 + auVar41._24_4_ * fVar187 + auVar43._24_4_ * fVar260) *
               fVar277;
          auVar86._28_4_ = local_740._28_4_ + auVar42._28_4_ + auVar171._28_4_;
          auVar222 = vpermilps_avx(ZEXT416((uint)local_760),0);
          auVar248._16_16_ = auVar222;
          auVar248._0_16_ = auVar222;
          auVar171 = vcmpps_avx(auVar248,auVar86,2);
          fVar235 = (ray->super_RayK<1>).tfar;
          auVar290._4_4_ = fVar235;
          auVar290._0_4_ = fVar235;
          auVar290._8_4_ = fVar235;
          auVar290._12_4_ = fVar235;
          auVar290._16_4_ = fVar235;
          auVar290._20_4_ = fVar235;
          auVar290._24_4_ = fVar235;
          auVar290._28_4_ = fVar235;
          auVar337 = vcmpps_avx(auVar86,auVar290,2);
          auVar171 = vandps_avx(auVar337,auVar171);
          auVar222 = vpackssdw_avx(auVar171._0_16_,auVar171._16_16_);
          auVar286 = vpand_avx(auVar286,auVar222);
          auVar222 = vpmovsxwd_avx(auVar286);
          auVar269 = vpshufd_avx(auVar286,0xee);
          auVar269 = vpmovsxwd_avx(auVar269);
          auVar247._16_16_ = auVar269;
          auVar247._0_16_ = auVar222;
          if ((((((((auVar247 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar247 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar247 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar247 >> 0x7f,0) == '\0') &&
                (auVar247 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar269 >> 0x3f,0) == '\0') &&
              (auVar247 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar269[0xf]) goto LAB_0122752e;
          auVar171 = vcmpps_avx(ZEXT832(0) << 0x20,auVar316,4);
          auVar222 = vpackssdw_avx(auVar171._0_16_,auVar171._16_16_);
          auVar286 = vpand_avx(auVar286,auVar222);
          auVar222 = vpmovsxwd_avx(auVar286);
          auVar286 = vpunpckhwd_avx(auVar286,auVar286);
          auVar251 = ZEXT1664(auVar286);
          auVar307._16_16_ = auVar286;
          auVar307._0_16_ = auVar222;
          auVar210 = ZEXT3264(CONCAT824(uStack_448,
                                        CONCAT816(uStack_450,CONCAT88(uStack_458,local_460))));
          auVar184 = ZEXT3264(local_4c0);
          auVar352 = ZEXT3264(local_4e0);
          if ((((((((auVar307 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar307 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar307 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar307 >> 0x7f,0) != '\0') ||
                (auVar307 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar286 >> 0x3f,0) != '\0') ||
              (auVar307 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar286[0xf] < '\0') {
            auVar249._0_4_ = auVar202._0_4_ * fVar297;
            auVar249._4_4_ = auVar202._4_4_ * fVar233;
            auVar249._8_4_ = auVar202._8_4_ * fVar388;
            auVar249._12_4_ = auVar202._12_4_ * fVar257;
            auVar249._16_4_ = auVar202._16_4_ * fVar259;
            auVar249._20_4_ = auVar202._20_4_ * fVar261;
            auVar249._24_4_ = auVar202._24_4_ * fVar277;
            auVar249._28_4_ = 0;
            auVar87._4_4_ = auVar272._4_4_ * fVar233;
            auVar87._0_4_ = auVar272._0_4_ * fVar297;
            auVar87._8_4_ = auVar272._8_4_ * fVar388;
            auVar87._12_4_ = auVar272._12_4_ * fVar257;
            auVar87._16_4_ = auVar272._16_4_ * fVar259;
            auVar87._20_4_ = auVar272._20_4_ * fVar261;
            auVar87._24_4_ = auVar272._24_4_ * fVar277;
            auVar87._28_4_ = auVar44._28_4_ + auVar292._28_4_;
            auVar291._8_4_ = 0x3f800000;
            auVar291._0_8_ = &DAT_3f8000003f800000;
            auVar291._12_4_ = 0x3f800000;
            auVar291._16_4_ = 0x3f800000;
            auVar291._20_4_ = 0x3f800000;
            auVar291._24_4_ = 0x3f800000;
            auVar291._28_4_ = 0x3f800000;
            auVar171 = vsubps_avx(auVar291,auVar249);
            auVar171 = vblendvps_avx(auVar171,auVar249,auVar45);
            auVar184 = ZEXT3264(auVar171);
            auVar171 = vsubps_avx(auVar291,auVar87);
            auVar251 = ZEXT3264(auVar171);
            _local_260 = vblendvps_avx(auVar171,auVar87,auVar45);
            auVar210 = ZEXT3264(auVar307);
            auVar352 = ZEXT3264(auVar86);
          }
        }
        auVar394 = ZEXT3264(_local_780);
        auVar381 = ZEXT3264(local_660);
        auVar395 = ZEXT3264(auVar348);
        auVar337 = auVar352._0_32_;
        auVar171 = auVar184._0_32_;
        auVar292 = auVar210._0_32_;
        if ((((((((auVar292 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar292 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar292 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar292 >> 0x7f,0) != '\0') ||
              (auVar210 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
             SUB321(auVar292 >> 0xbf,0) != '\0') ||
            (auVar210 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
            auVar210[0x1f] < '\0') {
          auVar41 = vsubps_avx(_local_680,local_7a0);
          fVar214 = (float)local_7a0._0_4_ + auVar41._0_4_ * auVar184._0_4_;
          fVar252 = local_7a0._4_4_ + auVar41._4_4_ * auVar184._4_4_;
          fVar297 = local_7a0._8_4_ + auVar41._8_4_ * auVar184._8_4_;
          fVar233 = local_7a0._12_4_ + auVar41._12_4_ * auVar184._12_4_;
          fVar388 = local_7a0._16_4_ + auVar41._16_4_ * auVar184._16_4_;
          fVar255 = local_7a0._20_4_ + auVar41._20_4_ * auVar184._20_4_;
          fVar167 = local_7a0._24_4_ + auVar41._24_4_ * auVar184._24_4_;
          fVar257 = auVar41._28_4_ + 0.0;
          fVar235 = local_7d8->depth_scale;
          auVar88._4_4_ = (fVar252 + fVar252) * fVar235;
          auVar88._0_4_ = (fVar214 + fVar214) * fVar235;
          auVar88._8_4_ = (fVar297 + fVar297) * fVar235;
          auVar88._12_4_ = (fVar233 + fVar233) * fVar235;
          auVar88._16_4_ = (fVar388 + fVar388) * fVar235;
          auVar88._20_4_ = (fVar255 + fVar255) * fVar235;
          auVar88._24_4_ = (fVar167 + fVar167) * fVar235;
          auVar88._28_4_ = fVar257 + fVar257;
          auVar41 = vcmpps_avx(auVar337,auVar88,6);
          auVar42 = auVar292 & auVar41;
          if ((((((((auVar42 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar42 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar42 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar42 >> 0x7f,0) != '\0') ||
                (auVar42 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar42 >> 0xbf,0) != '\0') ||
              (auVar42 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar42[0x1f] < '\0') {
            auVar292 = vandps_avx(auVar41,auVar292);
            local_260._0_4_ = (float)local_260._0_4_ + (float)local_260._0_4_ + -1.0;
            local_260._4_4_ = (float)local_260._4_4_ + (float)local_260._4_4_ + -1.0;
            uStack_258._0_4_ = (float)uStack_258 + (float)uStack_258 + -1.0;
            uStack_258._4_4_ = uStack_258._4_4_ + uStack_258._4_4_ + -1.0;
            uStack_250._0_4_ = (float)uStack_250 + (float)uStack_250 + -1.0;
            uStack_250._4_4_ = uStack_250._4_4_ + uStack_250._4_4_ + -1.0;
            uStack_248._0_4_ = (float)uStack_248 + (float)uStack_248 + -1.0;
            uStack_248._4_4_ = uStack_248._4_4_ + uStack_248._4_4_ + -1.0;
            local_3a0 = auVar171;
            auVar154 = _local_260;
            auVar41 = _local_260;
            local_380 = (float)local_260._0_4_;
            fStack_37c = (float)local_260._4_4_;
            fStack_378 = (float)uStack_258;
            fStack_374 = uStack_258._4_4_;
            fStack_370 = (float)uStack_250;
            fStack_36c = uStack_250._4_4_;
            fStack_368 = (float)uStack_248;
            fStack_364 = uStack_248._4_4_;
            local_360 = auVar337;
            local_340 = 0;
            local_33c = uVar35;
            uStack_7e8 = auVar267._8_8_;
            local_330 = auVar267._0_8_;
            uStack_328 = uStack_7e8;
            uStack_588 = auVar362._8_8_;
            local_320 = auVar362._0_8_;
            uStack_318 = uStack_588;
            uStack_598 = auVar402._8_8_;
            local_310 = auVar402._0_8_;
            uStack_308 = uStack_598;
            uStack_5a8 = auVar391._8_8_;
            local_300._8_8_ = uStack_5a8;
            local_300._0_8_ = auVar391._0_8_;
            local_2e0 = auVar292;
            _local_260 = auVar41;
            if ((pGVar36->mask & (ray->super_RayK<1>).mask) != 0) {
              local_4a0 = auVar292;
              auVar219._0_4_ = 1.0 / auVar238._0_4_;
              auVar219._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar286 = vshufps_avx(auVar219,auVar219,0);
              local_2c0[0] = auVar286._0_4_ * (auVar184._0_4_ + 0.0);
              local_2c0[1] = auVar286._4_4_ * (auVar184._4_4_ + 1.0);
              local_2c0[2] = auVar286._8_4_ * (auVar184._8_4_ + 2.0);
              local_2c0[3] = auVar286._12_4_ * (auVar184._12_4_ + 3.0);
              fStack_2b0 = auVar286._0_4_ * (auVar184._16_4_ + 4.0);
              fStack_2ac = auVar286._4_4_ * (auVar184._20_4_ + 5.0);
              fStack_2a8 = auVar286._8_4_ * (auVar184._24_4_ + 6.0);
              fStack_2a4 = auVar184._28_4_ + 7.0;
              uStack_250 = auVar154._16_8_;
              uStack_248 = auVar41._24_8_;
              local_2a0 = local_260;
              uStack_298 = uStack_258;
              uStack_290 = uStack_250;
              uStack_288 = uStack_248;
              local_280 = auVar337;
              auVar203._8_4_ = 0x7f800000;
              auVar203._0_8_ = 0x7f8000007f800000;
              auVar203._12_4_ = 0x7f800000;
              auVar203._16_4_ = 0x7f800000;
              auVar203._20_4_ = 0x7f800000;
              auVar203._24_4_ = 0x7f800000;
              auVar203._28_4_ = 0x7f800000;
              auVar41 = vblendvps_avx(auVar203,auVar337,auVar292);
              auVar42 = vshufps_avx(auVar41,auVar41,0xb1);
              auVar42 = vminps_avx(auVar41,auVar42);
              auVar43 = vshufpd_avx(auVar42,auVar42,5);
              auVar42 = vminps_avx(auVar42,auVar43);
              auVar43 = vperm2f128_avx(auVar42,auVar42,1);
              auVar42 = vminps_avx(auVar42,auVar43);
              auVar41 = vcmpps_avx(auVar41,auVar42,0);
              auVar42 = auVar292 & auVar41;
              if ((((((((auVar42 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar42 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar42 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar42 >> 0x7f,0) != '\0') ||
                    (auVar42 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar42 >> 0xbf,0) != '\0') ||
                  (auVar42 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar42[0x1f] < '\0') {
                auVar292 = vandps_avx(auVar41,auVar292);
              }
              uVar156 = vmovmskps_avx(auVar292);
              uVar39 = 0;
              if (uVar156 != 0) {
                for (; (uVar156 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                }
              }
              uVar158 = (ulong)uVar39;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar36->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar235 = local_2c0[uVar158];
                fVar214 = *(float *)((long)&local_2a0 + uVar158 * 4);
                fVar297 = 1.0 - fVar235;
                fVar252 = fVar235 * fVar297 * 4.0;
                auVar286 = ZEXT416((uint)(fVar235 * fVar235 * 0.5));
                auVar286 = vshufps_avx(auVar286,auVar286,0);
                auVar222 = ZEXT416((uint)((fVar297 * fVar297 + fVar252) * 0.5));
                auVar222 = vshufps_avx(auVar222,auVar222,0);
                auVar269 = ZEXT416((uint)((-fVar235 * fVar235 - fVar252) * 0.5));
                auVar269 = vshufps_avx(auVar269,auVar269,0);
                auVar239 = ZEXT416((uint)(fVar297 * -fVar297 * 0.5));
                auVar239 = vshufps_avx(auVar239,auVar239,0);
                auVar220._0_4_ =
                     auVar239._0_4_ * fVar265 +
                     auVar269._0_4_ * fVar360 + auVar286._0_4_ * fVar389 + auVar222._0_4_ * fVar400;
                auVar220._4_4_ =
                     auVar239._4_4_ * fVar276 +
                     auVar269._4_4_ * fVar371 + auVar286._4_4_ * fVar396 + auVar222._4_4_ * fVar405;
                auVar220._8_4_ =
                     auVar239._8_4_ * auVar267._8_4_ +
                     auVar269._8_4_ * auVar362._8_4_ +
                     auVar286._8_4_ * auVar391._8_4_ + auVar222._8_4_ * auVar402._8_4_;
                auVar220._12_4_ =
                     auVar239._12_4_ * auVar267._12_4_ +
                     auVar269._12_4_ * auVar362._12_4_ +
                     auVar286._12_4_ * auVar391._12_4_ + auVar222._12_4_ * auVar402._12_4_;
                auVar251 = ZEXT464((uint)*(float *)(local_280 + uVar158 * 4));
                (ray->super_RayK<1>).tfar = *(float *)(local_280 + uVar158 * 4);
                uVar13 = vmovlps_avx(auVar220);
                *(undefined8 *)&(ray->Ng).field_0 = uVar13;
                fVar252 = (float)vextractps_avx(auVar220,2);
                (ray->Ng).field_0.field_0.z = fVar252;
                ray->u = fVar235;
                ray->v = fVar214;
                ray->primID = uVar157;
                ray->geomID = uVar159;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
              }
              else {
                uStack_5f8 = uStack_588;
                local_600 = (undefined1  [8])auVar362._0_8_;
                uStack_738 = uStack_598;
                local_740 = (undefined1  [8])auVar402._0_8_;
                uStack_618 = uStack_5a8;
                local_620 = (undefined1  [8])auVar391._0_8_;
                local_4c0 = auVar171;
                local_4e0 = auVar337;
                _local_5b0 = auVar15;
                _local_5a0 = auVar16;
                _local_590 = auVar17;
                do {
                  local_6c4 = local_2c0[uVar158];
                  local_6c0 = *(undefined4 *)((long)&local_2a0 + uVar158 * 4);
                  local_680._0_4_ = (ray->super_RayK<1>).tfar;
                  (ray->super_RayK<1>).tfar = *(float *)(local_280 + uVar158 * 4);
                  local_7d0.context = context->user;
                  fVar214 = 1.0 - local_6c4;
                  fVar235 = local_6c4 * fVar214 * 4.0;
                  auVar286 = ZEXT416((uint)(local_6c4 * local_6c4 * 0.5));
                  auVar286 = vshufps_avx(auVar286,auVar286,0);
                  auVar222 = ZEXT416((uint)((fVar214 * fVar214 + fVar235) * 0.5));
                  auVar222 = vshufps_avx(auVar222,auVar222,0);
                  auVar269 = ZEXT416((uint)((-local_6c4 * local_6c4 - fVar235) * 0.5));
                  auVar269 = vshufps_avx(auVar269,auVar269,0);
                  auVar239 = ZEXT416((uint)(fVar214 * -fVar214 * 0.5));
                  auVar239 = vshufps_avx(auVar239,auVar239,0);
                  auVar241._0_4_ = auVar239._0_4_ * (float)local_7f0._0_4_;
                  auVar241._4_4_ = auVar239._4_4_ * (float)local_7f0._4_4_;
                  auVar241._8_4_ = auVar239._8_4_ * (float)uStack_7e8;
                  auVar241._12_4_ = auVar239._12_4_ * uStack_7e8._4_4_;
                  auVar251 = ZEXT1664(auVar241);
                  auVar225._0_4_ =
                       auVar241._0_4_ +
                       auVar269._0_4_ * (float)local_600._0_4_ +
                       auVar286._0_4_ * (float)local_620._0_4_ +
                       auVar222._0_4_ * (float)local_740._0_4_;
                  auVar225._4_4_ =
                       auVar241._4_4_ +
                       auVar269._4_4_ * (float)local_600._4_4_ +
                       auVar286._4_4_ * (float)local_620._4_4_ +
                       auVar222._4_4_ * (float)local_740._4_4_;
                  auVar225._8_4_ =
                       auVar241._8_4_ +
                       auVar269._8_4_ * (float)uStack_5f8 +
                       auVar286._8_4_ * (float)uStack_618 + auVar222._8_4_ * (float)uStack_738;
                  auVar225._12_4_ =
                       auVar241._12_4_ +
                       auVar269._12_4_ * uStack_5f8._4_4_ +
                       auVar286._12_4_ * uStack_618._4_4_ + auVar222._12_4_ * uStack_738._4_4_;
                  local_6d0 = vmovlps_avx(auVar225);
                  local_6c8 = vextractps_avx(auVar225,2);
                  local_6bc = (int)local_7f8;
                  local_6b8 = (int)local_800;
                  local_6b4 = (local_7d0.context)->instID[0];
                  local_6b0 = (local_7d0.context)->instPrimID[0];
                  local_804 = -1;
                  local_7d0.valid = &local_804;
                  local_7d0.geometryUserPtr = pGVar36->userPtr;
                  local_7d0.ray = (RTCRayN *)ray;
                  local_7d0.hit = (RTCHitN *)&local_6d0;
                  local_7d0.N = 1;
                  local_7a0._0_8_ = uVar158;
                  if (pGVar36->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_012277a2:
                    p_Var38 = context->args->filter;
                    if (p_Var38 != (RTCFilterFunctionN)0x0) {
                      if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                         (((pGVar36->field_8).field_0x2 & 0x40) != 0)) {
                        auVar251 = ZEXT1664(auVar251._0_16_);
                        (*p_Var38)(&local_7d0);
                        auVar395 = ZEXT3264(_local_700);
                        auVar381 = ZEXT3264(local_660);
                        auVar394 = ZEXT3264(_local_780);
                        auVar352 = ZEXT3264(local_4e0);
                        auVar184 = ZEXT3264(local_4c0);
                        uVar158 = local_7a0._0_8_;
                      }
                      if (*local_7d0.valid == 0) goto LAB_01227874;
                    }
                    (((Vec3f *)((long)local_7d0.ray + 0x30))->field_0).components[0] =
                         *(float *)local_7d0.hit;
                    (((Vec3f *)((long)local_7d0.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_7d0.hit + 4);
                    (((Vec3f *)((long)local_7d0.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_7d0.hit + 8);
                    *(float *)((long)local_7d0.ray + 0x3c) = *(float *)(local_7d0.hit + 0xc);
                    *(float *)((long)local_7d0.ray + 0x40) = *(float *)(local_7d0.hit + 0x10);
                    *(float *)((long)local_7d0.ray + 0x44) = *(float *)(local_7d0.hit + 0x14);
                    *(float *)((long)local_7d0.ray + 0x48) = *(float *)(local_7d0.hit + 0x18);
                    *(float *)((long)local_7d0.ray + 0x4c) = *(float *)(local_7d0.hit + 0x1c);
                    *(float *)((long)local_7d0.ray + 0x50) = *(float *)(local_7d0.hit + 0x20);
                  }
                  else {
                    auVar251 = ZEXT1664(auVar241);
                    (*pGVar36->intersectionFilterN)(&local_7d0);
                    auVar395 = ZEXT3264(_local_700);
                    auVar381 = ZEXT3264(local_660);
                    auVar394 = ZEXT3264(_local_780);
                    auVar352 = ZEXT3264(local_4e0);
                    auVar184 = ZEXT3264(local_4c0);
                    uVar158 = local_7a0._0_8_;
                    if (*local_7d0.valid != 0) goto LAB_012277a2;
LAB_01227874:
                    (ray->super_RayK<1>).tfar = (float)local_680._0_4_;
                  }
                  auVar348 = auVar395._0_32_;
                  *(undefined4 *)(local_4a0 + uVar158 * 4) = 0;
                  auVar41 = local_4a0;
                  fVar235 = (ray->super_RayK<1>).tfar;
                  auVar183._4_4_ = fVar235;
                  auVar183._0_4_ = fVar235;
                  auVar183._8_4_ = fVar235;
                  auVar183._12_4_ = fVar235;
                  auVar183._16_4_ = fVar235;
                  auVar183._20_4_ = fVar235;
                  auVar183._24_4_ = fVar235;
                  auVar183._28_4_ = fVar235;
                  auVar337 = auVar352._0_32_;
                  auVar292 = vcmpps_avx(auVar337,auVar183,2);
                  auVar171 = vandps_avx(auVar292,local_4a0);
                  local_4a0 = auVar171;
                  auVar41 = auVar41 & auVar292;
                  bVar138 = (auVar41 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar139 = (auVar41 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar137 = (auVar41 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar136 = SUB321(auVar41 >> 0x7f,0) != '\0';
                  bVar135 = (auVar41 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar134 = SUB321(auVar41 >> 0xbf,0) != '\0';
                  bVar133 = (auVar41 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar132 = auVar41[0x1f] < '\0';
                  if (((((((bVar138 || bVar139) || bVar137) || bVar136) || bVar135) || bVar134) ||
                      bVar133) || bVar132) {
                    auVar209._8_4_ = 0x7f800000;
                    auVar209._0_8_ = 0x7f8000007f800000;
                    auVar209._12_4_ = 0x7f800000;
                    auVar209._16_4_ = 0x7f800000;
                    auVar209._20_4_ = 0x7f800000;
                    auVar209._24_4_ = 0x7f800000;
                    auVar209._28_4_ = 0x7f800000;
                    auVar292 = vblendvps_avx(auVar209,auVar337,auVar171);
                    auVar41 = vshufps_avx(auVar292,auVar292,0xb1);
                    auVar41 = vminps_avx(auVar292,auVar41);
                    auVar42 = vshufpd_avx(auVar41,auVar41,5);
                    auVar41 = vminps_avx(auVar41,auVar42);
                    auVar42 = vperm2f128_avx(auVar41,auVar41,1);
                    auVar251 = ZEXT3264(auVar42);
                    auVar41 = vminps_avx(auVar41,auVar42);
                    auVar292 = vcmpps_avx(auVar292,auVar41,0);
                    auVar41 = auVar171 & auVar292;
                    if ((((((((auVar41 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar41 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar41 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar41 >> 0x7f,0) != '\0') ||
                          (auVar41 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar41 >> 0xbf,0) != '\0') ||
                        (auVar41 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar41[0x1f] < '\0') {
                      auVar171 = vandps_avx(auVar292,auVar171);
                    }
                    uVar157 = vmovmskps_avx(auVar171);
                    uVar159 = 0;
                    if (uVar157 != 0) {
                      for (; (uVar157 >> uVar159 & 1) == 0; uVar159 = uVar159 + 1) {
                      }
                    }
                    uVar158 = (ulong)uVar159;
                  }
                  auVar171 = auVar184._0_32_;
                  auVar15 = _local_5b0;
                  auVar16 = _local_5a0;
                  auVar17 = _local_590;
                } while (((((((bVar138 || bVar139) || bVar137) || bVar136) || bVar135) || bVar134)
                         || bVar133) || bVar132);
              }
            }
          }
        }
        _local_590 = auVar17;
        _local_5a0 = auVar16;
        _local_5b0 = auVar15;
        local_4e0 = auVar337;
        local_4c0 = auVar171;
        auVar286 = _local_720;
      }
      auVar210 = ZEXT1664(auVar286);
      if (8 < (int)uVar35) {
        _local_700 = auVar348;
        auVar222 = vpshufd_avx(ZEXT416(uVar35),0);
        local_420 = auVar222._0_4_;
        fStack_41c = auVar222._4_4_;
        fStack_418 = auVar222._8_4_;
        fStack_414 = auVar222._12_4_;
        auVar286 = vshufps_avx(auVar286,auVar286,0);
        local_240._16_16_ = auVar286;
        local_240._0_16_ = auVar286;
        auVar142._4_4_ = fStack_75c;
        auVar142._0_4_ = local_760;
        auVar142._8_4_ = fStack_758;
        auVar142._12_4_ = fStack_754;
        auVar286 = vpermilps_avx(auVar142,0);
        local_140._16_16_ = auVar286;
        local_140._0_16_ = auVar286;
        auVar170._0_4_ = 1.0 / (float)local_3e0._0_4_;
        auVar170._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar286 = vshufps_avx(auVar170,auVar170,0);
        register0x00001210 = auVar286;
        _local_160 = auVar286;
        auVar184 = ZEXT3264(_local_160);
        lVar160 = 8;
        auVar352 = ZEXT3264(_local_5e0);
        fVar235 = (float)local_580._0_4_;
        fVar214 = (float)local_580._4_4_;
        fVar252 = fStack_578;
        fVar297 = fStack_574;
        fVar233 = fStack_570;
        fVar388 = fStack_56c;
        fVar255 = fStack_568;
        do {
          pauVar9 = (undefined1 (*) [28])(bspline_basis0 + lVar160 * 4 + lVar161);
          fVar167 = *(float *)*pauVar9;
          fVar257 = *(float *)(*pauVar9 + 4);
          fVar259 = *(float *)(*pauVar9 + 8);
          fVar261 = *(float *)(*pauVar9 + 0xc);
          fVar264 = *(float *)(*pauVar9 + 0x10);
          fVar275 = *(float *)(*pauVar9 + 0x14);
          fVar277 = *(float *)(*pauVar9 + 0x18);
          auVar151 = *pauVar9;
          pauVar10 = (undefined1 (*) [28])(lVar161 + 0x222bfac + lVar160 * 4);
          fVar278 = *(float *)*pauVar10;
          fVar279 = *(float *)(*pauVar10 + 4);
          fVar280 = *(float *)(*pauVar10 + 8);
          fVar281 = *(float *)(*pauVar10 + 0xc);
          fVar284 = *(float *)(*pauVar10 + 0x10);
          fVar294 = *(float *)(*pauVar10 + 0x14);
          fVar295 = *(float *)(*pauVar10 + 0x18);
          auVar150 = *pauVar10;
          pauVar10 = (undefined1 (*) [28])(lVar161 + 0x222c430 + lVar160 * 4);
          fVar296 = *(float *)*pauVar10;
          fVar298 = *(float *)(*pauVar10 + 4);
          fVar299 = *(float *)(*pauVar10 + 8);
          fVar300 = *(float *)(*pauVar10 + 0xc);
          fVar327 = *(float *)(*pauVar10 + 0x10);
          fVar328 = *(float *)(*pauVar10 + 0x14);
          fVar263 = *(float *)(*pauVar10 + 0x18);
          auVar149 = *pauVar10;
          pfVar1 = (float *)(lVar161 + 0x222c8b4 + lVar160 * 4);
          fVar329 = *pfVar1;
          fVar166 = pfVar1[1];
          fVar185 = pfVar1[2];
          fVar187 = pfVar1[3];
          fVar215 = pfVar1[4];
          fVar301 = pfVar1[5];
          fVar343 = pfVar1[6];
          fVar194 = auVar394._0_4_;
          fVar211 = auVar394._4_4_;
          fVar212 = auVar394._8_4_;
          fVar213 = auVar394._12_4_;
          fVar217 = auVar394._16_4_;
          fVar231 = auVar394._20_4_;
          fVar232 = auVar394._24_4_;
          fVar283 = auVar251._28_4_;
          fStack_744 = fVar283 + fVar283 + auVar184._28_4_;
          fVar253 = auVar381._0_4_;
          fVar254 = auVar381._4_4_;
          fVar256 = auVar381._8_4_;
          fVar258 = auVar381._12_4_;
          fVar260 = auVar381._16_4_;
          fVar262 = auVar381._20_4_;
          fVar302 = auVar381._24_4_;
          fVar282 = fVar283 + fVar283 + pfVar1[7];
          local_720._0_4_ =
               (float)local_200._0_4_ * fVar167 +
               fVar235 * fVar278 + auVar352._0_4_ * fVar296 + (float)local_3c0._0_4_ * fVar329;
          local_720._4_4_ =
               (float)local_200._4_4_ * fVar257 +
               fVar214 * fVar279 + auVar352._4_4_ * fVar298 + (float)local_3c0._4_4_ * fVar166;
          fStack_718 = fStack_1f8 * fVar259 +
                       fVar252 * fVar280 + auVar352._8_4_ * fVar299 + fStack_3b8 * fVar185;
          fStack_714 = fStack_1f4 * fVar261 +
                       fVar297 * fVar281 + auVar352._12_4_ * fVar300 + fStack_3b4 * fVar187;
          register0x00001450 =
               fStack_1f0 * fVar264 +
               fVar233 * fVar284 + auVar352._16_4_ * fVar327 + fStack_3b0 * fVar215;
          register0x00001454 =
               fStack_1ec * fVar275 +
               fVar388 * fVar294 + auVar352._20_4_ * fVar328 + fStack_3ac * fVar301;
          register0x00001458 =
               fStack_1e8 * fVar277 +
               fVar255 * fVar295 + auVar352._24_4_ * fVar263 + fStack_3a8 * fVar343;
          register0x0000145c = fVar283 + pfVar1[7] + fStack_744;
          auVar230._0_4_ =
               (float)local_e0._0_4_ * fVar167 +
               fVar253 * fVar278 + (float)local_640._0_4_ * fVar296 + fVar194 * fVar329;
          auVar230._4_4_ =
               (float)local_e0._4_4_ * fVar257 +
               fVar254 * fVar279 + (float)local_640._4_4_ * fVar298 + fVar211 * fVar166;
          auVar230._8_4_ =
               fStack_d8 * fVar259 + fVar256 * fVar280 + fStack_638 * fVar299 + fVar212 * fVar185;
          auVar230._12_4_ =
               fStack_d4 * fVar261 + fVar258 * fVar281 + fStack_634 * fVar300 + fVar213 * fVar187;
          auVar230._16_4_ =
               fStack_d0 * fVar264 + fVar260 * fVar284 + fStack_630 * fVar327 + fVar217 * fVar215;
          auVar230._20_4_ =
               fStack_cc * fVar275 + fVar262 * fVar294 + fStack_62c * fVar328 + fVar231 * fVar301;
          auVar230._24_4_ =
               fStack_c8 * fVar277 + fVar302 * fVar295 + fStack_628 * fVar263 + fVar232 * fVar343;
          auVar230._28_4_ = fStack_744 + fVar283 + fVar283 + auVar210._28_4_;
          local_760 = fVar167 * (float)local_1a0._0_4_ +
                      (float)local_c0._0_4_ * fVar278 +
                      (float)local_a0._0_4_ * fVar296 + fVar329 * (float)local_180._0_4_;
          fStack_75c = fVar257 * (float)local_1a0._4_4_ +
                       (float)local_c0._4_4_ * fVar279 +
                       (float)local_a0._4_4_ * fVar298 + fVar166 * (float)local_180._4_4_;
          fStack_758 = fVar259 * fStack_198 +
                       fStack_b8 * fVar280 + fStack_98 * fVar299 + fVar185 * fStack_178;
          fStack_754 = fVar261 * fStack_194 +
                       fStack_b4 * fVar281 + fStack_94 * fVar300 + fVar187 * fStack_174;
          fStack_750 = fVar264 * fStack_190 +
                       fStack_b0 * fVar284 + fStack_90 * fVar327 + fVar215 * fStack_170;
          fStack_74c = fVar275 * fStack_18c +
                       fStack_ac * fVar294 + fStack_8c * fVar328 + fVar301 * fStack_16c;
          fStack_748 = fVar277 * fStack_188 +
                       fStack_a8 * fVar295 + fStack_88 * fVar263 + fVar343 * fStack_168;
          fStack_744 = fStack_744 + fVar282;
          pfVar1 = (float *)(bspline_basis1 + lVar160 * 4 + lVar161);
          fVar278 = *pfVar1;
          fVar279 = pfVar1[1];
          fVar280 = pfVar1[2];
          fVar281 = pfVar1[3];
          fVar284 = pfVar1[4];
          fVar294 = pfVar1[5];
          fVar295 = pfVar1[6];
          pauVar10 = (undefined1 (*) [28])(lVar161 + 0x222e3cc + lVar160 * 4);
          fVar235 = *(float *)*pauVar10;
          fVar214 = *(float *)(*pauVar10 + 4);
          fVar252 = *(float *)(*pauVar10 + 8);
          fVar297 = *(float *)(*pauVar10 + 0xc);
          fVar233 = *(float *)(*pauVar10 + 0x10);
          fVar388 = *(float *)(*pauVar10 + 0x14);
          fVar255 = *(float *)(*pauVar10 + 0x18);
          auVar153 = *pauVar10;
          pauVar11 = (undefined1 (*) [28])(lVar161 + 0x222e850 + lVar160 * 4);
          fVar167 = *(float *)*pauVar11;
          fVar257 = *(float *)(*pauVar11 + 4);
          fVar259 = *(float *)(*pauVar11 + 8);
          fVar261 = *(float *)(*pauVar11 + 0xc);
          fVar264 = *(float *)(*pauVar11 + 0x10);
          fVar275 = *(float *)(*pauVar11 + 0x14);
          fVar277 = *(float *)(*pauVar11 + 0x18);
          auVar152 = *pauVar11;
          pfVar1 = (float *)(lVar161 + 0x222ecd4 + lVar160 * 4);
          fVar296 = *pfVar1;
          fVar298 = pfVar1[1];
          fVar299 = pfVar1[2];
          fVar300 = pfVar1[3];
          fVar327 = pfVar1[4];
          fVar328 = pfVar1[5];
          fVar263 = pfVar1[6];
          fVar283 = fStack_3a4 + fStack_3a4 + fVar282;
          local_680._0_4_ =
               (float)local_200._0_4_ * fVar278 +
               (float)local_580._0_4_ * fVar235 +
               fVar167 * (float)local_5e0._0_4_ + (float)local_3c0._0_4_ * fVar296;
          local_680._4_4_ =
               (float)local_200._4_4_ * fVar279 +
               (float)local_580._4_4_ * fVar214 +
               fVar257 * (float)local_5e0._4_4_ + (float)local_3c0._4_4_ * fVar298;
          fStack_678 = fStack_1f8 * fVar280 +
                       fStack_578 * fVar252 + fVar259 * fStack_5d8 + fStack_3b8 * fVar299;
          fStack_674 = fStack_1f4 * fVar281 +
                       fStack_574 * fVar297 + fVar261 * fStack_5d4 + fStack_3b4 * fVar300;
          register0x00001390 =
               fStack_1f0 * fVar284 +
               fStack_570 * fVar233 + fVar264 * fStack_5d0 + fStack_3b0 * fVar327;
          register0x00001394 =
               fStack_1ec * fVar294 +
               fStack_56c * fVar388 + fVar275 * fStack_5cc + fStack_3ac * fVar328;
          register0x00001398 =
               fStack_1e8 * fVar295 +
               fStack_568 * fVar255 + fVar277 * fStack_5c8 + fStack_3a8 * fVar263;
          register0x0000139c = fStack_3a4 + pfVar1[7] + fVar283;
          local_600._0_4_ =
               (float)local_e0._0_4_ * fVar278 +
               fVar253 * fVar235 + (float)local_640._0_4_ * fVar167 + fVar194 * fVar296;
          local_600._4_4_ =
               (float)local_e0._4_4_ * fVar279 +
               fVar254 * fVar214 + (float)local_640._4_4_ * fVar257 + fVar211 * fVar298;
          uStack_5f8._0_4_ =
               fStack_d8 * fVar280 + fVar256 * fVar252 + fStack_638 * fVar259 + fVar212 * fVar299;
          uStack_5f8._4_4_ =
               fStack_d4 * fVar281 + fVar258 * fVar297 + fStack_634 * fVar261 + fVar213 * fVar300;
          register0x00001350 =
               fStack_d0 * fVar284 + fVar260 * fVar233 + fStack_630 * fVar264 + fVar217 * fVar327;
          register0x00001354 =
               fStack_cc * fVar294 + fVar262 * fVar388 + fStack_62c * fVar275 + fVar231 * fVar328;
          register0x00001358 =
               fStack_c8 * fVar295 + fVar302 * fVar255 + fStack_628 * fVar277 + fVar232 * fVar263;
          register0x0000135c = fVar283 + fStack_3a4 + fStack_3a4 + *(float *)pauVar9[1];
          auVar317._0_4_ =
               (float)local_c0._0_4_ * fVar235 +
               (float)local_a0._0_4_ * fVar167 + fVar296 * (float)local_180._0_4_ +
               fVar278 * (float)local_1a0._0_4_;
          auVar317._4_4_ =
               (float)local_c0._4_4_ * fVar214 +
               (float)local_a0._4_4_ * fVar257 + fVar298 * (float)local_180._4_4_ +
               fVar279 * (float)local_1a0._4_4_;
          auVar317._8_4_ =
               fStack_b8 * fVar252 + fStack_98 * fVar259 + fVar299 * fStack_178 +
               fVar280 * fStack_198;
          auVar317._12_4_ =
               fStack_b4 * fVar297 + fStack_94 * fVar261 + fVar300 * fStack_174 +
               fVar281 * fStack_194;
          auVar317._16_4_ =
               fStack_b0 * fVar233 + fStack_90 * fVar264 + fVar327 * fStack_170 +
               fVar284 * fStack_190;
          auVar317._20_4_ =
               fStack_ac * fVar388 + fStack_8c * fVar275 + fVar328 * fStack_16c +
               fVar294 * fStack_18c;
          auVar317._24_4_ =
               fStack_a8 * fVar255 + fStack_88 * fVar277 + fVar263 * fStack_168 +
               fVar295 * fStack_188;
          auVar317._28_4_ = fStack_3a4 + fStack_3a4 + pfVar1[7] + fVar283;
          auVar395 = ZEXT3264(auVar394._0_32_);
          local_220 = vsubps_avx(_local_680,_local_720);
          auVar210 = ZEXT3264(local_220);
          auVar337 = vsubps_avx(_local_600,auVar230);
          auVar184 = ZEXT3264(auVar337);
          fVar235 = local_220._0_4_;
          fVar252 = local_220._4_4_;
          auVar89._4_4_ = auVar230._4_4_ * fVar252;
          auVar89._0_4_ = auVar230._0_4_ * fVar235;
          fVar233 = local_220._8_4_;
          auVar89._8_4_ = auVar230._8_4_ * fVar233;
          fVar255 = local_220._12_4_;
          auVar89._12_4_ = auVar230._12_4_ * fVar255;
          fVar257 = local_220._16_4_;
          auVar89._16_4_ = auVar230._16_4_ * fVar257;
          fVar261 = local_220._20_4_;
          auVar89._20_4_ = auVar230._20_4_ * fVar261;
          fVar275 = local_220._24_4_;
          auVar89._24_4_ = auVar230._24_4_ * fVar275;
          auVar89._28_4_ = fVar283;
          fVar214 = auVar337._0_4_;
          fVar297 = auVar337._4_4_;
          auVar90._4_4_ = (float)local_720._4_4_ * fVar297;
          auVar90._0_4_ = (float)local_720._0_4_ * fVar214;
          fVar388 = auVar337._8_4_;
          auVar90._8_4_ = fStack_718 * fVar388;
          fVar167 = auVar337._12_4_;
          auVar90._12_4_ = fStack_714 * fVar167;
          fVar259 = auVar337._16_4_;
          auVar90._16_4_ = register0x00001450 * fVar259;
          fVar264 = auVar337._20_4_;
          auVar90._20_4_ = register0x00001454 * fVar264;
          fVar277 = auVar337._24_4_;
          auVar90._24_4_ = register0x00001458 * fVar277;
          auVar90._28_4_ = register0x0000135c;
          auVar292 = vsubps_avx(auVar89,auVar90);
          auVar143._4_4_ = fStack_75c;
          auVar143._0_4_ = local_760;
          auVar143._8_4_ = fStack_758;
          auVar143._12_4_ = fStack_754;
          auVar143._16_4_ = fStack_750;
          auVar143._20_4_ = fStack_74c;
          auVar143._24_4_ = fStack_748;
          auVar143._28_4_ = fStack_744;
          auVar171 = vmaxps_avx(auVar143,auVar317);
          auVar91._4_4_ = auVar171._4_4_ * auVar171._4_4_ * (fVar252 * fVar252 + fVar297 * fVar297);
          auVar91._0_4_ = auVar171._0_4_ * auVar171._0_4_ * (fVar235 * fVar235 + fVar214 * fVar214);
          auVar91._8_4_ = auVar171._8_4_ * auVar171._8_4_ * (fVar233 * fVar233 + fVar388 * fVar388);
          auVar91._12_4_ =
               auVar171._12_4_ * auVar171._12_4_ * (fVar255 * fVar255 + fVar167 * fVar167);
          auVar91._16_4_ =
               auVar171._16_4_ * auVar171._16_4_ * (fVar257 * fVar257 + fVar259 * fVar259);
          auVar91._20_4_ =
               auVar171._20_4_ * auVar171._20_4_ * (fVar261 * fVar261 + fVar264 * fVar264);
          auVar91._24_4_ =
               auVar171._24_4_ * auVar171._24_4_ * (fVar275 * fVar275 + fVar277 * fVar277);
          auVar91._28_4_ = register0x0000139c + register0x0000135c;
          auVar92._4_4_ = auVar292._4_4_ * auVar292._4_4_;
          auVar92._0_4_ = auVar292._0_4_ * auVar292._0_4_;
          auVar92._8_4_ = auVar292._8_4_ * auVar292._8_4_;
          auVar92._12_4_ = auVar292._12_4_ * auVar292._12_4_;
          auVar92._16_4_ = auVar292._16_4_ * auVar292._16_4_;
          auVar92._20_4_ = auVar292._20_4_ * auVar292._20_4_;
          auVar92._24_4_ = auVar292._24_4_ * auVar292._24_4_;
          auVar92._28_4_ = auVar292._28_4_;
          auVar171 = vcmpps_avx(auVar92,auVar91,2);
          local_340 = (uint)lVar160;
          auVar222 = vpshufd_avx(ZEXT416(local_340),0);
          auVar286 = vpor_avx(auVar222,_DAT_01ff0cf0);
          auVar222 = vpor_avx(auVar222,_DAT_02020ea0);
          auVar146._4_4_ = fStack_41c;
          auVar146._0_4_ = local_420;
          auVar146._8_4_ = fStack_418;
          auVar146._12_4_ = fStack_414;
          auVar286 = vpcmpgtd_avx(auVar146,auVar286);
          auVar222 = vpcmpgtd_avx(auVar146,auVar222);
          auVar250._16_16_ = auVar222;
          auVar250._0_16_ = auVar286;
          auVar251 = ZEXT3264(auVar250);
          auVar292 = auVar250 & auVar171;
          fVar235 = (float)local_580._0_4_;
          fVar214 = (float)local_580._4_4_;
          fVar252 = fStack_578;
          fVar297 = fStack_574;
          fVar233 = fStack_570;
          fVar388 = fStack_56c;
          fVar255 = fStack_568;
          if ((((((((auVar292 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar292 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar292 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar292 >> 0x7f,0) == '\0') &&
                (auVar292 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar292 >> 0xbf,0) == '\0') &&
              (auVar292 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar292[0x1f]) {
            auVar352 = ZEXT3264(_local_5e0);
            auVar381 = ZEXT3264(auVar381._0_32_);
          }
          else {
            local_6a0._0_4_ = auVar153._0_4_;
            local_6a0._4_4_ = auVar153._4_4_;
            fStack_698 = auVar153._8_4_;
            fStack_694 = auVar153._12_4_;
            fStack_690 = auVar153._16_4_;
            fStack_68c = auVar153._20_4_;
            fStack_688 = auVar153._24_4_;
            fVar283 = (float)local_1e0._0_4_ * (float)local_6a0._0_4_;
            fVar282 = (float)local_1e0._4_4_ * (float)local_6a0._4_4_;
            fVar338 = fStack_1d8 * fStack_698;
            fVar234 = fStack_1d4 * fStack_694;
            fVar265 = fStack_1d0 * fStack_690;
            fVar341 = fStack_1cc * fStack_68c;
            fVar276 = fStack_1c8 * fStack_688;
            _local_6a0 = auVar317;
            local_3e0 = auVar337;
            local_540._0_4_ = auVar152._0_4_;
            local_540._4_4_ = auVar152._4_4_;
            fStack_538 = auVar152._8_4_;
            fStack_534 = auVar152._12_4_;
            fStack_530 = auVar152._16_4_;
            fStack_52c = auVar152._20_4_;
            fStack_528 = auVar152._24_4_;
            fVar167 = (float)local_100._0_4_ * (float)local_540._0_4_;
            fVar257 = (float)local_100._4_4_ * (float)local_540._4_4_;
            fVar259 = fStack_f8 * fStack_538;
            fVar261 = fStack_f4 * fStack_534;
            fVar264 = fStack_f0 * fStack_530;
            fVar275 = fStack_ec * fStack_52c;
            fVar277 = fStack_e8 * fStack_528;
            _local_540 = auVar250;
            local_400 = fVar278 * (float)local_700._0_4_ +
                        fVar283 + fVar167 + (float)local_560._0_4_ * fVar296;
            fStack_3fc = fVar279 * (float)local_700._4_4_ +
                         fVar282 + fVar257 + (float)local_560._4_4_ * fVar298;
            fStack_3f8 = fVar280 * fStack_6f8 + fVar338 + fVar259 + fStack_558 * fVar299;
            fStack_3f4 = fVar281 * fStack_6f4 + fVar234 + fVar261 + fStack_554 * fVar300;
            fStack_3f0 = fVar284 * fStack_6f0 + fVar265 + fVar264 + fStack_550 * fVar327;
            fStack_3ec = fVar294 * fStack_6ec + fVar341 + fVar275 + fStack_54c * fVar328;
            fStack_3e8 = fVar295 * fStack_6e8 + fVar276 + fVar277 + fStack_548 * fVar263;
            fStack_3e4 = register0x0000145c + auVar337._28_4_ + local_220._28_4_ + 0.0;
            local_620._0_4_ = auVar150._0_4_;
            local_620._4_4_ = auVar150._4_4_;
            uStack_618._0_4_ = auVar150._8_4_;
            uStack_618._4_4_ = auVar150._12_4_;
            auStack_610._0_4_ = auVar150._16_4_;
            auStack_610._4_4_ = auVar150._20_4_;
            fStack_608 = auVar150._24_4_;
            fVar168 = (float)local_1e0._0_4_ * (float)local_620._0_4_;
            fVar186 = (float)local_1e0._4_4_ * (float)local_620._4_4_;
            fVar188 = fStack_1d8 * (float)uStack_618;
            fVar189 = fStack_1d4 * uStack_618._4_4_;
            fVar190 = fStack_1d0 * (float)auStack_610._0_4_;
            fVar191 = fStack_1cc * (float)auStack_610._4_4_;
            fVar192 = fStack_1c8 * fStack_608;
            local_500._0_4_ = auVar149._0_4_;
            local_500._4_4_ = auVar149._4_4_;
            fStack_4f8 = auVar149._8_4_;
            fStack_4f4 = auVar149._12_4_;
            fStack_4f0 = auVar149._16_4_;
            fStack_4ec = auVar149._20_4_;
            fStack_4e8 = auVar149._24_4_;
            pfVar1 = (float *)(lVar161 + 0x222d640 + lVar160 * 4);
            fVar167 = *pfVar1;
            fVar257 = pfVar1[1];
            fVar259 = pfVar1[2];
            fVar261 = pfVar1[3];
            fVar264 = pfVar1[4];
            fVar275 = pfVar1[5];
            fVar277 = pfVar1[6];
            pfVar2 = (float *)(lVar161 + 0x222dac4 + lVar160 * 4);
            fVar278 = *pfVar2;
            fVar279 = pfVar2[1];
            fVar280 = pfVar2[2];
            fVar281 = pfVar2[3];
            fVar284 = pfVar2[4];
            fVar294 = pfVar2[5];
            fVar295 = pfVar2[6];
            fVar309 = auVar394._28_4_ + 0.0;
            pfVar3 = (float *)(lVar161 + 0x222d1bc + lVar160 * 4);
            fVar296 = *pfVar3;
            fVar298 = pfVar3[1];
            fVar299 = pfVar3[2];
            fVar300 = pfVar3[3];
            fVar327 = pfVar3[4];
            fVar328 = pfVar3[5];
            fVar263 = pfVar3[6];
            fVar193 = pfVar1[7] + pfVar2[7];
            fVar216 = pfVar2[7] + fVar309;
            fVar309 = auVar394._28_4_ + *(float *)pauVar10[1] + fVar309;
            pfVar1 = (float *)(lVar161 + 0x222cd38 + lVar160 * 4);
            fVar283 = *pfVar1;
            fVar282 = pfVar1[1];
            fVar338 = pfVar1[2];
            fVar234 = pfVar1[3];
            fVar265 = pfVar1[4];
            fVar341 = pfVar1[5];
            fVar276 = pfVar1[6];
            local_520 = (float)local_200._0_4_ * fVar283 +
                        (float)local_580._0_4_ * fVar296 +
                        (float)local_5e0._0_4_ * fVar167 + (float)local_3c0._0_4_ * fVar278;
            fStack_51c = (float)local_200._4_4_ * fVar282 +
                         (float)local_580._4_4_ * fVar298 +
                         (float)local_5e0._4_4_ * fVar257 + (float)local_3c0._4_4_ * fVar279;
            fStack_518 = fStack_1f8 * fVar338 +
                         fStack_578 * fVar299 + fStack_5d8 * fVar259 + fStack_3b8 * fVar280;
            fStack_514 = fStack_1f4 * fVar234 +
                         fStack_574 * fVar300 + fStack_5d4 * fVar261 + fStack_3b4 * fVar281;
            fStack_510 = fStack_1f0 * fVar265 +
                         fStack_570 * fVar327 + fStack_5d0 * fVar264 + fStack_3b0 * fVar284;
            fStack_50c = fStack_1ec * fVar341 +
                         fStack_56c * fVar328 + fStack_5cc * fVar275 + fStack_3ac * fVar294;
            fStack_508 = fStack_1e8 * fVar276 +
                         fStack_568 * fVar263 + fStack_5c8 * fVar277 + fStack_3a8 * fVar295;
            fStack_504 = fVar193 + fVar216;
            auVar204._0_4_ =
                 (float)local_e0._0_4_ * fVar283 +
                 fVar167 * (float)local_640._0_4_ + fVar194 * fVar278 + fVar253 * fVar296;
            auVar204._4_4_ =
                 (float)local_e0._4_4_ * fVar282 +
                 fVar257 * (float)local_640._4_4_ + fVar211 * fVar279 + fVar254 * fVar298;
            auVar204._8_4_ =
                 fStack_d8 * fVar338 + fVar259 * fStack_638 + fVar212 * fVar280 + fVar256 * fVar299;
            auVar204._12_4_ =
                 fStack_d4 * fVar234 + fVar261 * fStack_634 + fVar213 * fVar281 + fVar258 * fVar300;
            auVar204._16_4_ =
                 fStack_d0 * fVar265 + fVar264 * fStack_630 + fVar217 * fVar284 + fVar260 * fVar327;
            auVar204._20_4_ =
                 fStack_cc * fVar341 + fVar275 * fStack_62c + fVar231 * fVar294 + fVar262 * fVar328;
            auVar204._24_4_ =
                 fStack_c8 * fVar276 + fVar277 * fStack_628 + fVar232 * fVar295 + fVar302 * fVar263;
            auVar204._28_4_ = fVar216 + fVar309;
            auVar379._0_4_ =
                 fVar296 * (float)local_1e0._0_4_ +
                 (float)local_100._0_4_ * fVar167 + (float)local_560._0_4_ * fVar278 +
                 fVar283 * (float)local_700._0_4_;
            auVar379._4_4_ =
                 fVar298 * (float)local_1e0._4_4_ +
                 (float)local_100._4_4_ * fVar257 + (float)local_560._4_4_ * fVar279 +
                 fVar282 * (float)local_700._4_4_;
            auVar379._8_4_ =
                 fVar299 * fStack_1d8 + fStack_f8 * fVar259 + fStack_558 * fVar280 +
                 fVar338 * fStack_6f8;
            auVar379._12_4_ =
                 fVar300 * fStack_1d4 + fStack_f4 * fVar261 + fStack_554 * fVar281 +
                 fVar234 * fStack_6f4;
            auVar379._16_4_ =
                 fVar327 * fStack_1d0 + fStack_f0 * fVar264 + fStack_550 * fVar284 +
                 fVar265 * fStack_6f0;
            auVar379._20_4_ =
                 fVar328 * fStack_1cc + fStack_ec * fVar275 + fStack_54c * fVar294 +
                 fVar341 * fStack_6ec;
            auVar379._24_4_ =
                 fVar263 * fStack_1c8 + fStack_e8 * fVar277 + fStack_548 * fVar295 +
                 fVar276 * fStack_6e8;
            auVar379._28_4_ = pfVar3[7] + fVar193 + fVar309;
            pfVar1 = (float *)(lVar161 + 0x222fa60 + lVar160 * 4);
            fVar257 = *pfVar1;
            fVar259 = pfVar1[1];
            fVar261 = pfVar1[2];
            fVar264 = pfVar1[3];
            fVar275 = pfVar1[4];
            fVar277 = pfVar1[5];
            fVar278 = pfVar1[6];
            pfVar2 = (float *)(lVar161 + 0x222fee4 + lVar160 * 4);
            fVar279 = *pfVar2;
            fVar280 = pfVar2[1];
            fVar281 = pfVar2[2];
            fVar284 = pfVar2[3];
            fVar294 = pfVar2[4];
            fVar295 = pfVar2[5];
            fVar296 = pfVar2[6];
            fVar167 = auVar381._28_4_;
            _local_620 = auVar171;
            pfVar3 = (float *)(lVar161 + 0x222f5dc + lVar160 * 4);
            fVar298 = *pfVar3;
            fVar299 = pfVar3[1];
            fVar300 = pfVar3[2];
            fVar327 = pfVar3[3];
            fVar328 = pfVar3[4];
            fVar263 = pfVar3[5];
            fVar283 = pfVar3[6];
            pfVar4 = (float *)(lVar161 + 0x222f158 + lVar160 * 4);
            fVar282 = *pfVar4;
            fVar194 = pfVar4[1];
            fVar211 = pfVar4[2];
            fVar212 = pfVar4[3];
            fVar213 = pfVar4[4];
            fVar217 = pfVar4[5];
            fVar231 = pfVar4[6];
            auVar335._0_4_ =
                 fVar282 * (float)local_200._0_4_ +
                 (float)local_580._0_4_ * fVar298 +
                 (float)local_5e0._0_4_ * fVar257 + (float)local_3c0._0_4_ * fVar279;
            auVar335._4_4_ =
                 fVar194 * (float)local_200._4_4_ +
                 (float)local_580._4_4_ * fVar299 +
                 (float)local_5e0._4_4_ * fVar259 + (float)local_3c0._4_4_ * fVar280;
            auVar335._8_4_ =
                 fVar211 * fStack_1f8 +
                 fStack_578 * fVar300 + fStack_5d8 * fVar261 + fStack_3b8 * fVar281;
            auVar335._12_4_ =
                 fVar212 * fStack_1f4 +
                 fStack_574 * fVar327 + fStack_5d4 * fVar264 + fStack_3b4 * fVar284;
            auVar335._16_4_ =
                 fVar213 * fStack_1f0 +
                 fStack_570 * fVar328 + fStack_5d0 * fVar275 + fStack_3b0 * fVar294;
            auVar335._20_4_ =
                 fVar217 * fStack_1ec +
                 fStack_56c * fVar263 + fStack_5cc * fVar277 + fStack_3ac * fVar295;
            auVar335._24_4_ =
                 fVar231 * fStack_1e8 +
                 fStack_568 * fVar283 + fStack_5c8 * fVar278 + fStack_3a8 * fVar296;
            auVar335._28_4_ = fVar167 + fVar167 + fStack_3a4 + fVar167;
            auVar369._0_4_ =
                 (float)local_e0._0_4_ * fVar282 +
                 fVar298 * fVar253 +
                 fVar257 * (float)local_640._0_4_ + fVar279 * (float)local_780._0_4_;
            auVar369._4_4_ =
                 (float)local_e0._4_4_ * fVar194 +
                 fVar299 * fVar254 +
                 fVar259 * (float)local_640._4_4_ + fVar280 * (float)local_780._4_4_;
            auVar369._8_4_ =
                 fStack_d8 * fVar211 +
                 fVar300 * fVar256 + fVar261 * fStack_638 + fVar281 * fStack_778;
            auVar369._12_4_ =
                 fStack_d4 * fVar212 +
                 fVar327 * fVar258 + fVar264 * fStack_634 + fVar284 * fStack_774;
            auVar369._16_4_ =
                 fStack_d0 * fVar213 +
                 fVar328 * fVar260 + fVar275 * fStack_630 + fVar294 * fStack_770;
            auVar369._20_4_ =
                 fStack_cc * fVar217 +
                 fVar263 * fVar262 + fVar277 * fStack_62c + fVar295 * fStack_76c;
            auVar369._24_4_ =
                 fStack_c8 * fVar231 +
                 fVar283 * fVar302 + fVar278 * fStack_628 + fVar296 * fStack_768;
            auVar369._28_4_ = fVar167 + fVar167 + fStack_1e4 + fVar167;
            auVar293._8_4_ = 0x7fffffff;
            auVar293._0_8_ = 0x7fffffff7fffffff;
            auVar293._12_4_ = 0x7fffffff;
            auVar293._16_4_ = 0x7fffffff;
            auVar293._20_4_ = 0x7fffffff;
            auVar293._24_4_ = 0x7fffffff;
            auVar293._28_4_ = 0x7fffffff;
            auVar145._4_4_ = fStack_51c;
            auVar145._0_4_ = local_520;
            auVar145._8_4_ = fStack_518;
            auVar145._12_4_ = fStack_514;
            auVar145._16_4_ = fStack_510;
            auVar145._20_4_ = fStack_50c;
            auVar145._24_4_ = fStack_508;
            auVar145._28_4_ = fStack_504;
            auVar292 = vandps_avx(auVar145,auVar293);
            auVar41 = vandps_avx(auVar204,auVar293);
            auVar41 = vmaxps_avx(auVar292,auVar41);
            auVar292 = vandps_avx(auVar379,auVar293);
            auVar41 = vmaxps_avx(auVar41,auVar292);
            auVar41 = vcmpps_avx(auVar41,local_240,1);
            auVar42 = vblendvps_avx(auVar145,local_220,auVar41);
            auVar179._0_4_ =
                 fVar282 * (float)local_700._0_4_ +
                 fVar298 * (float)local_1e0._0_4_ +
                 fVar279 * (float)local_560._0_4_ + (float)local_100._0_4_ * fVar257;
            auVar179._4_4_ =
                 fVar194 * (float)local_700._4_4_ +
                 fVar299 * (float)local_1e0._4_4_ +
                 fVar280 * (float)local_560._4_4_ + (float)local_100._4_4_ * fVar259;
            auVar179._8_4_ =
                 fVar211 * fStack_6f8 +
                 fVar300 * fStack_1d8 + fVar281 * fStack_558 + fStack_f8 * fVar261;
            auVar179._12_4_ =
                 fVar212 * fStack_6f4 +
                 fVar327 * fStack_1d4 + fVar284 * fStack_554 + fStack_f4 * fVar264;
            auVar179._16_4_ =
                 fVar213 * fStack_6f0 +
                 fVar328 * fStack_1d0 + fVar294 * fStack_550 + fStack_f0 * fVar275;
            auVar179._20_4_ =
                 fVar217 * fStack_6ec +
                 fVar263 * fStack_1cc + fVar295 * fStack_54c + fStack_ec * fVar277;
            auVar179._24_4_ =
                 fVar231 * fStack_6e8 +
                 fVar283 * fStack_1c8 + fVar296 * fStack_548 + fStack_e8 * fVar278;
            auVar179._28_4_ = auVar292._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
            auVar43 = vblendvps_avx(auVar204,auVar337,auVar41);
            auVar292 = vandps_avx(auVar335,auVar293);
            auVar41 = vandps_avx(auVar369,auVar293);
            auVar44 = vmaxps_avx(auVar292,auVar41);
            auVar292 = vandps_avx(auVar179,auVar293);
            auVar292 = vmaxps_avx(auVar44,auVar292);
            local_740._0_4_ = auVar151._0_4_;
            local_740._4_4_ = auVar151._4_4_;
            uStack_738._0_4_ = auVar151._8_4_;
            uStack_738._4_4_ = auVar151._12_4_;
            auStack_730._0_4_ = auVar151._16_4_;
            auStack_730._4_4_ = auVar151._20_4_;
            fStack_728 = auVar151._24_4_;
            auVar41 = vcmpps_avx(auVar292,local_240,1);
            auVar292 = vblendvps_avx(auVar335,local_220,auVar41);
            auVar180._0_4_ =
                 (float)local_700._0_4_ * (float)local_740._0_4_ +
                 fVar168 + (float)local_100._0_4_ * (float)local_500._0_4_ +
                           (float)local_560._0_4_ * fVar329;
            auVar180._4_4_ =
                 (float)local_700._4_4_ * (float)local_740._4_4_ +
                 fVar186 + (float)local_100._4_4_ * (float)local_500._4_4_ +
                           (float)local_560._4_4_ * fVar166;
            auVar180._8_4_ =
                 fStack_6f8 * (float)uStack_738 +
                 fVar188 + fStack_f8 * fStack_4f8 + fStack_558 * fVar185;
            auVar180._12_4_ =
                 fStack_6f4 * uStack_738._4_4_ +
                 fVar189 + fStack_f4 * fStack_4f4 + fStack_554 * fVar187;
            auVar180._16_4_ =
                 fStack_6f0 * (float)auStack_730._0_4_ +
                 fVar190 + fStack_f0 * fStack_4f0 + fStack_550 * fVar215;
            auVar180._20_4_ =
                 fStack_6ec * (float)auStack_730._4_4_ +
                 fVar191 + fStack_ec * fStack_4ec + fStack_54c * fVar301;
            auVar180._24_4_ =
                 fStack_6e8 * fStack_728 + fVar192 + fStack_e8 * fStack_4e8 + fStack_548 * fVar343;
            auVar180._28_4_ = auVar44._28_4_ + fStack_3e4 + local_220._28_4_ + 0.0;
            auVar337 = vblendvps_avx(auVar369,auVar337,auVar41);
            fVar262 = auVar42._0_4_;
            fVar302 = auVar42._4_4_;
            fVar194 = auVar42._8_4_;
            fVar211 = auVar42._12_4_;
            fVar212 = auVar42._16_4_;
            fVar213 = auVar42._20_4_;
            fVar217 = auVar42._24_4_;
            fVar231 = auVar42._28_4_;
            fVar296 = auVar292._0_4_;
            fVar299 = auVar292._4_4_;
            fVar327 = auVar292._8_4_;
            fVar263 = auVar292._12_4_;
            fVar166 = auVar292._16_4_;
            fVar187 = auVar292._20_4_;
            fVar301 = auVar292._24_4_;
            fVar167 = auVar43._0_4_;
            fVar259 = auVar43._4_4_;
            fVar264 = auVar43._8_4_;
            fVar277 = auVar43._12_4_;
            fVar279 = auVar43._16_4_;
            fVar281 = auVar43._20_4_;
            fVar294 = auVar43._24_4_;
            auVar350._0_4_ = fVar167 * fVar167 + fVar262 * fVar262;
            auVar350._4_4_ = fVar259 * fVar259 + fVar302 * fVar302;
            auVar350._8_4_ = fVar264 * fVar264 + fVar194 * fVar194;
            auVar350._12_4_ = fVar277 * fVar277 + fVar211 * fVar211;
            auVar350._16_4_ = fVar279 * fVar279 + fVar212 * fVar212;
            auVar350._20_4_ = fVar281 * fVar281 + fVar213 * fVar213;
            auVar350._24_4_ = fVar294 * fVar294 + fVar217 * fVar217;
            auVar350._28_4_ = fStack_c4 + fStack_5c4;
            auVar41 = vrsqrtps_avx(auVar350);
            fVar257 = auVar41._0_4_;
            fVar261 = auVar41._4_4_;
            auVar93._4_4_ = fVar261 * 1.5;
            auVar93._0_4_ = fVar257 * 1.5;
            fVar275 = auVar41._8_4_;
            auVar93._8_4_ = fVar275 * 1.5;
            fVar278 = auVar41._12_4_;
            auVar93._12_4_ = fVar278 * 1.5;
            fVar280 = auVar41._16_4_;
            auVar93._16_4_ = fVar280 * 1.5;
            fVar284 = auVar41._20_4_;
            auVar93._20_4_ = fVar284 * 1.5;
            fVar295 = auVar41._24_4_;
            auVar93._24_4_ = fVar295 * 1.5;
            auVar93._28_4_ = auVar369._28_4_;
            auVar94._4_4_ = fVar261 * fVar261 * fVar261 * auVar350._4_4_ * 0.5;
            auVar94._0_4_ = fVar257 * fVar257 * fVar257 * auVar350._0_4_ * 0.5;
            auVar94._8_4_ = fVar275 * fVar275 * fVar275 * auVar350._8_4_ * 0.5;
            auVar94._12_4_ = fVar278 * fVar278 * fVar278 * auVar350._12_4_ * 0.5;
            auVar94._16_4_ = fVar280 * fVar280 * fVar280 * auVar350._16_4_ * 0.5;
            auVar94._20_4_ = fVar284 * fVar284 * fVar284 * auVar350._20_4_ * 0.5;
            auVar94._24_4_ = fVar295 * fVar295 * fVar295 * auVar350._24_4_ * 0.5;
            auVar94._28_4_ = auVar350._28_4_;
            auVar42 = vsubps_avx(auVar93,auVar94);
            fVar283 = auVar42._0_4_;
            fVar282 = auVar42._4_4_;
            fVar253 = auVar42._8_4_;
            fVar254 = auVar42._12_4_;
            fVar256 = auVar42._16_4_;
            fVar258 = auVar42._20_4_;
            fVar260 = auVar42._24_4_;
            fVar257 = auVar337._0_4_;
            fVar261 = auVar337._4_4_;
            fVar275 = auVar337._8_4_;
            fVar278 = auVar337._12_4_;
            fVar280 = auVar337._16_4_;
            fVar284 = auVar337._20_4_;
            fVar295 = auVar337._24_4_;
            auVar326._0_4_ = fVar257 * fVar257 + fVar296 * fVar296;
            auVar326._4_4_ = fVar261 * fVar261 + fVar299 * fVar299;
            auVar326._8_4_ = fVar275 * fVar275 + fVar327 * fVar327;
            auVar326._12_4_ = fVar278 * fVar278 + fVar263 * fVar263;
            auVar326._16_4_ = fVar280 * fVar280 + fVar166 * fVar166;
            auVar326._20_4_ = fVar284 * fVar284 + fVar187 * fVar187;
            auVar326._24_4_ = fVar295 * fVar295 + fVar301 * fVar301;
            auVar326._28_4_ = auVar41._28_4_ + auVar292._28_4_;
            auVar337 = vrsqrtps_avx(auVar326);
            fVar298 = auVar337._0_4_;
            fVar300 = auVar337._4_4_;
            auVar95._4_4_ = fVar300 * 1.5;
            auVar95._0_4_ = fVar298 * 1.5;
            fVar328 = auVar337._8_4_;
            auVar95._8_4_ = fVar328 * 1.5;
            fVar329 = auVar337._12_4_;
            auVar95._12_4_ = fVar329 * 1.5;
            fVar185 = auVar337._16_4_;
            auVar95._16_4_ = fVar185 * 1.5;
            fVar215 = auVar337._20_4_;
            auVar95._20_4_ = fVar215 * 1.5;
            fVar343 = auVar337._24_4_;
            auVar95._24_4_ = fVar343 * 1.5;
            auVar95._28_4_ = auVar369._28_4_;
            auVar96._4_4_ = fVar300 * fVar300 * fVar300 * auVar326._4_4_ * 0.5;
            auVar96._0_4_ = fVar298 * fVar298 * fVar298 * auVar326._0_4_ * 0.5;
            auVar96._8_4_ = fVar328 * fVar328 * fVar328 * auVar326._8_4_ * 0.5;
            auVar96._12_4_ = fVar329 * fVar329 * fVar329 * auVar326._12_4_ * 0.5;
            auVar96._16_4_ = fVar185 * fVar185 * fVar185 * auVar326._16_4_ * 0.5;
            auVar96._20_4_ = fVar215 * fVar215 * fVar215 * auVar326._20_4_ * 0.5;
            auVar96._24_4_ = fVar343 * fVar343 * fVar343 * auVar326._24_4_ * 0.5;
            auVar96._28_4_ = auVar326._28_4_;
            auVar292 = vsubps_avx(auVar95,auVar96);
            fVar298 = auVar292._0_4_;
            fVar300 = auVar292._4_4_;
            fVar328 = auVar292._8_4_;
            fVar329 = auVar292._12_4_;
            fVar185 = auVar292._16_4_;
            fVar215 = auVar292._20_4_;
            fVar343 = auVar292._24_4_;
            fVar167 = local_760 * fVar283 * fVar167;
            fVar259 = fStack_75c * fVar282 * fVar259;
            auVar97._4_4_ = fVar259;
            auVar97._0_4_ = fVar167;
            fVar264 = fStack_758 * fVar253 * fVar264;
            auVar97._8_4_ = fVar264;
            fVar277 = fStack_754 * fVar254 * fVar277;
            auVar97._12_4_ = fVar277;
            fVar279 = fStack_750 * fVar256 * fVar279;
            auVar97._16_4_ = fVar279;
            fVar281 = fStack_74c * fVar258 * fVar281;
            auVar97._20_4_ = fVar281;
            fVar294 = fStack_748 * fVar260 * fVar294;
            auVar97._24_4_ = fVar294;
            auVar97._28_4_ = auVar337._28_4_;
            local_740._4_4_ = fVar259 + (float)local_720._4_4_;
            local_740._0_4_ = fVar167 + (float)local_720._0_4_;
            uStack_738._0_4_ = fVar264 + fStack_718;
            uStack_738._4_4_ = fVar277 + fStack_714;
            auStack_730._0_4_ = fVar279 + register0x00001450;
            auStack_730._4_4_ = fVar281 + register0x00001454;
            fStack_728 = fVar294 + register0x00001458;
            fStack_724 = auVar337._28_4_ + register0x0000145c;
            fVar167 = local_760 * fVar283 * -fVar262;
            fVar259 = fStack_75c * fVar282 * -fVar302;
            auVar98._4_4_ = fVar259;
            auVar98._0_4_ = fVar167;
            fVar264 = fStack_758 * fVar253 * -fVar194;
            auVar98._8_4_ = fVar264;
            fVar277 = fStack_754 * fVar254 * -fVar211;
            auVar98._12_4_ = fVar277;
            fVar279 = fStack_750 * fVar256 * -fVar212;
            auVar98._16_4_ = fVar279;
            fVar281 = fStack_74c * fVar258 * -fVar213;
            auVar98._20_4_ = fVar281;
            fVar294 = fStack_748 * fVar260 * -fVar217;
            auVar98._24_4_ = fVar294;
            auVar98._28_4_ = -fVar231;
            local_500._4_4_ = auVar230._4_4_ + fVar259;
            local_500._0_4_ = auVar230._0_4_ + fVar167;
            fStack_4f8 = auVar230._8_4_ + fVar264;
            fStack_4f4 = auVar230._12_4_ + fVar277;
            fStack_4f0 = auVar230._16_4_ + fVar279;
            fStack_4ec = auVar230._20_4_ + fVar281;
            fStack_4e8 = auVar230._24_4_ + fVar294;
            fStack_4e4 = auVar230._28_4_ + -fVar231;
            fVar167 = fVar283 * 0.0 * local_760;
            fVar259 = fVar282 * 0.0 * fStack_75c;
            auVar99._4_4_ = fVar259;
            auVar99._0_4_ = fVar167;
            fVar264 = fVar253 * 0.0 * fStack_758;
            auVar99._8_4_ = fVar264;
            fVar277 = fVar254 * 0.0 * fStack_754;
            auVar99._12_4_ = fVar277;
            fVar279 = fVar256 * 0.0 * fStack_750;
            auVar99._16_4_ = fVar279;
            fVar281 = fVar258 * 0.0 * fStack_74c;
            auVar99._20_4_ = fVar281;
            fVar294 = fVar260 * 0.0 * fStack_748;
            auVar99._24_4_ = fVar294;
            auVar99._28_4_ = fVar231;
            auVar45 = vsubps_avx(_local_720,auVar97);
            auVar404._0_4_ = fVar167 + auVar180._0_4_;
            auVar404._4_4_ = fVar259 + auVar180._4_4_;
            auVar404._8_4_ = fVar264 + auVar180._8_4_;
            auVar404._12_4_ = fVar277 + auVar180._12_4_;
            auVar404._16_4_ = fVar279 + auVar180._16_4_;
            auVar404._20_4_ = fVar281 + auVar180._20_4_;
            auVar404._24_4_ = fVar294 + auVar180._24_4_;
            auVar404._28_4_ = fVar231 + auVar180._28_4_;
            fVar167 = auVar317._0_4_ * fVar298 * fVar257;
            fVar257 = auVar317._4_4_ * fVar300 * fVar261;
            auVar100._4_4_ = fVar257;
            auVar100._0_4_ = fVar167;
            fVar259 = auVar317._8_4_ * fVar328 * fVar275;
            auVar100._8_4_ = fVar259;
            fVar261 = auVar317._12_4_ * fVar329 * fVar278;
            auVar100._12_4_ = fVar261;
            fVar264 = auVar317._16_4_ * fVar185 * fVar280;
            auVar100._16_4_ = fVar264;
            fVar275 = auVar317._20_4_ * fVar215 * fVar284;
            auVar100._20_4_ = fVar275;
            fVar277 = auVar317._24_4_ * fVar343 * fVar295;
            auVar100._24_4_ = fVar277;
            auVar100._28_4_ = fStack_744;
            auVar172 = vsubps_avx(auVar230,auVar98);
            auVar380._0_4_ = (float)local_680._0_4_ + fVar167;
            auVar380._4_4_ = (float)local_680._4_4_ + fVar257;
            auVar380._8_4_ = fStack_678 + fVar259;
            auVar380._12_4_ = fStack_674 + fVar261;
            auVar380._16_4_ = register0x00001390 + fVar264;
            auVar380._20_4_ = register0x00001394 + fVar275;
            auVar380._24_4_ = register0x00001398 + fVar277;
            auVar380._28_4_ = register0x0000139c + fStack_744;
            fVar167 = fVar298 * -fVar296 * auVar317._0_4_;
            fVar257 = fVar300 * -fVar299 * auVar317._4_4_;
            auVar101._4_4_ = fVar257;
            auVar101._0_4_ = fVar167;
            fVar259 = fVar328 * -fVar327 * auVar317._8_4_;
            auVar101._8_4_ = fVar259;
            fVar261 = fVar329 * -fVar263 * auVar317._12_4_;
            auVar101._12_4_ = fVar261;
            fVar264 = fVar185 * -fVar166 * auVar317._16_4_;
            auVar101._16_4_ = fVar264;
            fVar275 = fVar215 * -fVar187 * auVar317._20_4_;
            auVar101._20_4_ = fVar275;
            fVar277 = fVar343 * -fVar301 * auVar317._24_4_;
            auVar101._24_4_ = fVar277;
            auVar101._28_4_ = register0x0000145c;
            auVar173 = vsubps_avx(auVar180,auVar99);
            auVar273._0_4_ = (float)local_600._0_4_ + fVar167;
            auVar273._4_4_ = (float)local_600._4_4_ + fVar257;
            auVar273._8_4_ = (float)uStack_5f8 + fVar259;
            auVar273._12_4_ = uStack_5f8._4_4_ + fVar261;
            auVar273._16_4_ = register0x00001350 + fVar264;
            auVar273._20_4_ = register0x00001354 + fVar275;
            auVar273._24_4_ = register0x00001358 + fVar277;
            auVar273._28_4_ = register0x0000135c + register0x0000145c;
            fVar167 = fVar298 * 0.0 * auVar317._0_4_;
            fVar257 = fVar300 * 0.0 * auVar317._4_4_;
            auVar102._4_4_ = fVar257;
            auVar102._0_4_ = fVar167;
            fVar259 = fVar328 * 0.0 * auVar317._8_4_;
            auVar102._8_4_ = fVar259;
            fVar261 = fVar329 * 0.0 * auVar317._12_4_;
            auVar102._12_4_ = fVar261;
            fVar264 = fVar185 * 0.0 * auVar317._16_4_;
            auVar102._16_4_ = fVar264;
            fVar275 = fVar215 * 0.0 * auVar317._20_4_;
            auVar102._20_4_ = fVar275;
            fVar277 = fVar343 * 0.0 * auVar317._24_4_;
            auVar102._24_4_ = fVar277;
            auVar102._28_4_ = auVar180._28_4_;
            auVar337 = vsubps_avx(_local_680,auVar100);
            auVar148._4_4_ = fStack_3fc;
            auVar148._0_4_ = local_400;
            auVar148._8_4_ = fStack_3f8;
            auVar148._12_4_ = fStack_3f4;
            auVar148._16_4_ = fStack_3f0;
            auVar148._20_4_ = fStack_3ec;
            auVar148._24_4_ = fStack_3e8;
            auVar148._28_4_ = fStack_3e4;
            auVar336._0_4_ = local_400 + fVar167;
            auVar336._4_4_ = fStack_3fc + fVar257;
            auVar336._8_4_ = fStack_3f8 + fVar259;
            auVar336._12_4_ = fStack_3f4 + fVar261;
            auVar336._16_4_ = fStack_3f0 + fVar264;
            auVar336._20_4_ = fStack_3ec + fVar275;
            auVar336._24_4_ = fStack_3e8 + fVar277;
            auVar336._28_4_ = fStack_3e4 + auVar180._28_4_;
            auVar41 = vsubps_avx(_local_600,auVar101);
            auVar42 = vsubps_avx(auVar148,auVar102);
            auVar43 = vsubps_avx(auVar273,auVar172);
            auVar44 = vsubps_avx(auVar336,auVar173);
            auVar103._4_4_ = auVar173._4_4_ * auVar43._4_4_;
            auVar103._0_4_ = auVar173._0_4_ * auVar43._0_4_;
            auVar103._8_4_ = auVar173._8_4_ * auVar43._8_4_;
            auVar103._12_4_ = auVar173._12_4_ * auVar43._12_4_;
            auVar103._16_4_ = auVar173._16_4_ * auVar43._16_4_;
            auVar103._20_4_ = auVar173._20_4_ * auVar43._20_4_;
            auVar103._24_4_ = auVar173._24_4_ * auVar43._24_4_;
            auVar103._28_4_ = auVar369._28_4_;
            auVar104._4_4_ = auVar172._4_4_ * auVar44._4_4_;
            auVar104._0_4_ = auVar172._0_4_ * auVar44._0_4_;
            auVar104._8_4_ = auVar172._8_4_ * auVar44._8_4_;
            auVar104._12_4_ = auVar172._12_4_ * auVar44._12_4_;
            auVar104._16_4_ = auVar172._16_4_ * auVar44._16_4_;
            auVar104._20_4_ = auVar172._20_4_ * auVar44._20_4_;
            auVar104._24_4_ = auVar172._24_4_ * auVar44._24_4_;
            auVar104._28_4_ = fStack_3e4;
            auVar46 = vsubps_avx(auVar104,auVar103);
            auVar105._4_4_ = auVar45._4_4_ * auVar44._4_4_;
            auVar105._0_4_ = auVar45._0_4_ * auVar44._0_4_;
            auVar105._8_4_ = auVar45._8_4_ * auVar44._8_4_;
            auVar105._12_4_ = auVar45._12_4_ * auVar44._12_4_;
            auVar105._16_4_ = auVar45._16_4_ * auVar44._16_4_;
            auVar105._20_4_ = auVar45._20_4_ * auVar44._20_4_;
            auVar105._24_4_ = auVar45._24_4_ * auVar44._24_4_;
            auVar105._28_4_ = auVar44._28_4_;
            auVar44 = vsubps_avx(auVar380,auVar45);
            auVar106._4_4_ = auVar173._4_4_ * auVar44._4_4_;
            auVar106._0_4_ = auVar173._0_4_ * auVar44._0_4_;
            auVar106._8_4_ = auVar173._8_4_ * auVar44._8_4_;
            auVar106._12_4_ = auVar173._12_4_ * auVar44._12_4_;
            auVar106._16_4_ = auVar173._16_4_ * auVar44._16_4_;
            auVar106._20_4_ = auVar173._20_4_ * auVar44._20_4_;
            auVar106._24_4_ = auVar173._24_4_ * auVar44._24_4_;
            auVar106._28_4_ = auVar292._28_4_;
            auVar48 = vsubps_avx(auVar106,auVar105);
            auVar107._4_4_ = auVar172._4_4_ * auVar44._4_4_;
            auVar107._0_4_ = auVar172._0_4_ * auVar44._0_4_;
            auVar107._8_4_ = auVar172._8_4_ * auVar44._8_4_;
            auVar107._12_4_ = auVar172._12_4_ * auVar44._12_4_;
            auVar107._16_4_ = auVar172._16_4_ * auVar44._16_4_;
            auVar107._20_4_ = auVar172._20_4_ * auVar44._20_4_;
            auVar107._24_4_ = auVar172._24_4_ * auVar44._24_4_;
            auVar107._28_4_ = auVar292._28_4_;
            auVar108._4_4_ = auVar45._4_4_ * auVar43._4_4_;
            auVar108._0_4_ = auVar45._0_4_ * auVar43._0_4_;
            auVar108._8_4_ = auVar45._8_4_ * auVar43._8_4_;
            auVar108._12_4_ = auVar45._12_4_ * auVar43._12_4_;
            auVar108._16_4_ = auVar45._16_4_ * auVar43._16_4_;
            auVar108._20_4_ = auVar45._20_4_ * auVar43._20_4_;
            auVar108._24_4_ = auVar45._24_4_ * auVar43._24_4_;
            auVar108._28_4_ = auVar43._28_4_;
            auVar292 = vsubps_avx(auVar108,auVar107);
            auVar205._0_4_ = auVar46._0_4_ * 0.0 + auVar292._0_4_ + auVar48._0_4_ * 0.0;
            auVar205._4_4_ = auVar46._4_4_ * 0.0 + auVar292._4_4_ + auVar48._4_4_ * 0.0;
            auVar205._8_4_ = auVar46._8_4_ * 0.0 + auVar292._8_4_ + auVar48._8_4_ * 0.0;
            auVar205._12_4_ = auVar46._12_4_ * 0.0 + auVar292._12_4_ + auVar48._12_4_ * 0.0;
            auVar205._16_4_ = auVar46._16_4_ * 0.0 + auVar292._16_4_ + auVar48._16_4_ * 0.0;
            auVar205._20_4_ = auVar46._20_4_ * 0.0 + auVar292._20_4_ + auVar48._20_4_ * 0.0;
            auVar205._24_4_ = auVar46._24_4_ * 0.0 + auVar292._24_4_ + auVar48._24_4_ * 0.0;
            auVar205._28_4_ = auVar46._28_4_ + auVar292._28_4_ + auVar48._28_4_;
            auVar40 = vcmpps_avx(auVar205,ZEXT832(0) << 0x20,2);
            auVar337 = vblendvps_avx(auVar337,_local_740,auVar40);
            auVar251 = ZEXT3264(auVar337);
            auVar292 = vblendvps_avx(auVar41,_local_500,auVar40);
            auVar41 = vblendvps_avx(auVar42,auVar404,auVar40);
            auVar42 = vblendvps_avx(auVar45,auVar380,auVar40);
            auVar43 = vblendvps_avx(auVar172,auVar273,auVar40);
            auVar44 = vblendvps_avx(auVar173,auVar336,auVar40);
            auVar45 = vblendvps_avx(auVar380,auVar45,auVar40);
            auVar46 = vblendvps_avx(auVar273,auVar172,auVar40);
            auVar48 = vblendvps_avx(auVar336,auVar173,auVar40);
            local_7a0 = vandps_avx(auVar171,auVar250);
            auVar45 = vsubps_avx(auVar45,auVar337);
            auVar198 = vsubps_avx(auVar46,auVar292);
            auVar48 = vsubps_avx(auVar48,auVar41);
            auVar171 = vsubps_avx(auVar292,auVar43);
            fVar167 = auVar198._0_4_;
            fVar168 = auVar41._0_4_;
            fVar278 = auVar198._4_4_;
            fVar186 = auVar41._4_4_;
            auVar109._4_4_ = fVar186 * fVar278;
            auVar109._0_4_ = fVar168 * fVar167;
            fVar296 = auVar198._8_4_;
            fVar188 = auVar41._8_4_;
            auVar109._8_4_ = fVar188 * fVar296;
            fVar329 = auVar198._12_4_;
            fVar189 = auVar41._12_4_;
            auVar109._12_4_ = fVar189 * fVar329;
            fVar283 = auVar198._16_4_;
            fVar190 = auVar41._16_4_;
            auVar109._16_4_ = fVar190 * fVar283;
            fVar262 = auVar198._20_4_;
            fVar191 = auVar41._20_4_;
            auVar109._20_4_ = fVar191 * fVar262;
            fVar231 = auVar198._24_4_;
            fVar192 = auVar41._24_4_;
            auVar109._24_4_ = fVar192 * fVar231;
            auVar109._28_4_ = auVar46._28_4_;
            fVar257 = auVar292._0_4_;
            fVar193 = auVar48._0_4_;
            fVar279 = auVar292._4_4_;
            fVar216 = auVar48._4_4_;
            auVar110._4_4_ = fVar216 * fVar279;
            auVar110._0_4_ = fVar193 * fVar257;
            fVar298 = auVar292._8_4_;
            fVar309 = auVar48._8_4_;
            auVar110._8_4_ = fVar309 * fVar298;
            fVar166 = auVar292._12_4_;
            fVar339 = auVar48._12_4_;
            auVar110._12_4_ = fVar339 * fVar166;
            fVar282 = auVar292._16_4_;
            fVar340 = auVar48._16_4_;
            auVar110._16_4_ = fVar340 * fVar282;
            fVar302 = auVar292._20_4_;
            fVar342 = auVar48._20_4_;
            auVar110._20_4_ = fVar342 * fVar302;
            fVar232 = auVar292._24_4_;
            fVar360 = auVar48._24_4_;
            uVar12 = auVar172._28_4_;
            auVar110._24_4_ = fVar360 * fVar232;
            auVar110._28_4_ = uVar12;
            auVar46 = vsubps_avx(auVar110,auVar109);
            fVar259 = auVar337._0_4_;
            fVar280 = auVar337._4_4_;
            auVar111._4_4_ = fVar216 * fVar280;
            auVar111._0_4_ = fVar193 * fVar259;
            fVar299 = auVar337._8_4_;
            auVar111._8_4_ = fVar309 * fVar299;
            fVar185 = auVar337._12_4_;
            auVar111._12_4_ = fVar339 * fVar185;
            fVar253 = auVar337._16_4_;
            auVar111._16_4_ = fVar340 * fVar253;
            fVar194 = auVar337._20_4_;
            auVar111._20_4_ = fVar342 * fVar194;
            fVar338 = auVar337._24_4_;
            auVar111._24_4_ = fVar360 * fVar338;
            auVar111._28_4_ = uVar12;
            fVar261 = auVar45._0_4_;
            fVar281 = auVar45._4_4_;
            auVar112._4_4_ = fVar186 * fVar281;
            auVar112._0_4_ = fVar168 * fVar261;
            fVar300 = auVar45._8_4_;
            auVar112._8_4_ = fVar188 * fVar300;
            fVar187 = auVar45._12_4_;
            auVar112._12_4_ = fVar189 * fVar187;
            fVar254 = auVar45._16_4_;
            auVar112._16_4_ = fVar190 * fVar254;
            fVar211 = auVar45._20_4_;
            auVar112._20_4_ = fVar191 * fVar211;
            fVar234 = auVar45._24_4_;
            auVar112._24_4_ = fVar192 * fVar234;
            auVar112._28_4_ = auVar380._28_4_;
            auVar172 = vsubps_avx(auVar112,auVar111);
            auVar113._4_4_ = fVar279 * fVar281;
            auVar113._0_4_ = fVar257 * fVar261;
            auVar113._8_4_ = fVar298 * fVar300;
            auVar113._12_4_ = fVar166 * fVar187;
            auVar113._16_4_ = fVar282 * fVar254;
            auVar113._20_4_ = fVar302 * fVar211;
            auVar113._24_4_ = fVar232 * fVar234;
            auVar113._28_4_ = uVar12;
            auVar114._4_4_ = fVar280 * fVar278;
            auVar114._0_4_ = fVar259 * fVar167;
            auVar114._8_4_ = fVar299 * fVar296;
            auVar114._12_4_ = fVar185 * fVar329;
            auVar114._16_4_ = fVar253 * fVar283;
            auVar114._20_4_ = fVar194 * fVar262;
            auVar114._24_4_ = fVar338 * fVar231;
            auVar114._28_4_ = auVar173._28_4_;
            auVar173 = vsubps_avx(auVar114,auVar113);
            auVar199 = vsubps_avx(auVar41,auVar44);
            fVar275 = auVar173._28_4_ + auVar172._28_4_;
            local_720._0_4_ = auVar173._0_4_ + auVar172._0_4_ * 0.0 + auVar46._0_4_ * 0.0;
            local_720._4_4_ = auVar173._4_4_ + auVar172._4_4_ * 0.0 + auVar46._4_4_ * 0.0;
            fStack_718 = auVar173._8_4_ + auVar172._8_4_ * 0.0 + auVar46._8_4_ * 0.0;
            fStack_714 = auVar173._12_4_ + auVar172._12_4_ * 0.0 + auVar46._12_4_ * 0.0;
            register0x00001490 = auVar173._16_4_ + auVar172._16_4_ * 0.0 + auVar46._16_4_ * 0.0;
            register0x00001494 = auVar173._20_4_ + auVar172._20_4_ * 0.0 + auVar46._20_4_ * 0.0;
            register0x00001498 = auVar173._24_4_ + auVar172._24_4_ * 0.0 + auVar46._24_4_ * 0.0;
            register0x0000149c = fVar275 + auVar46._28_4_;
            fVar264 = auVar171._0_4_;
            fVar284 = auVar171._4_4_;
            auVar115._4_4_ = auVar44._4_4_ * fVar284;
            auVar115._0_4_ = auVar44._0_4_ * fVar264;
            fVar327 = auVar171._8_4_;
            auVar115._8_4_ = auVar44._8_4_ * fVar327;
            fVar215 = auVar171._12_4_;
            auVar115._12_4_ = auVar44._12_4_ * fVar215;
            fVar256 = auVar171._16_4_;
            auVar115._16_4_ = auVar44._16_4_ * fVar256;
            fVar212 = auVar171._20_4_;
            auVar115._20_4_ = auVar44._20_4_ * fVar212;
            fVar265 = auVar171._24_4_;
            auVar115._24_4_ = auVar44._24_4_ * fVar265;
            auVar115._28_4_ = fVar275;
            fVar275 = auVar199._0_4_;
            fVar294 = auVar199._4_4_;
            auVar116._4_4_ = auVar43._4_4_ * fVar294;
            auVar116._0_4_ = auVar43._0_4_ * fVar275;
            fVar328 = auVar199._8_4_;
            auVar116._8_4_ = auVar43._8_4_ * fVar328;
            fVar301 = auVar199._12_4_;
            auVar116._12_4_ = auVar43._12_4_ * fVar301;
            fVar258 = auVar199._16_4_;
            auVar116._16_4_ = auVar43._16_4_ * fVar258;
            fVar213 = auVar199._20_4_;
            auVar116._20_4_ = auVar43._20_4_ * fVar213;
            fVar341 = auVar199._24_4_;
            auVar116._24_4_ = auVar43._24_4_ * fVar341;
            auVar116._28_4_ = auVar173._28_4_;
            auVar171 = vsubps_avx(auVar116,auVar115);
            auVar172 = vsubps_avx(auVar337,auVar42);
            fVar277 = auVar172._0_4_;
            fVar295 = auVar172._4_4_;
            auVar117._4_4_ = auVar44._4_4_ * fVar295;
            auVar117._0_4_ = auVar44._0_4_ * fVar277;
            fVar263 = auVar172._8_4_;
            auVar117._8_4_ = auVar44._8_4_ * fVar263;
            fVar343 = auVar172._12_4_;
            auVar117._12_4_ = auVar44._12_4_ * fVar343;
            fVar260 = auVar172._16_4_;
            auVar117._16_4_ = auVar44._16_4_ * fVar260;
            fVar217 = auVar172._20_4_;
            auVar117._20_4_ = auVar44._20_4_ * fVar217;
            fVar276 = auVar172._24_4_;
            auVar117._24_4_ = auVar44._24_4_ * fVar276;
            auVar117._28_4_ = auVar44._28_4_;
            auVar118._4_4_ = fVar294 * auVar42._4_4_;
            auVar118._0_4_ = fVar275 * auVar42._0_4_;
            auVar118._8_4_ = fVar328 * auVar42._8_4_;
            auVar118._12_4_ = fVar301 * auVar42._12_4_;
            auVar118._16_4_ = fVar258 * auVar42._16_4_;
            auVar118._20_4_ = fVar213 * auVar42._20_4_;
            auVar118._24_4_ = fVar341 * auVar42._24_4_;
            auVar118._28_4_ = auVar46._28_4_;
            auVar44 = vsubps_avx(auVar117,auVar118);
            auVar119._4_4_ = auVar43._4_4_ * fVar295;
            auVar119._0_4_ = auVar43._0_4_ * fVar277;
            auVar119._8_4_ = auVar43._8_4_ * fVar263;
            auVar119._12_4_ = auVar43._12_4_ * fVar343;
            auVar119._16_4_ = auVar43._16_4_ * fVar260;
            auVar119._20_4_ = auVar43._20_4_ * fVar217;
            auVar119._24_4_ = auVar43._24_4_ * fVar276;
            auVar119._28_4_ = auVar43._28_4_;
            auVar120._4_4_ = fVar284 * auVar42._4_4_;
            auVar120._0_4_ = fVar264 * auVar42._0_4_;
            auVar120._8_4_ = fVar327 * auVar42._8_4_;
            auVar120._12_4_ = fVar215 * auVar42._12_4_;
            auVar120._16_4_ = fVar256 * auVar42._16_4_;
            auVar120._20_4_ = fVar212 * auVar42._20_4_;
            auVar120._24_4_ = fVar265 * auVar42._24_4_;
            auVar120._28_4_ = auVar42._28_4_;
            auVar42 = vsubps_avx(auVar120,auVar119);
            auVar181._0_4_ = auVar171._0_4_ * 0.0 + auVar42._0_4_ + auVar44._0_4_ * 0.0;
            auVar181._4_4_ = auVar171._4_4_ * 0.0 + auVar42._4_4_ + auVar44._4_4_ * 0.0;
            auVar181._8_4_ = auVar171._8_4_ * 0.0 + auVar42._8_4_ + auVar44._8_4_ * 0.0;
            auVar181._12_4_ = auVar171._12_4_ * 0.0 + auVar42._12_4_ + auVar44._12_4_ * 0.0;
            auVar181._16_4_ = auVar171._16_4_ * 0.0 + auVar42._16_4_ + auVar44._16_4_ * 0.0;
            auVar181._20_4_ = auVar171._20_4_ * 0.0 + auVar42._20_4_ + auVar44._20_4_ * 0.0;
            auVar181._24_4_ = auVar171._24_4_ * 0.0 + auVar42._24_4_ + auVar44._24_4_ * 0.0;
            auVar181._28_4_ = auVar44._28_4_ + auVar42._28_4_ + auVar44._28_4_;
            auVar184 = ZEXT3264(auVar181);
            auVar171 = vmaxps_avx(_local_720,auVar181);
            auVar171 = vcmpps_avx(auVar171,ZEXT1232(ZEXT412(0)) << 0x20,2);
            auVar42 = local_7a0 & auVar171;
            if ((((((((auVar42 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar42 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar42 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar42 >> 0x7f,0) == '\0') &&
                  (auVar42 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar42 >> 0xbf,0) == '\0') &&
                (auVar42 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar42[0x1f]) {
LAB_0122719a:
              auVar210 = ZEXT3264(CONCAT824(uStack_448,
                                            CONCAT816(uStack_450,CONCAT88(uStack_458,local_460))));
              auVar394 = ZEXT3264(local_440);
              auVar351._4_4_ = fStack_75c;
              auVar351._0_4_ = local_760;
              auVar351._8_4_ = fStack_758;
              auVar351._12_4_ = fStack_754;
              auVar351._16_4_ = fStack_750;
              auVar351._20_4_ = fStack_74c;
              auVar351._24_4_ = fStack_748;
              auVar351._28_4_ = fStack_744;
            }
            else {
              auVar42 = vandps_avx(auVar171,local_7a0);
              auVar121._4_4_ = fVar294 * fVar278;
              auVar121._0_4_ = fVar275 * fVar167;
              auVar121._8_4_ = fVar328 * fVar296;
              auVar121._12_4_ = fVar301 * fVar329;
              auVar121._16_4_ = fVar258 * fVar283;
              auVar121._20_4_ = fVar213 * fVar262;
              auVar121._24_4_ = fVar341 * fVar231;
              auVar121._28_4_ = local_7a0._28_4_;
              auVar122._4_4_ = fVar284 * fVar216;
              auVar122._0_4_ = fVar264 * fVar193;
              auVar122._8_4_ = fVar327 * fVar309;
              auVar122._12_4_ = fVar215 * fVar339;
              auVar122._16_4_ = fVar256 * fVar340;
              auVar122._20_4_ = fVar212 * fVar342;
              auVar122._24_4_ = fVar265 * fVar360;
              auVar122._28_4_ = auVar171._28_4_;
              auVar43 = vsubps_avx(auVar122,auVar121);
              auVar123._4_4_ = fVar295 * fVar216;
              auVar123._0_4_ = fVar277 * fVar193;
              auVar123._8_4_ = fVar263 * fVar309;
              auVar123._12_4_ = fVar343 * fVar339;
              auVar123._16_4_ = fVar260 * fVar340;
              auVar123._20_4_ = fVar217 * fVar342;
              auVar123._24_4_ = fVar276 * fVar360;
              auVar123._28_4_ = auVar48._28_4_;
              auVar124._4_4_ = fVar294 * fVar281;
              auVar124._0_4_ = fVar275 * fVar261;
              auVar124._8_4_ = fVar328 * fVar300;
              auVar124._12_4_ = fVar301 * fVar187;
              auVar124._16_4_ = fVar258 * fVar254;
              auVar124._20_4_ = fVar213 * fVar211;
              auVar124._24_4_ = fVar341 * fVar234;
              auVar124._28_4_ = auVar199._28_4_;
              auVar44 = vsubps_avx(auVar124,auVar123);
              auVar125._4_4_ = fVar284 * fVar281;
              auVar125._0_4_ = fVar264 * fVar261;
              auVar125._8_4_ = fVar327 * fVar300;
              auVar125._12_4_ = fVar215 * fVar187;
              auVar125._16_4_ = fVar256 * fVar254;
              auVar125._20_4_ = fVar212 * fVar211;
              auVar125._24_4_ = fVar265 * fVar234;
              auVar125._28_4_ = auVar45._28_4_;
              auVar126._4_4_ = fVar295 * fVar278;
              auVar126._0_4_ = fVar277 * fVar167;
              auVar126._8_4_ = fVar263 * fVar296;
              auVar126._12_4_ = fVar343 * fVar329;
              auVar126._16_4_ = fVar260 * fVar283;
              auVar126._20_4_ = fVar217 * fVar262;
              auVar126._24_4_ = fVar276 * fVar231;
              auVar126._28_4_ = auVar198._28_4_;
              auVar46 = vsubps_avx(auVar126,auVar125);
              auVar206._0_4_ = auVar43._0_4_ * 0.0 + auVar46._0_4_ + auVar44._0_4_ * 0.0;
              auVar206._4_4_ = auVar43._4_4_ * 0.0 + auVar46._4_4_ + auVar44._4_4_ * 0.0;
              auVar206._8_4_ = auVar43._8_4_ * 0.0 + auVar46._8_4_ + auVar44._8_4_ * 0.0;
              auVar206._12_4_ = auVar43._12_4_ * 0.0 + auVar46._12_4_ + auVar44._12_4_ * 0.0;
              auVar206._16_4_ = auVar43._16_4_ * 0.0 + auVar46._16_4_ + auVar44._16_4_ * 0.0;
              auVar206._20_4_ = auVar43._20_4_ * 0.0 + auVar46._20_4_ + auVar44._20_4_ * 0.0;
              auVar206._24_4_ = auVar43._24_4_ * 0.0 + auVar46._24_4_ + auVar44._24_4_ * 0.0;
              auVar206._28_4_ = auVar198._28_4_ + auVar46._28_4_ + auVar45._28_4_;
              auVar171 = vrcpps_avx(auVar206);
              fVar261 = auVar171._0_4_;
              fVar264 = auVar171._4_4_;
              auVar127._4_4_ = auVar206._4_4_ * fVar264;
              auVar127._0_4_ = auVar206._0_4_ * fVar261;
              fVar275 = auVar171._8_4_;
              auVar127._8_4_ = auVar206._8_4_ * fVar275;
              fVar277 = auVar171._12_4_;
              auVar127._12_4_ = auVar206._12_4_ * fVar277;
              fVar278 = auVar171._16_4_;
              auVar127._16_4_ = auVar206._16_4_ * fVar278;
              fVar281 = auVar171._20_4_;
              auVar127._20_4_ = auVar206._20_4_ * fVar281;
              fVar284 = auVar171._24_4_;
              auVar127._24_4_ = auVar206._24_4_ * fVar284;
              auVar127._28_4_ = auVar199._28_4_;
              auVar370._8_4_ = 0x3f800000;
              auVar370._0_8_ = &DAT_3f8000003f800000;
              auVar370._12_4_ = 0x3f800000;
              auVar370._16_4_ = 0x3f800000;
              auVar370._20_4_ = 0x3f800000;
              auVar370._24_4_ = 0x3f800000;
              auVar370._28_4_ = 0x3f800000;
              auVar171 = vsubps_avx(auVar370,auVar127);
              fVar261 = auVar171._0_4_ * fVar261 + fVar261;
              fVar264 = auVar171._4_4_ * fVar264 + fVar264;
              fVar275 = auVar171._8_4_ * fVar275 + fVar275;
              fVar277 = auVar171._12_4_ * fVar277 + fVar277;
              fVar278 = auVar171._16_4_ * fVar278 + fVar278;
              fVar281 = auVar171._20_4_ * fVar281 + fVar281;
              fVar284 = auVar171._24_4_ * fVar284 + fVar284;
              auVar128._4_4_ =
                   (fVar280 * auVar43._4_4_ + auVar44._4_4_ * fVar279 + auVar46._4_4_ * fVar186) *
                   fVar264;
              auVar128._0_4_ =
                   (fVar259 * auVar43._0_4_ + auVar44._0_4_ * fVar257 + auVar46._0_4_ * fVar168) *
                   fVar261;
              auVar128._8_4_ =
                   (fVar299 * auVar43._8_4_ + auVar44._8_4_ * fVar298 + auVar46._8_4_ * fVar188) *
                   fVar275;
              auVar128._12_4_ =
                   (fVar185 * auVar43._12_4_ + auVar44._12_4_ * fVar166 + auVar46._12_4_ * fVar189)
                   * fVar277;
              auVar128._16_4_ =
                   (fVar253 * auVar43._16_4_ + auVar44._16_4_ * fVar282 + auVar46._16_4_ * fVar190)
                   * fVar278;
              auVar128._20_4_ =
                   (fVar194 * auVar43._20_4_ + auVar44._20_4_ * fVar302 + auVar46._20_4_ * fVar191)
                   * fVar281;
              auVar128._24_4_ =
                   (fVar338 * auVar43._24_4_ + auVar44._24_4_ * fVar232 + auVar46._24_4_ * fVar192)
                   * fVar284;
              auVar128._28_4_ = auVar337._28_4_ + auVar292._28_4_ + auVar41._28_4_;
              auVar251 = ZEXT3264(auVar128);
              fVar167 = (ray->super_RayK<1>).tfar;
              auVar274._4_4_ = fVar167;
              auVar274._0_4_ = fVar167;
              auVar274._8_4_ = fVar167;
              auVar274._12_4_ = fVar167;
              auVar274._16_4_ = fVar167;
              auVar274._20_4_ = fVar167;
              auVar274._24_4_ = fVar167;
              auVar274._28_4_ = fVar167;
              auVar171 = vcmpps_avx(local_140,auVar128,2);
              auVar337 = vcmpps_avx(auVar128,auVar274,2);
              auVar171 = vandps_avx(auVar171,auVar337);
              auVar292 = auVar42 & auVar171;
              if ((((((((auVar292 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar292 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar292 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar292 >> 0x7f,0) == '\0') &&
                    (auVar292 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar292 >> 0xbf,0) == '\0') &&
                  (auVar292 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar292[0x1f]) goto LAB_0122719a;
              auVar171 = vandps_avx(auVar42,auVar171);
              auVar292 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar206,4);
              auVar41 = auVar171 & auVar292;
              auVar210 = ZEXT3264(CONCAT824(uStack_448,
                                            CONCAT816(uStack_450,CONCAT88(uStack_458,local_460))));
              auVar394 = ZEXT3264(local_440);
              auVar351._4_4_ = fStack_75c;
              auVar351._0_4_ = local_760;
              auVar351._8_4_ = fStack_758;
              auVar351._12_4_ = fStack_754;
              auVar351._16_4_ = fStack_750;
              auVar351._20_4_ = fStack_74c;
              auVar351._24_4_ = fStack_748;
              auVar351._28_4_ = fStack_744;
              if ((((((((auVar41 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar41 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar41 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar41 >> 0x7f,0) != '\0') ||
                    (auVar41 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar41 >> 0xbf,0) != '\0') ||
                  (auVar41 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar41[0x1f] < '\0') {
                auVar171 = vandps_avx(auVar292,auVar171);
                auVar210 = ZEXT3264(auVar171);
                auVar129._4_4_ = fVar264 * (float)local_720._4_4_;
                auVar129._0_4_ = fVar261 * (float)local_720._0_4_;
                auVar129._8_4_ = fVar275 * fStack_718;
                auVar129._12_4_ = fVar277 * fStack_714;
                auVar129._16_4_ = fVar278 * register0x00001490;
                auVar129._20_4_ = fVar281 * register0x00001494;
                auVar129._24_4_ = fVar284 * register0x00001498;
                auVar129._28_4_ = auVar337._28_4_;
                auVar130._4_4_ = auVar181._4_4_ * fVar264;
                auVar130._0_4_ = auVar181._0_4_ * fVar261;
                auVar130._8_4_ = auVar181._8_4_ * fVar275;
                auVar130._12_4_ = auVar181._12_4_ * fVar277;
                auVar130._16_4_ = auVar181._16_4_ * fVar278;
                auVar130._20_4_ = auVar181._20_4_ * fVar281;
                auVar130._24_4_ = auVar181._24_4_ * fVar284;
                auVar130._28_4_ = auVar181._28_4_;
                auVar308._8_4_ = 0x3f800000;
                auVar308._0_8_ = &DAT_3f8000003f800000;
                auVar308._12_4_ = 0x3f800000;
                auVar308._16_4_ = 0x3f800000;
                auVar308._20_4_ = 0x3f800000;
                auVar308._24_4_ = 0x3f800000;
                auVar308._28_4_ = 0x3f800000;
                auVar171 = vsubps_avx(auVar308,auVar129);
                local_120 = vblendvps_avx(auVar171,auVar129,auVar40);
                auVar171 = vsubps_avx(auVar308,auVar130);
                _local_1c0 = vblendvps_avx(auVar171,auVar130,auVar40);
                auVar184 = ZEXT3264(_local_1c0);
                auVar394 = ZEXT3264(auVar128);
              }
            }
            auVar395 = ZEXT3264(_local_780);
            auVar171 = auVar210._0_32_;
            auVar381 = ZEXT3264(local_660);
            local_440 = auVar394._0_32_;
            if ((((((((auVar171 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar171 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar171 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar171 >> 0x7f,0) == '\0') &&
                  (auVar210 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                 SUB321(auVar171 >> 0xbf,0) == '\0') &&
                (auVar210 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                -1 < auVar210[0x1f]) {
              auVar352 = ZEXT3264(_local_5e0);
            }
            else {
              auVar337 = vsubps_avx(auVar317,auVar351);
              auVar251 = ZEXT3264(local_120);
              fVar257 = auVar351._0_4_ + auVar337._0_4_ * local_120._0_4_;
              fVar259 = auVar351._4_4_ + auVar337._4_4_ * local_120._4_4_;
              fVar261 = auVar351._8_4_ + auVar337._8_4_ * local_120._8_4_;
              fVar264 = auVar351._12_4_ + auVar337._12_4_ * local_120._12_4_;
              fVar275 = auVar351._16_4_ + auVar337._16_4_ * local_120._16_4_;
              fVar277 = auVar351._20_4_ + auVar337._20_4_ * local_120._20_4_;
              fVar278 = auVar351._24_4_ + auVar337._24_4_ * local_120._24_4_;
              fVar279 = auVar351._28_4_ + auVar337._28_4_;
              fVar167 = local_7d8->depth_scale;
              auVar131._4_4_ = (fVar259 + fVar259) * fVar167;
              auVar131._0_4_ = (fVar257 + fVar257) * fVar167;
              auVar131._8_4_ = (fVar261 + fVar261) * fVar167;
              auVar131._12_4_ = (fVar264 + fVar264) * fVar167;
              auVar131._16_4_ = (fVar275 + fVar275) * fVar167;
              auVar131._20_4_ = (fVar277 + fVar277) * fVar167;
              auVar131._24_4_ = (fVar278 + fVar278) * fVar167;
              auVar131._28_4_ = fVar279 + fVar279;
              auVar337 = vcmpps_avx(local_440,auVar131,6);
              auVar184 = ZEXT3264(auVar337);
              auVar292 = auVar171 & auVar337;
              auVar352 = ZEXT3264(_local_5e0);
              if ((((((((auVar292 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar292 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar292 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar292 >> 0x7f,0) != '\0') ||
                    (auVar292 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar292 >> 0xbf,0) != '\0') ||
                  (auVar292 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar292[0x1f] < '\0') {
                auVar171 = vandps_avx(auVar337,auVar171);
                auVar184 = ZEXT3264(auVar171);
                local_380 = (float)local_1c0._0_4_ + (float)local_1c0._0_4_ + -1.0;
                fStack_37c = (float)local_1c0._4_4_ + (float)local_1c0._4_4_ + -1.0;
                fStack_378 = fStack_1b8 + fStack_1b8 + -1.0;
                fStack_374 = fStack_1b4 + fStack_1b4 + -1.0;
                fStack_370 = fStack_1b0 + fStack_1b0 + -1.0;
                fStack_36c = fStack_1ac + fStack_1ac + -1.0;
                fStack_368 = fStack_1a8 + fStack_1a8 + -1.0;
                fStack_364 = fStack_1a4 + fStack_1a4 + -1.0;
                local_3a0 = local_120;
                local_360 = local_440;
                local_33c = uVar35;
                local_330 = local_7f0;
                uStack_328 = uStack_7e8;
                local_320 = local_590;
                uStack_318 = uStack_588;
                local_310 = local_5a0;
                uStack_308 = uStack_598;
                auVar210 = ZEXT1664(_local_5b0);
                local_300 = _local_5b0;
                local_2e0 = auVar171;
                auVar164 = (undefined1  [8])(context->scene->geometries).items[local_800].ptr;
                local_1c0._4_4_ = fStack_37c;
                local_1c0._0_4_ = local_380;
                fStack_1b8 = fStack_378;
                fStack_1b4 = fStack_374;
                fStack_1b0 = fStack_370;
                fStack_1ac = fStack_36c;
                fStack_1a8 = fStack_368;
                fStack_1a4 = fStack_364;
                if ((((Geometry *)auVar164)->mask & (ray->super_RayK<1>).mask) != 0) {
                  local_4a0 = auVar171;
                  auVar221._0_4_ = (float)(int)local_340;
                  auVar221._4_8_ = SUB128(ZEXT812(0),4);
                  auVar221._12_4_ = 0;
                  auVar286 = vshufps_avx(auVar221,auVar221,0);
                  local_2c0[0] = (auVar286._0_4_ + local_120._0_4_ + 0.0) * (float)local_160._0_4_;
                  local_2c0[1] = (auVar286._4_4_ + local_120._4_4_ + 1.0) * (float)local_160._4_4_;
                  local_2c0[2] = (auVar286._8_4_ + local_120._8_4_ + 2.0) * fStack_158;
                  local_2c0[3] = (auVar286._12_4_ + local_120._12_4_ + 3.0) * fStack_154;
                  fStack_2b0 = (auVar286._0_4_ + local_120._16_4_ + 4.0) * fStack_150;
                  fStack_2ac = (auVar286._4_4_ + local_120._20_4_ + 5.0) * fStack_14c;
                  fStack_2a8 = (auVar286._8_4_ + local_120._24_4_ + 6.0) * fStack_148;
                  fStack_2a4 = auVar286._12_4_ + local_120._28_4_ + 7.0;
                  local_2a0 = CONCAT44(fStack_37c,local_380);
                  uStack_298 = CONCAT44(fStack_374,fStack_378);
                  uStack_290 = CONCAT44(fStack_36c,fStack_370);
                  uStack_288 = CONCAT44(fStack_364,fStack_368);
                  local_280 = local_440;
                  auVar207._8_4_ = 0x7f800000;
                  auVar207._0_8_ = 0x7f8000007f800000;
                  auVar207._12_4_ = 0x7f800000;
                  auVar207._16_4_ = 0x7f800000;
                  auVar207._20_4_ = 0x7f800000;
                  auVar207._24_4_ = 0x7f800000;
                  auVar207._28_4_ = 0x7f800000;
                  auVar337 = vblendvps_avx(auVar207,local_440,auVar171);
                  auVar292 = vshufps_avx(auVar337,auVar337,0xb1);
                  auVar292 = vminps_avx(auVar337,auVar292);
                  auVar41 = vshufpd_avx(auVar292,auVar292,5);
                  auVar292 = vminps_avx(auVar292,auVar41);
                  auVar41 = vperm2f128_avx(auVar292,auVar292,1);
                  auVar292 = vminps_avx(auVar292,auVar41);
                  auVar337 = vcmpps_avx(auVar337,auVar292,0);
                  auVar292 = auVar171 & auVar337;
                  if ((((((((auVar292 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar292 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar292 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar292 >> 0x7f,0) != '\0') ||
                        (auVar292 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar292 >> 0xbf,0) != '\0') ||
                      (auVar292 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar292[0x1f] < '\0') {
                    auVar171 = vandps_avx(auVar337,auVar171);
                  }
                  uVar157 = vmovmskps_avx(auVar171);
                  uVar159 = 0;
                  if (uVar157 != 0) {
                    for (; (uVar157 >> uVar159 & 1) == 0; uVar159 = uVar159 + 1) {
                    }
                  }
                  uVar158 = (ulong)uVar159;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (((Geometry *)auVar164)->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar167 = local_2c0[uVar158];
                    auVar184 = ZEXT464((uint)fVar167);
                    fVar257 = *(float *)((long)&local_2a0 + uVar158 * 4);
                    auVar210 = ZEXT464((uint)fVar257);
                    fVar261 = 1.0 - fVar167;
                    fVar259 = fVar167 * fVar261 * 4.0;
                    auVar286 = ZEXT416((uint)(fVar167 * fVar167 * 0.5));
                    auVar286 = vshufps_avx(auVar286,auVar286,0);
                    auVar222 = ZEXT416((uint)((fVar261 * fVar261 + fVar259) * 0.5));
                    auVar222 = vshufps_avx(auVar222,auVar222,0);
                    auVar269 = ZEXT416((uint)((-fVar167 * fVar167 - fVar259) * 0.5));
                    auVar269 = vshufps_avx(auVar269,auVar269,0);
                    auVar239 = ZEXT416((uint)(fVar261 * -fVar261 * 0.5));
                    auVar239 = vshufps_avx(auVar239,auVar239,0);
                    auVar223._0_4_ =
                         auVar239._0_4_ * (float)local_7f0._0_4_ +
                         auVar269._0_4_ * (float)local_590._0_4_ +
                         auVar286._0_4_ * (float)local_5b0._0_4_ +
                         auVar222._0_4_ * (float)local_5a0._0_4_;
                    auVar223._4_4_ =
                         auVar239._4_4_ * (float)local_7f0._4_4_ +
                         auVar269._4_4_ * (float)local_590._4_4_ +
                         auVar286._4_4_ * (float)local_5b0._4_4_ +
                         auVar222._4_4_ * (float)local_5a0._4_4_;
                    auVar223._8_4_ =
                         auVar239._8_4_ * (float)uStack_7e8 +
                         auVar269._8_4_ * (float)uStack_588 +
                         auVar286._8_4_ * (float)uStack_5a8 + auVar222._8_4_ * (float)uStack_598;
                    auVar223._12_4_ =
                         auVar239._12_4_ * uStack_7e8._4_4_ +
                         auVar269._12_4_ * uStack_588._4_4_ +
                         auVar286._12_4_ * uStack_5a8._4_4_ + auVar222._12_4_ * uStack_598._4_4_;
                    auVar251 = ZEXT464((uint)*(float *)(local_280 + uVar158 * 4));
                    (ray->super_RayK<1>).tfar = *(float *)(local_280 + uVar158 * 4);
                    uVar13 = vmovlps_avx(auVar223);
                    *(undefined8 *)&(ray->Ng).field_0 = uVar13;
                    fVar259 = (float)vextractps_avx(auVar223,2);
                    (ray->Ng).field_0.field_0.z = fVar259;
                    ray->u = fVar167;
                    ray->v = fVar257;
                    ray->primID = (uint)local_7f8;
                    ray->geomID = (uint)local_800;
                    ray->instID[0] = context->user->instID[0];
                    ray->instPrimID[0] = context->user->instPrimID[0];
                  }
                  else {
                    _local_720 = _local_590;
                    _local_680 = _local_5a0;
                    _local_600 = _local_5b0;
                    local_740 = auVar164;
                    do {
                      local_6c4 = local_2c0[uVar158];
                      local_6c0 = *(undefined4 *)((long)&local_2a0 + uVar158 * 4);
                      local_7a0._0_4_ = (ray->super_RayK<1>).tfar;
                      local_760 = (float)uVar158;
                      fStack_75c = (float)(uVar158 >> 0x20);
                      (ray->super_RayK<1>).tfar = *(float *)(local_280 + uVar158 * 4);
                      local_7d0.context = context->user;
                      fVar257 = 1.0 - local_6c4;
                      fVar167 = local_6c4 * fVar257 * 4.0;
                      auVar286 = ZEXT416((uint)(local_6c4 * local_6c4 * 0.5));
                      auVar286 = vshufps_avx(auVar286,auVar286,0);
                      auVar222 = ZEXT416((uint)((fVar257 * fVar257 + fVar167) * 0.5));
                      auVar222 = vshufps_avx(auVar222,auVar222,0);
                      auVar269 = ZEXT416((uint)((-local_6c4 * local_6c4 - fVar167) * 0.5));
                      auVar269 = vshufps_avx(auVar269,auVar269,0);
                      auVar239 = ZEXT416((uint)(fVar257 * -fVar257 * 0.5));
                      auVar239 = vshufps_avx(auVar239,auVar239,0);
                      auVar240._0_4_ = auVar239._0_4_ * (float)local_7f0._0_4_;
                      auVar240._4_4_ = auVar239._4_4_ * (float)local_7f0._4_4_;
                      auVar240._8_4_ = auVar239._8_4_ * (float)uStack_7e8;
                      auVar240._12_4_ = auVar239._12_4_ * uStack_7e8._4_4_;
                      auVar251 = ZEXT1664(auVar240);
                      auVar224._0_4_ =
                           auVar240._0_4_ +
                           auVar269._0_4_ * (float)local_720._0_4_ +
                           auVar286._0_4_ * (float)local_600._0_4_ +
                           auVar222._0_4_ * (float)local_680._0_4_;
                      auVar224._4_4_ =
                           auVar240._4_4_ +
                           auVar269._4_4_ * (float)local_720._4_4_ +
                           auVar286._4_4_ * (float)local_600._4_4_ +
                           auVar222._4_4_ * (float)local_680._4_4_;
                      auVar224._8_4_ =
                           auVar240._8_4_ +
                           auVar269._8_4_ * fStack_718 +
                           auVar286._8_4_ * (float)uStack_5f8 + auVar222._8_4_ * fStack_678;
                      auVar224._12_4_ =
                           auVar240._12_4_ +
                           auVar269._12_4_ * fStack_714 +
                           auVar286._12_4_ * uStack_5f8._4_4_ + auVar222._12_4_ * fStack_674;
                      local_6d0 = vmovlps_avx(auVar224);
                      local_6c8 = vextractps_avx(auVar224,2);
                      local_6bc = (int)local_7f8;
                      local_6b8 = (int)local_800;
                      local_6b4 = (local_7d0.context)->instID[0];
                      local_6b0 = (local_7d0.context)->instPrimID[0];
                      local_804 = -1;
                      local_7d0.valid = &local_804;
                      local_7d0.geometryUserPtr = ((Geometry *)auVar164)->userPtr;
                      local_7d0.ray = (RTCRayN *)ray;
                      local_7d0.hit = (RTCHitN *)&local_6d0;
                      local_7d0.N = 1;
                      if (((Geometry *)auVar164)->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_012273cb:
                        p_Var38 = context->args->filter;
                        if (p_Var38 != (RTCFilterFunctionN)0x0) {
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((((Geometry *)auVar164)->field_8).field_0x2 & 0x40) != 0)) {
                            auVar251 = ZEXT1664(auVar251._0_16_);
                            (*p_Var38)(&local_7d0);
                            auVar164 = local_740;
                          }
                          auVar394 = ZEXT3264(local_440);
                          auVar395 = ZEXT3264(_local_780);
                          auVar381 = ZEXT3264(local_660);
                          fVar235 = (float)local_580._0_4_;
                          fVar214 = (float)local_580._4_4_;
                          fVar252 = fStack_578;
                          fVar297 = fStack_574;
                          fVar233 = fStack_570;
                          fVar388 = fStack_56c;
                          fVar255 = fStack_568;
                          if (*local_7d0.valid == 0) goto LAB_0122748c;
                        }
                        (((Vec3f *)((long)local_7d0.ray + 0x30))->field_0).components[0] =
                             *(float *)local_7d0.hit;
                        (((Vec3f *)((long)local_7d0.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_7d0.hit + 4);
                        (((Vec3f *)((long)local_7d0.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_7d0.hit + 8);
                        *(float *)((long)local_7d0.ray + 0x3c) = *(float *)(local_7d0.hit + 0xc);
                        *(float *)((long)local_7d0.ray + 0x40) = *(float *)(local_7d0.hit + 0x10);
                        *(float *)((long)local_7d0.ray + 0x44) = *(float *)(local_7d0.hit + 0x14);
                        *(float *)((long)local_7d0.ray + 0x48) = *(float *)(local_7d0.hit + 0x18);
                        *(float *)((long)local_7d0.ray + 0x4c) = *(float *)(local_7d0.hit + 0x1c);
                        *(float *)((long)local_7d0.ray + 0x50) = *(float *)(local_7d0.hit + 0x20);
                      }
                      else {
                        auVar251 = ZEXT1664(auVar240);
                        (*((Geometry *)auVar164)->intersectionFilterN)(&local_7d0);
                        auVar381 = ZEXT3264(local_660);
                        auVar395 = ZEXT3264(_local_780);
                        auVar394 = ZEXT3264(local_440);
                        auVar164 = local_740;
                        fVar235 = (float)local_580._0_4_;
                        fVar214 = (float)local_580._4_4_;
                        fVar252 = fStack_578;
                        fVar297 = fStack_574;
                        fVar233 = fStack_570;
                        fVar388 = fStack_56c;
                        fVar255 = fStack_568;
                        if (*local_7d0.valid != 0) goto LAB_012273cb;
LAB_0122748c:
                        (ray->super_RayK<1>).tfar = (float)local_7a0._0_4_;
                      }
                      uVar158 = CONCAT44(fStack_75c,local_760);
                      *(undefined4 *)(local_4a0 + uVar158 * 4) = 0;
                      auVar337 = local_4a0;
                      fVar167 = (ray->super_RayK<1>).tfar;
                      auVar182._4_4_ = fVar167;
                      auVar182._0_4_ = fVar167;
                      auVar182._8_4_ = fVar167;
                      auVar182._12_4_ = fVar167;
                      auVar182._16_4_ = fVar167;
                      auVar182._20_4_ = fVar167;
                      auVar182._24_4_ = fVar167;
                      auVar182._28_4_ = fVar167;
                      auVar171 = vcmpps_avx(auVar394._0_32_,auVar182,2);
                      local_4a0 = vandps_avx(auVar171,local_4a0);
                      auVar184 = ZEXT3264(local_4a0);
                      auVar337 = auVar337 & auVar171;
                      bVar138 = (auVar337 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                      bVar139 = (auVar337 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                      bVar137 = (auVar337 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                      bVar136 = SUB321(auVar337 >> 0x7f,0) != '\0';
                      bVar135 = (auVar337 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                      bVar134 = SUB321(auVar337 >> 0xbf,0) != '\0';
                      bVar133 = (auVar337 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                      bVar132 = auVar337[0x1f] < '\0';
                      if (((((((bVar138 || bVar139) || bVar137) || bVar136) || bVar135) || bVar134)
                          || bVar133) || bVar132) {
                        auVar208._8_4_ = 0x7f800000;
                        auVar208._0_8_ = 0x7f8000007f800000;
                        auVar208._12_4_ = 0x7f800000;
                        auVar208._16_4_ = 0x7f800000;
                        auVar208._20_4_ = 0x7f800000;
                        auVar208._24_4_ = 0x7f800000;
                        auVar208._28_4_ = 0x7f800000;
                        auVar171 = vblendvps_avx(auVar208,auVar394._0_32_,local_4a0);
                        auVar337 = vshufps_avx(auVar171,auVar171,0xb1);
                        auVar337 = vminps_avx(auVar171,auVar337);
                        auVar292 = vshufpd_avx(auVar337,auVar337,5);
                        auVar337 = vminps_avx(auVar337,auVar292);
                        auVar292 = vperm2f128_avx(auVar337,auVar337,1);
                        auVar251 = ZEXT3264(auVar292);
                        auVar337 = vminps_avx(auVar337,auVar292);
                        auVar171 = vcmpps_avx(auVar171,auVar337,0);
                        auVar337 = local_4a0 & auVar171;
                        if ((((((((auVar337 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar337 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar337 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar337 >> 0x7f,0) != '\0')
                              || (auVar337 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar337 >> 0xbf,0) != '\0') ||
                            (auVar337 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar337[0x1f] < '\0') {
                          auVar337 = vandps_avx(auVar171,local_4a0);
                          auVar184 = ZEXT3264(auVar337);
                        }
                        uVar157 = vmovmskps_avx(auVar184._0_32_);
                        uVar159 = 0;
                        if (uVar157 != 0) {
                          for (; (uVar157 >> uVar159 & 1) == 0; uVar159 = uVar159 + 1) {
                          }
                        }
                        uVar158 = (ulong)uVar159;
                      }
                      auVar210 = ZEXT3264(auVar171);
                    } while (((((((bVar138 || bVar139) || bVar137) || bVar136) || bVar135) ||
                              bVar134) || bVar133) || bVar132);
                  }
                }
                auVar352 = ZEXT3264(_local_5e0);
              }
            }
          }
          lVar160 = lVar160 + 8;
          auVar394 = auVar395;
        } while ((int)lVar160 < (int)uVar35);
      }
      fVar235 = (ray->super_RayK<1>).tfar;
      auVar178._4_4_ = fVar235;
      auVar178._0_4_ = fVar235;
      auVar178._8_4_ = fVar235;
      auVar178._12_4_ = fVar235;
      auVar178._16_4_ = fVar235;
      auVar178._20_4_ = fVar235;
      auVar178._24_4_ = fVar235;
      auVar178._28_4_ = fVar235;
      auVar171 = vcmpps_avx(local_80,auVar178,2);
      uVar159 = vmovmskps_avx(auVar171);
      uVar155 = uVar155 & uVar155 + 0xff & uVar159;
    } while (uVar155 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }